

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCRayQueryContext *pRVar25;
  RTCFilterFunctionN p_Var26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  uint uVar109;
  ulong uVar110;
  ulong uVar111;
  long lVar112;
  uint uVar113;
  uint uVar114;
  long lVar115;
  uint uVar116;
  uint uVar117;
  bool bVar118;
  __m128 a;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar199;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar189 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [28];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  float fVar245;
  float fVar246;
  float fVar262;
  float fVar263;
  float fVar265;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar264;
  float fVar268;
  float fVar270;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar271;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar266;
  float fVar267;
  float fVar269;
  undefined1 auVar261 [64];
  float fVar272;
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar282;
  float fVar286;
  float fVar290;
  float fVar293;
  float fVar296;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar283;
  float fVar284;
  undefined1 auVar278 [32];
  float fVar285;
  float fVar287;
  float fVar289;
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar298;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar288;
  undefined1 auVar281 [64];
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [64];
  float fVar307;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar322;
  float fVar327;
  float fVar337;
  float fVar342;
  float fVar347;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar318 [32];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar364;
  float fVar365;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [64];
  float fVar366;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [64];
  undefined1 auVar384 [16];
  float fVar383;
  float fVar393;
  float fVar394;
  float fVar396;
  float fVar397;
  float fVar398;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float fVar395;
  float fVar399;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar402 [16];
  float fVar400;
  float fVar401;
  float fVar411;
  float fVar413;
  float fVar417;
  float fVar419;
  float fVar421;
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  float fVar412;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar418;
  float fVar420;
  float fVar422;
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar423 [16];
  undefined1 auVar424 [28];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  float fVar429;
  undefined1 auVar430 [28];
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar431 [32];
  float fVar439;
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  float fVar440;
  float fVar442;
  float fVar443;
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  undefined1 auVar441 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  undefined1 local_d20 [32];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  RTCFilterFunctionNArguments local_bf0;
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  undefined1 (*local_ba0) [16];
  undefined1 (*local_b98) [16];
  undefined1 (*local_b90) [32];
  ulong local_b88;
  undefined1 local_b80 [32];
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 auStack_b50 [16];
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [8];
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 auStack_a70 [16];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 auStack_a50 [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  Primitive *local_9f0;
  ulong local_9e8;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  RTCHitN local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [32];
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  uint uStack_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar392 [64];
  undefined1 auVar410 [64];
  
  PVar19 = prim[1];
  uVar110 = (ulong)(byte)PVar19;
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 4 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 4 + 10)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 5 + 6)));
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 5 + 10)));
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 6 + 6)));
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 6 + 10)));
  lVar112 = uVar110 * 0x25;
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0xf + 6)));
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0xf + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 10)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x11 + 6)));
  _local_a60 = ZEXT1632(auVar38);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x11 + 10)));
  auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar41 = vsubps_avx(auVar152,*(undefined1 (*) [16])(prim + lVar112 + 6));
  fVar8 = *(float *)(prim + lVar112 + 0x12);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1a + 6)));
  auVar355._0_4_ = fVar8 * auVar33._0_4_;
  auVar355._4_4_ = fVar8 * auVar33._4_4_;
  auVar355._8_4_ = fVar8 * auVar33._8_4_;
  auVar355._12_4_ = fVar8 * auVar33._12_4_;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1a + 10)));
  auVar403._16_16_ = auVar206;
  auVar403._0_16_ = auVar35;
  auVar129._16_16_ = auVar122;
  auVar129._0_16_ = auVar36;
  auVar237._16_16_ = auVar124;
  auVar237._0_16_ = auVar183;
  auVar367._16_16_ = auVar123;
  auVar367._0_16_ = auVar153;
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1b + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1b + 10)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1c + 6)));
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1c + 10)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar147 = vcvtdq2ps_avx(auVar237);
  auVar130._16_16_ = auVar126;
  auVar130._0_16_ = auVar37;
  _local_a80 = vcvtdq2ps_avx(auVar130);
  auVar238._16_16_ = auVar39;
  auVar238._0_16_ = auVar38;
  auVar28 = vcvtdq2ps_avx(auVar238);
  auVar425._16_16_ = auVar33;
  auVar425._0_16_ = auVar152;
  auVar276._16_16_ = auVar206;
  auVar276._0_16_ = auVar35;
  auVar431._16_16_ = auVar122;
  auVar431._0_16_ = auVar36;
  auVar152 = vshufps_avx(auVar355,auVar355,0x55);
  auVar33 = vshufps_avx(auVar355,auVar355,0xaa);
  fVar200 = auVar33._0_4_;
  fVar177 = auVar33._4_4_;
  fVar178 = auVar33._8_4_;
  fVar220 = auVar33._12_4_;
  fVar222 = auVar152._0_4_;
  fVar264 = auVar152._4_4_;
  fVar223 = auVar152._8_4_;
  fVar224 = auVar152._12_4_;
  fVar180 = auVar39._12_4_ + 0.0;
  auVar122 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar112 + 0x16)) *
                           *(float *)(prim + lVar112 + 0x1a)));
  _local_b60 = ZEXT1632(auVar122);
  auVar29 = vcvtdq2ps_avx(auVar403);
  auVar30 = vcvtdq2ps_avx(auVar367);
  auVar31 = vcvtdq2ps_avx(auVar425);
  auVar373 = vcvtdq2ps_avx(auVar276);
  auVar32 = vcvtdq2ps_avx(auVar431);
  auVar152 = vshufps_avx(auVar355,auVar355,0);
  fVar179 = auVar152._0_4_;
  fVar221 = auVar152._4_4_;
  fVar246 = auVar152._8_4_;
  fVar273 = auVar152._12_4_;
  auVar404._0_4_ = fVar179 * auVar29._0_4_ + fVar222 * auVar129._0_4_ + fVar200 * auVar147._0_4_;
  auVar404._4_4_ = fVar221 * auVar29._4_4_ + fVar264 * auVar129._4_4_ + fVar177 * auVar147._4_4_;
  auVar404._8_4_ = fVar246 * auVar29._8_4_ + fVar223 * auVar129._8_4_ + fVar178 * auVar147._8_4_;
  auVar404._12_4_ = fVar273 * auVar29._12_4_ + fVar224 * auVar129._12_4_ + fVar220 * auVar147._12_4_
  ;
  auVar404._16_4_ = fVar179 * auVar29._16_4_ + fVar222 * auVar129._16_4_ + fVar200 * auVar147._16_4_
  ;
  auVar404._20_4_ = fVar221 * auVar29._20_4_ + fVar264 * auVar129._20_4_ + fVar177 * auVar147._20_4_
  ;
  auVar404._24_4_ = fVar246 * auVar29._24_4_ + fVar223 * auVar129._24_4_ + fVar178 * auVar147._24_4_
  ;
  auVar404._28_4_ = fVar180 + 0.0;
  auVar368._0_4_ = fVar179 * auVar30._0_4_ + fVar222 * local_a80._0_4_ + auVar28._0_4_ * fVar200;
  auVar368._4_4_ = fVar221 * auVar30._4_4_ + fVar264 * local_a80._4_4_ + auVar28._4_4_ * fVar177;
  auVar368._8_4_ = fVar246 * auVar30._8_4_ + fVar223 * local_a80._8_4_ + auVar28._8_4_ * fVar178;
  auVar368._12_4_ = fVar273 * auVar30._12_4_ + fVar224 * local_a80._12_4_ + auVar28._12_4_ * fVar220
  ;
  auVar368._16_4_ = fVar179 * auVar30._16_4_ + fVar222 * local_a80._16_4_ + auVar28._16_4_ * fVar200
  ;
  auVar368._20_4_ = fVar221 * auVar30._20_4_ + fVar264 * local_a80._20_4_ + auVar28._20_4_ * fVar177
  ;
  auVar368._24_4_ = fVar246 * auVar30._24_4_ + fVar223 * local_a80._24_4_ + auVar28._24_4_ * fVar178
  ;
  auVar368._28_4_ = fVar180 + auVar39._12_4_ + 0.0;
  auVar277._0_4_ = fVar179 * auVar31._0_4_ + fVar222 * auVar373._0_4_ + auVar32._0_4_ * fVar200;
  auVar277._4_4_ = fVar221 * auVar31._4_4_ + fVar264 * auVar373._4_4_ + auVar32._4_4_ * fVar177;
  auVar277._8_4_ = fVar246 * auVar31._8_4_ + fVar223 * auVar373._8_4_ + auVar32._8_4_ * fVar178;
  auVar277._12_4_ = fVar273 * auVar31._12_4_ + fVar224 * auVar373._12_4_ + auVar32._12_4_ * fVar220;
  auVar277._16_4_ = fVar179 * auVar31._16_4_ + fVar222 * auVar373._16_4_ + auVar32._16_4_ * fVar200;
  auVar277._20_4_ = fVar221 * auVar31._20_4_ + fVar264 * auVar373._20_4_ + auVar32._20_4_ * fVar177;
  auVar277._24_4_ = fVar246 * auVar31._24_4_ + fVar223 * auVar373._24_4_ + auVar32._24_4_ * fVar178;
  auVar277._28_4_ = fVar180 + fVar220 + 0.0;
  auVar101._4_4_ = fVar8 * auVar41._4_4_;
  auVar101._0_4_ = fVar8 * auVar41._0_4_;
  auVar101._8_4_ = fVar8 * auVar41._8_4_;
  auVar101._12_4_ = fVar8 * auVar41._12_4_;
  auVar152 = vshufps_avx(auVar101,auVar101,0x55);
  auVar33 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar268 = auVar33._0_4_;
  fVar270 = auVar33._4_4_;
  fVar283 = auVar33._8_4_;
  fVar284 = auVar33._12_4_;
  fVar8 = auVar152._0_4_;
  fVar178 = auVar152._4_4_;
  fVar179 = auVar152._8_4_;
  fVar273 = auVar152._12_4_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar110 * 7 + 6);
  auVar152 = vpmovsxwd_avx(auVar152);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar110 * 7 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar110 * 0xb + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar110 * 0xb + 0xe);
  auVar206 = vpmovsxwd_avx(auVar206);
  auVar36 = vshufps_avx(auVar101,auVar101,0);
  fVar304 = auVar36._0_4_;
  fVar305 = auVar36._4_4_;
  fVar306 = auVar36._8_4_;
  fVar440 = auVar36._12_4_;
  auVar163._0_4_ = fVar304 * auVar29._0_4_ + auVar129._0_4_ * fVar8 + fVar268 * auVar147._0_4_;
  auVar163._4_4_ = fVar305 * auVar29._4_4_ + auVar129._4_4_ * fVar178 + fVar270 * auVar147._4_4_;
  auVar163._8_4_ = fVar306 * auVar29._8_4_ + auVar129._8_4_ * fVar179 + fVar283 * auVar147._8_4_;
  auVar163._12_4_ = fVar440 * auVar29._12_4_ + auVar129._12_4_ * fVar273 + fVar284 * auVar147._12_4_
  ;
  auVar163._16_4_ = fVar304 * auVar29._16_4_ + auVar129._16_4_ * fVar8 + fVar268 * auVar147._16_4_;
  auVar163._20_4_ = fVar305 * auVar29._20_4_ + auVar129._20_4_ * fVar178 + fVar270 * auVar147._20_4_
  ;
  auVar163._24_4_ = fVar306 * auVar29._24_4_ + auVar129._24_4_ * fVar179 + fVar283 * auVar147._24_4_
  ;
  auVar163._28_4_ = fVar273 + auVar147._28_4_ + 0.0;
  fStack_b30 = fVar8 * local_a80._16_4_ + auVar28._16_4_ * fVar268 + fVar304 * auVar30._16_4_;
  fStack_b2c = fVar178 * local_a80._20_4_ + auVar28._20_4_ * fVar270 + fVar305 * auVar30._20_4_;
  fStack_b28 = fVar179 * local_a80._24_4_ + auVar28._24_4_ * fVar283 + fVar306 * auVar30._24_4_;
  fStack_b24 = auVar129._28_4_ + auVar28._28_4_ + fVar273;
  auVar314._8_4_ = 0x7fffffff;
  auVar314._0_8_ = 0x7fffffff7fffffff;
  auVar314._12_4_ = 0x7fffffff;
  auVar314._16_4_ = 0x7fffffff;
  auVar314._20_4_ = 0x7fffffff;
  auVar314._24_4_ = 0x7fffffff;
  auVar314._28_4_ = 0x7fffffff;
  auVar131._8_4_ = 0x219392ef;
  auVar131._0_8_ = 0x219392ef219392ef;
  auVar131._12_4_ = 0x219392ef;
  auVar131._16_4_ = 0x219392ef;
  auVar131._20_4_ = 0x219392ef;
  auVar131._24_4_ = 0x219392ef;
  auVar131._28_4_ = 0x219392ef;
  auVar129 = vandps_avx(auVar404,auVar314);
  auVar129 = vcmpps_avx(auVar129,auVar131,1);
  auVar147 = vblendvps_avx(auVar404,auVar131,auVar129);
  auVar129 = vandps_avx(auVar368,auVar314);
  auVar129 = vcmpps_avx(auVar129,auVar131,1);
  auVar29 = vblendvps_avx(auVar368,auVar131,auVar129);
  auVar129 = vandps_avx(auVar314,auVar277);
  auVar27 = vcmpps_avx(auVar129,auVar131,1);
  auVar129 = vblendvps_avx(auVar277,auVar131,auVar27);
  auVar40 = vrcpps_avx(auVar147);
  auVar190._0_4_ = auVar373._0_4_ * fVar8 + auVar32._0_4_ * fVar268 + fVar304 * auVar31._0_4_;
  auVar190._4_4_ = auVar373._4_4_ * fVar178 + auVar32._4_4_ * fVar270 + fVar305 * auVar31._4_4_;
  auVar190._8_4_ = auVar373._8_4_ * fVar179 + auVar32._8_4_ * fVar283 + fVar306 * auVar31._8_4_;
  auVar190._12_4_ = auVar373._12_4_ * fVar273 + auVar32._12_4_ * fVar284 + fVar440 * auVar31._12_4_;
  auVar190._16_4_ = auVar373._16_4_ * fVar8 + auVar32._16_4_ * fVar268 + fVar304 * auVar31._16_4_;
  auVar190._20_4_ = auVar373._20_4_ * fVar178 + auVar32._20_4_ * fVar270 + fVar305 * auVar31._20_4_;
  auVar190._24_4_ = auVar373._24_4_ * fVar179 + auVar32._24_4_ * fVar283 + fVar306 * auVar31._24_4_;
  auVar190._28_4_ = fVar273 + fVar284 + auVar27._28_4_;
  fVar200 = auVar40._0_4_;
  fVar220 = auVar40._4_4_;
  auVar27._4_4_ = auVar147._4_4_ * fVar220;
  auVar27._0_4_ = auVar147._0_4_ * fVar200;
  fVar221 = auVar40._8_4_;
  auVar27._8_4_ = auVar147._8_4_ * fVar221;
  fVar222 = auVar40._12_4_;
  auVar27._12_4_ = auVar147._12_4_ * fVar222;
  fVar223 = auVar40._16_4_;
  auVar27._16_4_ = auVar147._16_4_ * fVar223;
  fVar224 = auVar40._20_4_;
  auVar27._20_4_ = auVar147._20_4_ * fVar224;
  fVar225 = auVar40._24_4_;
  auVar27._24_4_ = auVar147._24_4_ * fVar225;
  auVar27._28_4_ = auVar147._28_4_;
  auVar132._8_4_ = 0x3f800000;
  auVar132._0_8_ = 0x3f8000003f800000;
  auVar132._12_4_ = 0x3f800000;
  auVar132._16_4_ = 0x3f800000;
  auVar132._20_4_ = 0x3f800000;
  auVar132._24_4_ = 0x3f800000;
  auVar132._28_4_ = 0x3f800000;
  auVar31 = vsubps_avx(auVar132,auVar27);
  auVar27 = vrcpps_avx(auVar29);
  fVar200 = fVar200 + fVar200 * auVar31._0_4_;
  fVar220 = fVar220 + fVar220 * auVar31._4_4_;
  fVar221 = fVar221 + fVar221 * auVar31._8_4_;
  fVar222 = fVar222 + fVar222 * auVar31._12_4_;
  fVar223 = fVar223 + fVar223 * auVar31._16_4_;
  fVar224 = fVar224 + fVar224 * auVar31._20_4_;
  fVar225 = fVar225 + fVar225 * auVar31._24_4_;
  fVar245 = auVar27._0_4_;
  fVar262 = auVar27._4_4_;
  auVar147._4_4_ = fVar262 * auVar29._4_4_;
  auVar147._0_4_ = fVar245 * auVar29._0_4_;
  fVar263 = auVar27._8_4_;
  auVar147._8_4_ = fVar263 * auVar29._8_4_;
  fVar265 = auVar27._12_4_;
  auVar147._12_4_ = fVar265 * auVar29._12_4_;
  fVar266 = auVar27._16_4_;
  auVar147._16_4_ = fVar266 * auVar29._16_4_;
  fVar267 = auVar27._20_4_;
  auVar147._20_4_ = fVar267 * auVar29._20_4_;
  fVar269 = auVar27._24_4_;
  auVar147._24_4_ = fVar269 * auVar29._24_4_;
  auVar147._28_4_ = auVar40._28_4_;
  auVar29 = vsubps_avx(auVar132,auVar147);
  auVar147 = vrcpps_avx(auVar129);
  fVar245 = fVar245 + fVar245 * auVar29._0_4_;
  fVar262 = fVar262 + fVar262 * auVar29._4_4_;
  fVar263 = fVar263 + fVar263 * auVar29._8_4_;
  fVar265 = fVar265 + fVar265 * auVar29._12_4_;
  fVar266 = fVar266 + fVar266 * auVar29._16_4_;
  fVar267 = fVar267 + fVar267 * auVar29._20_4_;
  fVar269 = fVar269 + fVar269 * auVar29._24_4_;
  fVar272 = auVar147._0_4_;
  fVar282 = auVar147._4_4_;
  auVar373._4_4_ = fVar282 * auVar129._4_4_;
  auVar373._0_4_ = fVar272 * auVar129._0_4_;
  fVar286 = auVar147._8_4_;
  auVar373._8_4_ = fVar286 * auVar129._8_4_;
  fVar288 = auVar147._12_4_;
  auVar373._12_4_ = fVar288 * auVar129._12_4_;
  fVar290 = auVar147._16_4_;
  auVar373._16_4_ = fVar290 * auVar129._16_4_;
  fVar293 = auVar147._20_4_;
  auVar373._20_4_ = fVar293 * auVar129._20_4_;
  fVar296 = auVar147._24_4_;
  auVar373._24_4_ = fVar296 * auVar129._24_4_;
  auVar373._28_4_ = auVar29._28_4_;
  auVar129 = vsubps_avx(auVar132,auVar373);
  fVar272 = fVar272 + fVar272 * auVar129._0_4_;
  fVar282 = fVar282 + fVar282 * auVar129._4_4_;
  fVar286 = fVar286 + fVar286 * auVar129._8_4_;
  fVar288 = fVar288 + fVar288 * auVar129._12_4_;
  fVar290 = fVar290 + fVar290 * auVar129._16_4_;
  fVar293 = fVar293 + fVar293 * auVar129._20_4_;
  fVar296 = fVar296 + fVar296 * auVar129._24_4_;
  auVar36 = vpermilps_avx(auVar122,0);
  auVar299._16_16_ = auVar33;
  auVar299._0_16_ = auVar152;
  auVar129 = vcvtdq2ps_avx(auVar299);
  auVar315._16_16_ = auVar206;
  auVar315._0_16_ = auVar35;
  auVar147 = vcvtdq2ps_avx(auVar315);
  auVar147 = vsubps_avx(auVar147,auVar129);
  fVar177 = auVar36._0_4_;
  fVar180 = auVar36._4_4_;
  fVar246 = auVar36._8_4_;
  fVar264 = auVar36._12_4_;
  auVar300._0_4_ = auVar147._0_4_ * fVar177 + auVar129._0_4_;
  auVar300._4_4_ = auVar147._4_4_ * fVar180 + auVar129._4_4_;
  auVar300._8_4_ = auVar147._8_4_ * fVar246 + auVar129._8_4_;
  auVar300._12_4_ = auVar147._12_4_ * fVar264 + auVar129._12_4_;
  auVar300._16_4_ = auVar147._16_4_ * fVar177 + auVar129._16_4_;
  auVar300._20_4_ = auVar147._20_4_ * fVar180 + auVar129._20_4_;
  auVar300._24_4_ = auVar147._24_4_ * fVar246 + auVar129._24_4_;
  auVar300._28_4_ = auVar147._28_4_ + auVar129._28_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar110 * 9 + 6);
  auVar152 = vpmovsxwd_avx(auVar36);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar110 * 9 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar122);
  auVar316._16_16_ = auVar33;
  auVar316._0_16_ = auVar152;
  auVar129 = vcvtdq2ps_avx(auVar316);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar110 * 0xd + 6);
  auVar152 = vpmovsxwd_avx(auVar183);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar110 * 0xd + 0xe);
  auVar33 = vpmovsxwd_avx(auVar124);
  auVar356._16_16_ = auVar33;
  auVar356._0_16_ = auVar152;
  auVar147 = vcvtdq2ps_avx(auVar356);
  auVar147 = vsubps_avx(auVar147,auVar129);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *(ulong *)(prim + uVar110 * 0x12 + 6);
  auVar152 = vpmovsxwd_avx(auVar153);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar110 * 0x12 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar123);
  auVar317._0_4_ = auVar129._0_4_ + auVar147._0_4_ * fVar177;
  auVar317._4_4_ = auVar129._4_4_ + auVar147._4_4_ * fVar180;
  auVar317._8_4_ = auVar129._8_4_ + auVar147._8_4_ * fVar246;
  auVar317._12_4_ = auVar129._12_4_ + auVar147._12_4_ * fVar264;
  auVar317._16_4_ = auVar129._16_4_ + auVar147._16_4_ * fVar177;
  auVar317._20_4_ = auVar129._20_4_ + auVar147._20_4_ * fVar180;
  auVar317._24_4_ = auVar129._24_4_ + auVar147._24_4_ * fVar246;
  auVar317._28_4_ = auVar129._28_4_ + auVar147._28_4_;
  auVar357._16_16_ = auVar33;
  auVar357._0_16_ = auVar152;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar110 * 0x16 + 6);
  auVar152 = vpmovsxwd_avx(auVar37);
  auVar129 = vcvtdq2ps_avx(auVar357);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar110 * 0x16 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar126);
  auVar369._16_16_ = auVar33;
  auVar369._0_16_ = auVar152;
  auVar147 = vcvtdq2ps_avx(auVar369);
  auVar147 = vsubps_avx(auVar147,auVar129);
  auVar358._0_4_ = auVar129._0_4_ + auVar147._0_4_ * fVar177;
  auVar358._4_4_ = auVar129._4_4_ + auVar147._4_4_ * fVar180;
  auVar358._8_4_ = auVar129._8_4_ + auVar147._8_4_ * fVar246;
  auVar358._12_4_ = auVar129._12_4_ + auVar147._12_4_ * fVar264;
  auVar358._16_4_ = auVar129._16_4_ + auVar147._16_4_ * fVar177;
  auVar358._20_4_ = auVar129._20_4_ + auVar147._20_4_ * fVar180;
  auVar358._24_4_ = auVar129._24_4_ + auVar147._24_4_ * fVar246;
  auVar358._28_4_ = auVar129._28_4_ + auVar147._28_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar110 * 0x14 + 6);
  auVar152 = vpmovsxwd_avx(auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar110 * 0x14 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar39);
  auVar370._16_16_ = auVar33;
  auVar370._0_16_ = auVar152;
  auVar129 = vcvtdq2ps_avx(auVar370);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar110 * 0x18 + 6);
  auVar152 = vpmovsxwd_avx(auVar41);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar110 * 0x18 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar10);
  auVar385._16_16_ = auVar33;
  auVar385._0_16_ = auVar152;
  auVar147 = vcvtdq2ps_avx(auVar385);
  auVar147 = vsubps_avx(auVar147,auVar129);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar110 * 0x1d + 6);
  auVar152 = vpmovsxwd_avx(auVar11);
  auVar371._0_4_ = auVar129._0_4_ + auVar147._0_4_ * fVar177;
  auVar371._4_4_ = auVar129._4_4_ + auVar147._4_4_ * fVar180;
  auVar371._8_4_ = auVar129._8_4_ + auVar147._8_4_ * fVar246;
  auVar371._12_4_ = auVar129._12_4_ + auVar147._12_4_ * fVar264;
  auVar371._16_4_ = auVar129._16_4_ + auVar147._16_4_ * fVar177;
  auVar371._20_4_ = auVar129._20_4_ + auVar147._20_4_ * fVar180;
  auVar371._24_4_ = auVar129._24_4_ + auVar147._24_4_ * fVar246;
  auVar371._28_4_ = auVar129._28_4_ + auVar147._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar110 * 0x1d + 0xe);
  auVar33 = vpmovsxwd_avx(auVar12);
  auVar386._16_16_ = auVar33;
  auVar386._0_16_ = auVar152;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar110 * 0x21 + 6);
  auVar152 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar110 * 0x21 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar14);
  auVar405._16_16_ = auVar33;
  auVar405._0_16_ = auVar152;
  auVar129 = vcvtdq2ps_avx(auVar386);
  auVar147 = vcvtdq2ps_avx(auVar405);
  auVar147 = vsubps_avx(auVar147,auVar129);
  auVar387._0_4_ = auVar129._0_4_ + auVar147._0_4_ * fVar177;
  auVar387._4_4_ = auVar129._4_4_ + auVar147._4_4_ * fVar180;
  auVar387._8_4_ = auVar129._8_4_ + auVar147._8_4_ * fVar246;
  auVar387._12_4_ = auVar129._12_4_ + auVar147._12_4_ * fVar264;
  auVar387._16_4_ = auVar129._16_4_ + auVar147._16_4_ * fVar177;
  auVar387._20_4_ = auVar129._20_4_ + auVar147._20_4_ * fVar180;
  auVar387._24_4_ = auVar129._24_4_ + auVar147._24_4_ * fVar246;
  auVar387._28_4_ = auVar129._28_4_ + auVar147._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar110 * 0x1f + 6);
  auVar152 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar110 * 0x1f + 0xe);
  auVar33 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar110 * 0x23 + 6);
  auVar35 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar110 * 0x23 + 0xe);
  auVar206 = vpmovsxwd_avx(auVar18);
  auVar406._16_16_ = auVar33;
  auVar406._0_16_ = auVar152;
  auVar426._16_16_ = auVar206;
  auVar426._0_16_ = auVar35;
  auVar129 = vcvtdq2ps_avx(auVar406);
  auVar147 = vcvtdq2ps_avx(auVar426);
  auVar147 = vsubps_avx(auVar147,auVar129);
  auVar407._0_4_ = auVar129._0_4_ + auVar147._0_4_ * fVar177;
  auVar407._4_4_ = auVar129._4_4_ + auVar147._4_4_ * fVar180;
  auVar407._8_4_ = auVar129._8_4_ + auVar147._8_4_ * fVar246;
  auVar407._12_4_ = auVar129._12_4_ + auVar147._12_4_ * fVar264;
  auVar407._16_4_ = auVar129._16_4_ + auVar147._16_4_ * fVar177;
  auVar407._20_4_ = auVar129._20_4_ + auVar147._20_4_ * fVar180;
  auVar407._24_4_ = auVar129._24_4_ + auVar147._24_4_ * fVar246;
  auVar407._28_4_ = auVar129._28_4_ + fVar264;
  auVar129 = vsubps_avx(auVar300,auVar163);
  auVar226._0_4_ = fVar200 * auVar129._0_4_;
  auVar226._4_4_ = fVar220 * auVar129._4_4_;
  auVar226._8_4_ = fVar221 * auVar129._8_4_;
  auVar226._12_4_ = fVar222 * auVar129._12_4_;
  auVar32._16_4_ = fVar223 * auVar129._16_4_;
  auVar32._0_16_ = auVar226;
  auVar32._20_4_ = fVar224 * auVar129._20_4_;
  auVar32._24_4_ = fVar225 * auVar129._24_4_;
  auVar32._28_4_ = auVar129._28_4_;
  auVar129 = vsubps_avx(auVar317,auVar163);
  auVar201._0_4_ = fVar200 * auVar129._0_4_;
  auVar201._4_4_ = fVar220 * auVar129._4_4_;
  auVar201._8_4_ = fVar221 * auVar129._8_4_;
  auVar201._12_4_ = fVar222 * auVar129._12_4_;
  auVar374._16_4_ = fVar223 * auVar129._16_4_;
  auVar374._0_16_ = auVar201;
  auVar374._20_4_ = fVar224 * auVar129._20_4_;
  auVar374._24_4_ = fVar225 * auVar129._24_4_;
  auVar374._28_4_ = auVar40._28_4_ + auVar31._28_4_;
  auVar319._4_4_ = fVar178 * local_a80._4_4_ + auVar28._4_4_ * fVar270 + fVar305 * auVar30._4_4_;
  auVar319._0_4_ = fVar8 * local_a80._0_4_ + auVar28._0_4_ * fVar268 + fVar304 * auVar30._0_4_;
  auVar319._8_4_ = fVar179 * local_a80._8_4_ + auVar28._8_4_ * fVar283 + fVar306 * auVar30._8_4_;
  auVar319._12_4_ = fVar273 * local_a80._12_4_ + auVar28._12_4_ * fVar284 + fVar440 * auVar30._12_4_
  ;
  auVar319._16_4_ = fStack_b30;
  auVar319._20_4_ = fStack_b2c;
  auVar319._24_4_ = fStack_b28;
  auVar319._28_4_ = fStack_b24;
  auVar129 = vsubps_avx(auVar358,auVar319);
  auVar150._0_4_ = fVar245 * auVar129._0_4_;
  auVar150._4_4_ = fVar262 * auVar129._4_4_;
  auVar150._8_4_ = fVar263 * auVar129._8_4_;
  auVar150._12_4_ = fVar265 * auVar129._12_4_;
  auVar28._16_4_ = fVar266 * auVar129._16_4_;
  auVar28._0_16_ = auVar150;
  auVar28._20_4_ = fVar267 * auVar129._20_4_;
  auVar28._24_4_ = fVar269 * auVar129._24_4_;
  auVar28._28_4_ = auVar129._28_4_;
  auVar129 = vsubps_avx(auVar371,auVar319);
  auVar247._0_4_ = fVar245 * auVar129._0_4_;
  auVar247._4_4_ = fVar262 * auVar129._4_4_;
  auVar247._8_4_ = fVar263 * auVar129._8_4_;
  auVar247._12_4_ = fVar265 * auVar129._12_4_;
  auVar30._16_4_ = fVar266 * auVar129._16_4_;
  auVar30._0_16_ = auVar247;
  auVar30._20_4_ = fVar267 * auVar129._20_4_;
  auVar30._24_4_ = fVar269 * auVar129._24_4_;
  auVar30._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar129 = vsubps_avx(auVar387,auVar190);
  auVar119._0_4_ = fVar272 * auVar129._0_4_;
  auVar119._4_4_ = fVar282 * auVar129._4_4_;
  auVar119._8_4_ = fVar286 * auVar129._8_4_;
  auVar119._12_4_ = fVar288 * auVar129._12_4_;
  auVar29._16_4_ = fVar290 * auVar129._16_4_;
  auVar29._0_16_ = auVar119;
  auVar29._20_4_ = fVar293 * auVar129._20_4_;
  auVar29._24_4_ = fVar296 * auVar129._24_4_;
  auVar29._28_4_ = auVar129._28_4_;
  auVar129 = vsubps_avx(auVar407,auVar190);
  auVar181._0_4_ = fVar272 * auVar129._0_4_;
  auVar181._4_4_ = fVar282 * auVar129._4_4_;
  auVar181._8_4_ = fVar286 * auVar129._8_4_;
  auVar181._12_4_ = fVar288 * auVar129._12_4_;
  auVar31._16_4_ = fVar290 * auVar129._16_4_;
  auVar31._0_16_ = auVar181;
  auVar31._20_4_ = fVar293 * auVar129._20_4_;
  auVar31._24_4_ = fVar296 * auVar129._24_4_;
  auVar31._28_4_ = auVar129._28_4_;
  auVar152 = vpminsd_avx(auVar32._16_16_,auVar374._16_16_);
  auVar33 = vpminsd_avx(auVar226,auVar201);
  auVar318._16_16_ = auVar152;
  auVar318._0_16_ = auVar33;
  auVar152 = vpminsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar33 = vpminsd_avx(auVar150,auVar247);
  auVar359._16_16_ = auVar152;
  auVar359._0_16_ = auVar33;
  auVar129 = vmaxps_avx(auVar318,auVar359);
  auVar152 = vpminsd_avx(auVar29._16_16_,auVar31._16_16_);
  auVar33 = vpminsd_avx(auVar119,auVar181);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar441._4_4_ = uVar9;
  auVar441._0_4_ = uVar9;
  auVar441._8_4_ = uVar9;
  auVar441._12_4_ = uVar9;
  auVar441._16_4_ = uVar9;
  auVar441._20_4_ = uVar9;
  auVar441._24_4_ = uVar9;
  auVar441._28_4_ = uVar9;
  auVar427._16_16_ = auVar152;
  auVar427._0_16_ = auVar33;
  auVar147 = vmaxps_avx(auVar427,auVar441);
  auVar129 = vmaxps_avx(auVar129,auVar147);
  local_3a0._4_4_ = auVar129._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar129._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar129._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar129._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar129._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar129._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar129._24_4_ * 0.99999964;
  local_3a0._28_4_ = auVar129._28_4_;
  auVar152 = vpmaxsd_avx(auVar32._16_16_,auVar374._16_16_);
  auVar33 = vpmaxsd_avx(auVar226,auVar201);
  auVar214._16_16_ = auVar152;
  auVar214._0_16_ = auVar33;
  auVar152 = vpmaxsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar33 = vpmaxsd_avx(auVar150,auVar247);
  auVar164._16_16_ = auVar152;
  auVar164._0_16_ = auVar33;
  auVar129 = vminps_avx(auVar214,auVar164);
  auVar152 = vpmaxsd_avx(auVar29._16_16_,auVar31._16_16_);
  auVar33 = vpmaxsd_avx(auVar119,auVar181);
  auVar133._16_16_ = auVar152;
  auVar133._0_16_ = auVar33;
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar191._4_4_ = uVar9;
  auVar191._0_4_ = uVar9;
  auVar191._8_4_ = uVar9;
  auVar191._12_4_ = uVar9;
  auVar191._16_4_ = uVar9;
  auVar191._20_4_ = uVar9;
  auVar191._24_4_ = uVar9;
  auVar191._28_4_ = uVar9;
  auVar147 = vminps_avx(auVar133,auVar191);
  auVar129 = vminps_avx(auVar129,auVar147);
  auVar40._4_4_ = auVar129._4_4_ * 1.0000004;
  auVar40._0_4_ = auVar129._0_4_ * 1.0000004;
  auVar40._8_4_ = auVar129._8_4_ * 1.0000004;
  auVar40._12_4_ = auVar129._12_4_ * 1.0000004;
  auVar40._16_4_ = auVar129._16_4_ * 1.0000004;
  auVar40._20_4_ = auVar129._20_4_ * 1.0000004;
  auVar40._24_4_ = auVar129._24_4_ * 1.0000004;
  auVar40._28_4_ = auVar129._28_4_;
  auVar129 = vcmpps_avx(local_3a0,auVar40,2);
  auVar152 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar165._16_16_ = auVar152;
  auVar165._0_16_ = auVar152;
  auVar147 = vcvtdq2ps_avx(auVar165);
  auVar147 = vcmpps_avx(_DAT_01f7b060,auVar147,1);
  auVar129 = vandps_avx(auVar129,auVar147);
  uVar114 = vmovmskps_avx(auVar129);
  auVar134._16_16_ = mm_lookupmask_ps._240_16_;
  auVar134._0_16_ = mm_lookupmask_ps._240_16_;
  local_620 = vblendps_avx(auVar134,ZEXT832(0) << 0x20,0x80);
  uVar113 = 1 << ((byte)k & 0x1f);
  local_b90 = (undefined1 (*) [32])&local_720;
  local_b98 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar113 & 0xf) << 4));
  local_ba0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar113 >> 4) * 0x10);
  local_9f0 = prim;
LAB_00ad4c90:
  local_9e8 = (ulong)uVar114;
  if (local_9e8 == 0) {
    return;
  }
  lVar112 = 0;
  if (local_9e8 != 0) {
    for (; (uVar114 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
    }
  }
  uVar114 = *(uint *)(local_9f0 + 2);
  local_b88 = (ulong)*(uint *)(local_9f0 + lVar112 * 4 + 6);
  pGVar20 = (context->scene->geometries).items[uVar114].ptr;
  uVar110 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                            local_b88 *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar8 = (pGVar20->time_range).lower;
  fVar8 = pGVar20->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar8) / ((pGVar20->time_range).upper - fVar8));
  auVar152 = vroundss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),9);
  auVar152 = vminss_avx(auVar152,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
  auVar152 = vmaxss_avx(ZEXT816(0) << 0x20,auVar152);
  fVar8 = fVar8 - auVar152._0_4_;
  _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar115 = (long)(int)auVar152._0_4_ * 0x38;
  lVar22 = *(long *)(_Var21 + 0x10 + lVar115);
  lVar23 = *(long *)(_Var21 + 0x38 + lVar115);
  lVar24 = *(long *)(_Var21 + 0x48 + lVar115);
  auVar152 = vshufps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),0);
  pfVar1 = (float *)(lVar23 + uVar110 * lVar24);
  fVar180 = auVar152._0_4_;
  fVar179 = auVar152._4_4_;
  fVar221 = auVar152._8_4_;
  fVar246 = auVar152._12_4_;
  pfVar2 = (float *)(lVar23 + (uVar110 + 1) * lVar24);
  pfVar3 = (float *)(lVar23 + (uVar110 + 2) * lVar24);
  pfVar4 = (float *)(lVar23 + lVar24 * (uVar110 + 3));
  lVar23 = *(long *)(_Var21 + lVar115);
  auVar152 = vshufps_avx(ZEXT416((uint)(1.0 - fVar8)),ZEXT416((uint)(1.0 - fVar8)),0);
  pfVar5 = (float *)(lVar23 + lVar22 * uVar110);
  fVar200 = auVar152._0_4_;
  fVar177 = auVar152._4_4_;
  fVar178 = auVar152._8_4_;
  fVar220 = auVar152._12_4_;
  pfVar6 = (float *)(lVar23 + lVar22 * (uVar110 + 1));
  pfVar7 = (float *)(lVar23 + lVar22 * (uVar110 + 2));
  auVar182._0_4_ = fVar180 * *pfVar1 + fVar200 * *pfVar5;
  auVar182._4_4_ = fVar179 * pfVar1[1] + fVar177 * pfVar5[1];
  auVar182._8_4_ = fVar221 * pfVar1[2] + fVar178 * pfVar5[2];
  auVar182._12_4_ = fVar246 * pfVar1[3] + fVar220 * pfVar5[3];
  auVar151._0_4_ = fVar200 * *pfVar6 + fVar180 * *pfVar2;
  auVar151._4_4_ = fVar177 * pfVar6[1] + fVar179 * pfVar2[1];
  auVar151._8_4_ = fVar178 * pfVar6[2] + fVar221 * pfVar2[2];
  auVar151._12_4_ = fVar220 * pfVar6[3] + fVar246 * pfVar2[3];
  pfVar1 = (float *)(lVar23 + lVar22 * (uVar110 + 3));
  auVar202._0_4_ = fVar200 * *pfVar7 + fVar180 * *pfVar3;
  auVar202._4_4_ = fVar177 * pfVar7[1] + fVar179 * pfVar3[1];
  auVar202._8_4_ = fVar178 * pfVar7[2] + fVar221 * pfVar3[2];
  auVar202._12_4_ = fVar220 * pfVar7[3] + fVar246 * pfVar3[3];
  auVar152 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar33 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar8 = *(float *)(ray + k * 4 + 0x80);
  auVar384._4_4_ = fVar8;
  auVar384._0_4_ = fVar8;
  auVar384._8_4_ = fVar8;
  auVar384._12_4_ = fVar8;
  fStack_9d0 = fVar8;
  _local_9e0 = auVar384;
  fStack_9cc = fVar8;
  fStack_9c8 = fVar8;
  fStack_9c4 = fVar8;
  auVar392 = ZEXT3264(_local_9e0);
  auVar248._0_4_ = fVar200 * *pfVar1 + fVar180 * *pfVar4;
  auVar248._4_4_ = fVar177 * pfVar1[1] + fVar179 * pfVar4[1];
  auVar248._8_4_ = fVar178 * pfVar1[2] + fVar221 * pfVar4[2];
  auVar248._12_4_ = fVar220 * pfVar1[3] + fVar246 * pfVar4[3];
  fVar200 = *(float *)(ray + k * 4 + 0xa0);
  auVar402._4_4_ = fVar200;
  auVar402._0_4_ = fVar200;
  auVar402._8_4_ = fVar200;
  auVar402._12_4_ = fVar200;
  fStack_8d0 = fVar200;
  _local_8e0 = auVar402;
  fStack_8cc = fVar200;
  fStack_8c8 = fVar200;
  fStack_8c4 = fVar200;
  auVar410 = ZEXT3264(_local_8e0);
  auVar152 = vunpcklps_avx(auVar384,auVar402);
  fVar177 = *(float *)(ray + k * 4 + 0xc0);
  auVar423._4_4_ = fVar177;
  auVar423._0_4_ = fVar177;
  auVar423._8_4_ = fVar177;
  auVar423._12_4_ = fVar177;
  fStack_8f0 = fVar177;
  _local_900 = auVar423;
  fStack_8ec = fVar177;
  fStack_8e8 = fVar177;
  fStack_8e4 = fVar177;
  _local_ad0 = vinsertps_avx(auVar152,auVar423,0x28);
  auVar363 = ZEXT1664(_local_ad0);
  auVar120._0_4_ = (auVar182._0_4_ + auVar151._0_4_ + auVar202._0_4_ + auVar248._0_4_) * 0.25;
  auVar120._4_4_ = (auVar182._4_4_ + auVar151._4_4_ + auVar202._4_4_ + auVar248._4_4_) * 0.25;
  auVar120._8_4_ = (auVar182._8_4_ + auVar151._8_4_ + auVar202._8_4_ + auVar248._8_4_) * 0.25;
  auVar120._12_4_ = (auVar182._12_4_ + auVar151._12_4_ + auVar202._12_4_ + auVar248._12_4_) * 0.25;
  auVar152 = vsubps_avx(auVar120,auVar33);
  auVar152 = vdpps_avx(auVar152,_local_ad0,0x7f);
  local_ae0 = vdpps_avx(_local_ad0,_local_ad0,0x7f);
  auVar376 = ZEXT1664(local_ae0);
  auVar35 = vrcpss_avx(local_ae0,local_ae0);
  fVar178 = auVar152._0_4_ * auVar35._0_4_ * (2.0 - local_ae0._0_4_ * auVar35._0_4_);
  auVar303 = ZEXT464((uint)fVar178);
  auVar35 = vshufps_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar178),0);
  auVar227._0_4_ = auVar33._0_4_ + local_ad0._0_4_ * auVar35._0_4_;
  auVar227._4_4_ = auVar33._4_4_ + local_ad0._4_4_ * auVar35._4_4_;
  auVar227._8_4_ = auVar33._8_4_ + local_ad0._8_4_ * auVar35._8_4_;
  auVar227._12_4_ = auVar33._12_4_ + local_ad0._12_4_ * auVar35._12_4_;
  auVar152 = vblendps_avx(auVar227,_DAT_01f45a50,8);
  auVar206 = vsubps_avx(auVar182,auVar152);
  auVar281 = ZEXT1664(auVar206);
  auVar36 = vsubps_avx(auVar202,auVar152);
  auVar122 = vsubps_avx(auVar151,auVar152);
  auVar183 = vsubps_avx(auVar248,auVar152);
  auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  auVar33 = vshufps_avx(auVar206,auVar206,0);
  auVar152 = vshufps_avx(auVar206,auVar206,0x55);
  register0x00001250 = auVar152;
  _local_1e0 = auVar152;
  auVar152 = vshufps_avx(auVar206,auVar206,0xaa);
  register0x00001250 = auVar152;
  _local_200 = auVar152;
  local_b40 = auVar206._0_4_;
  fStack_b3c = auVar206._4_4_;
  fStack_b38 = auVar206._8_4_;
  fStack_b34 = auVar206._12_4_;
  auVar152 = vshufps_avx(auVar206,auVar206,0xff);
  register0x00001290 = auVar152;
  _local_220 = auVar152;
  auVar152 = vshufps_avx(auVar122,auVar122,0);
  register0x00001290 = auVar152;
  _local_240 = auVar152;
  auVar152 = vshufps_avx(auVar122,auVar122,0x55);
  register0x00001290 = auVar152;
  _local_260 = auVar152;
  auVar152 = vshufps_avx(auVar122,auVar122,0xaa);
  register0x00001290 = auVar152;
  _local_280 = auVar152;
  _local_a60 = auVar122;
  auVar152 = vshufps_avx(auVar122,auVar122,0xff);
  register0x00001290 = auVar152;
  _local_500 = auVar152;
  auVar152 = vshufps_avx(auVar36,auVar36,0);
  register0x00001290 = auVar152;
  _local_520 = auVar152;
  auVar152 = vshufps_avx(auVar36,auVar36,0x55);
  register0x00001290 = auVar152;
  _local_540 = auVar152;
  auVar152 = vshufps_avx(auVar36,auVar36,0xaa);
  register0x00001290 = auVar152;
  _local_560 = auVar152;
  _local_b60 = auVar36;
  auVar152 = vshufps_avx(auVar36,auVar36,0xff);
  register0x00001290 = auVar152;
  _local_580 = auVar152;
  auVar152 = vshufps_avx(auVar183,auVar183,0);
  register0x00001290 = auVar152;
  _local_5a0 = auVar152;
  auVar152 = vshufps_avx(auVar183,auVar183,0x55);
  register0x00001290 = auVar152;
  _local_5c0 = auVar152;
  auVar152 = vshufps_avx(auVar183,auVar183,0xaa);
  register0x00001290 = auVar152;
  _local_5e0 = auVar152;
  _local_a80 = auVar183;
  auVar152 = vshufps_avx(auVar183,auVar183,0xff);
  register0x00001290 = auVar152;
  _local_600 = auVar152;
  auVar152 = ZEXT416((uint)(fVar8 * fVar8 + fVar200 * fVar200 + fVar177 * fVar177));
  auVar152 = vshufps_avx(auVar152,auVar152,0);
  local_2a0._16_16_ = auVar152;
  local_2a0._0_16_ = auVar152;
  auVar261 = ZEXT3264(local_2a0);
  fVar8 = *(float *)(ray + k * 4 + 0x60);
  local_a00 = ZEXT416((uint)fVar178);
  auVar152 = vshufps_avx(ZEXT416((uint)(fVar8 - fVar178)),ZEXT416((uint)(fVar8 - fVar178)),0);
  local_380._16_16_ = auVar152;
  local_380._0_16_ = auVar152;
  auVar152 = vpshufd_avx(ZEXT416(uVar114),0);
  local_6a0._16_16_ = auVar152;
  local_6a0._0_16_ = auVar152;
  auVar152 = vpshufd_avx(ZEXT416(*(uint *)(local_9f0 + lVar112 * 4 + 6)),0);
  local_6c0._16_16_ = auVar152;
  local_6c0._0_16_ = auVar152;
  register0x00001210 = auVar35;
  _local_ac0 = auVar35;
  uVar116 = 0;
  uVar113 = 1;
  auVar135._8_4_ = 0x7fffffff;
  auVar135._0_8_ = 0x7fffffff7fffffff;
  auVar135._12_4_ = 0x7fffffff;
  auVar135._16_4_ = 0x7fffffff;
  auVar135._20_4_ = 0x7fffffff;
  auVar135._24_4_ = 0x7fffffff;
  auVar135._28_4_ = 0x7fffffff;
  local_680 = vandps_avx(local_2a0,auVar135);
  auVar152 = vsqrtss_avx(local_ae0,local_ae0);
  auVar35 = vsqrtss_avx(local_ae0,local_ae0);
  local_810 = ZEXT816(0x3f80000000000000);
  do {
    auVar206 = vmovshdup_avx(local_810);
    auVar122 = vsubps_avx(auVar206,local_810);
    auVar206 = vshufps_avx(local_810,local_810,0);
    auVar36 = vshufps_avx(auVar122,auVar122,0);
    fVar440 = auVar36._0_4_;
    fVar442 = auVar36._4_4_;
    fVar443 = auVar36._8_4_;
    fVar445 = auVar36._12_4_;
    fVar446 = auVar206._0_4_;
    auVar215._0_4_ = fVar446 + fVar440 * 0.0;
    fVar447 = auVar206._4_4_;
    auVar215._4_4_ = fVar447 + fVar442 * 0.14285715;
    fVar448 = auVar206._8_4_;
    auVar215._8_4_ = fVar448 + fVar443 * 0.2857143;
    fVar199 = auVar206._12_4_;
    auVar215._12_4_ = fVar199 + fVar445 * 0.42857146;
    auVar215._16_4_ = fVar446 + fVar440 * 0.5714286;
    auVar215._20_4_ = fVar447 + fVar442 * 0.71428573;
    auVar215._24_4_ = fVar448 + fVar443 * 0.8571429;
    auVar215._28_4_ = fVar199 + fVar445;
    auVar129 = vsubps_avx(auVar244._0_32_,auVar215);
    fVar200 = auVar129._0_4_;
    fVar177 = auVar129._4_4_;
    fVar178 = auVar129._8_4_;
    fVar220 = auVar129._12_4_;
    fVar180 = auVar129._16_4_;
    fVar179 = auVar129._20_4_;
    fVar221 = auVar129._24_4_;
    fVar273 = fVar200 * fVar200 * fVar200;
    fVar283 = fVar177 * fVar177 * fVar177;
    fVar245 = fVar178 * fVar178 * fVar178;
    fVar263 = fVar220 * fVar220 * fVar220;
    fVar266 = fVar180 * fVar180 * fVar180;
    fVar269 = fVar179 * fVar179 * fVar179;
    fVar282 = fVar221 * fVar221 * fVar221;
    fVar288 = auVar215._0_4_ * auVar215._0_4_ * auVar215._0_4_;
    fVar290 = auVar215._4_4_ * auVar215._4_4_ * auVar215._4_4_;
    fVar293 = auVar215._8_4_ * auVar215._8_4_ * auVar215._8_4_;
    fVar296 = auVar215._12_4_ * auVar215._12_4_ * auVar215._12_4_;
    fVar304 = auVar215._16_4_ * auVar215._16_4_ * auVar215._16_4_;
    fVar305 = auVar215._20_4_ * auVar215._20_4_ * auVar215._20_4_;
    fVar306 = auVar215._24_4_ * auVar215._24_4_ * auVar215._24_4_;
    fVar246 = auVar215._0_4_ * fVar200;
    fVar222 = auVar215._4_4_ * fVar177;
    fVar264 = auVar215._8_4_ * fVar178;
    fVar223 = auVar215._12_4_ * fVar220;
    fVar224 = auVar215._16_4_ * fVar180;
    fVar268 = auVar215._20_4_ * fVar179;
    fVar270 = auVar215._24_4_ * fVar221;
    fVar225 = auVar376._28_4_ + auVar410._28_4_;
    fVar352 = auVar303._28_4_ + auVar261._28_4_ + fVar225;
    fVar364 = fVar225 + auVar281._28_4_ + auVar392._28_4_ + auVar363._28_4_;
    fVar225 = fVar273 * 0.16666667;
    fVar284 = fVar283 * 0.16666667;
    fVar262 = fVar245 * 0.16666667;
    fVar265 = fVar263 * 0.16666667;
    fVar267 = fVar266 * 0.16666667;
    fVar272 = fVar269 * 0.16666667;
    fVar286 = fVar282 * 0.16666667;
    fVar307 = (fVar288 + fVar273 * 4.0 + fVar200 * fVar246 * 12.0 + auVar215._0_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar322 = (fVar290 + fVar283 * 4.0 + fVar177 * fVar222 * 12.0 + auVar215._4_4_ * fVar222 * 6.0)
              * 0.16666667;
    fVar327 = (fVar293 + fVar245 * 4.0 + fVar178 * fVar264 * 12.0 + auVar215._8_4_ * fVar264 * 6.0)
              * 0.16666667;
    fVar332 = (fVar296 + fVar263 * 4.0 + fVar220 * fVar223 * 12.0 + auVar215._12_4_ * fVar223 * 6.0)
              * 0.16666667;
    fVar337 = (fVar304 + fVar266 * 4.0 + fVar180 * fVar224 * 12.0 + auVar215._16_4_ * fVar224 * 6.0)
              * 0.16666667;
    fVar342 = (fVar305 + fVar269 * 4.0 + fVar179 * fVar268 * 12.0 + auVar215._20_4_ * fVar268 * 6.0)
              * 0.16666667;
    fVar347 = (fVar306 + fVar282 * 4.0 + fVar221 * fVar270 * 12.0 + auVar215._24_4_ * fVar270 * 6.0)
              * 0.16666667;
    fVar273 = (fVar288 * 4.0 + fVar273 + auVar215._0_4_ * fVar246 * 12.0 + fVar200 * fVar246 * 6.0)
              * 0.16666667;
    fVar283 = (fVar290 * 4.0 + fVar283 + auVar215._4_4_ * fVar222 * 12.0 + fVar177 * fVar222 * 6.0)
              * 0.16666667;
    fVar245 = (fVar293 * 4.0 + fVar245 + auVar215._8_4_ * fVar264 * 12.0 + fVar178 * fVar264 * 6.0)
              * 0.16666667;
    fVar263 = (fVar296 * 4.0 + fVar263 + auVar215._12_4_ * fVar223 * 12.0 + fVar220 * fVar223 * 6.0)
              * 0.16666667;
    fVar266 = (fVar304 * 4.0 + fVar266 + auVar215._16_4_ * fVar224 * 12.0 + fVar180 * fVar224 * 6.0)
              * 0.16666667;
    fVar269 = (fVar305 * 4.0 + fVar269 + auVar215._20_4_ * fVar268 * 12.0 + fVar179 * fVar268 * 6.0)
              * 0.16666667;
    fVar282 = (fVar306 * 4.0 + fVar282 + auVar215._24_4_ * fVar270 * 12.0 + fVar221 * fVar270 * 6.0)
              * 0.16666667;
    fVar288 = fVar288 * 0.16666667;
    fVar290 = fVar290 * 0.16666667;
    fVar293 = fVar293 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar304 = fVar304 * 0.16666667;
    fVar305 = fVar305 * 0.16666667;
    fVar306 = fVar306 * 0.16666667;
    fVar399 = auVar392._28_4_ + 12.0;
    fVar365 = fVar364 + 12.166667;
    fVar291 = auVar33._0_4_;
    fVar294 = auVar33._4_4_;
    fVar297 = auVar33._8_4_;
    fVar444 = auVar33._12_4_;
    fVar308 = fVar291 * fVar225 +
              fVar307 * (float)local_240._0_4_ +
              fVar288 * (float)local_5a0._0_4_ + fVar273 * (float)local_520._0_4_;
    fVar323 = fVar294 * fVar284 +
              fVar322 * (float)local_240._4_4_ +
              fVar290 * (float)local_5a0._4_4_ + fVar283 * (float)local_520._4_4_;
    fVar328 = fVar297 * fVar262 + fVar327 * fStack_238 + fVar293 * fStack_598 + fVar245 * fStack_518
    ;
    fVar333 = fVar444 * fVar265 + fVar332 * fStack_234 + fVar296 * fStack_594 + fVar263 * fStack_514
    ;
    fVar338 = fVar291 * fVar267 + fVar337 * fStack_230 + fVar304 * fStack_590 + fVar266 * fStack_510
    ;
    fVar343 = fVar294 * fVar272 + fVar342 * fStack_22c + fVar305 * fStack_58c + fVar269 * fStack_50c
    ;
    fVar348 = fVar297 * fVar286 + fVar347 * fStack_228 + fVar306 * fStack_588 + fVar282 * fStack_508
    ;
    fVar353 = fVar352 + fVar365;
    fVar309 = (float)local_1e0._0_4_ * fVar225 +
              (float)local_260._0_4_ * fVar307 +
              fVar288 * (float)local_5c0._0_4_ + fVar273 * (float)local_540._0_4_;
    fVar324 = (float)local_1e0._4_4_ * fVar284 +
              (float)local_260._4_4_ * fVar322 +
              fVar290 * (float)local_5c0._4_4_ + fVar283 * (float)local_540._4_4_;
    fVar329 = fStack_1d8 * fVar262 +
              fStack_258 * fVar327 + fVar293 * fStack_5b8 + fVar245 * fStack_538;
    fVar334 = fStack_1d4 * fVar265 +
              fStack_254 * fVar332 + fVar296 * fStack_5b4 + fVar263 * fStack_534;
    fVar339 = fStack_1d0 * fVar267 +
              fStack_250 * fVar337 + fVar304 * fStack_5b0 + fVar266 * fStack_530;
    fVar344 = fStack_1cc * fVar272 +
              fStack_24c * fVar342 + fVar305 * fStack_5ac + fVar269 * fStack_52c;
    fVar349 = fStack_1c8 * fVar286 +
              fStack_248 * fVar347 + fVar306 * fStack_5a8 + fVar282 * fStack_528;
    fVar354 = fVar353 + fVar399 + 12.166667;
    local_aa0 = (float)local_200._0_4_ * fVar225 +
                (float)local_280._0_4_ * fVar307 +
                fVar288 * (float)local_5e0._0_4_ + fVar273 * (float)local_560._0_4_;
    fStack_a9c = (float)local_200._4_4_ * fVar284 +
                 (float)local_280._4_4_ * fVar322 +
                 fVar290 * (float)local_5e0._4_4_ + fVar283 * (float)local_560._4_4_;
    fStack_a98 = fStack_1f8 * fVar262 +
                 fStack_278 * fVar327 + fVar293 * fStack_5d8 + fVar245 * fStack_558;
    fStack_a94 = fStack_1f4 * fVar265 +
                 fStack_274 * fVar332 + fVar296 * fStack_5d4 + fVar263 * fStack_554;
    fStack_a90 = fStack_1f0 * fVar267 +
                 fStack_270 * fVar337 + fVar304 * fStack_5d0 + fVar266 * fStack_550;
    fStack_a8c = fStack_1ec * fVar272 +
                 fStack_26c * fVar342 + fVar305 * fStack_5cc + fVar269 * fStack_54c;
    fStack_a88 = fStack_1e8 * fVar286 +
                 fStack_268 * fVar347 + fVar306 * fStack_5c8 + fVar282 * fStack_548;
    fStack_a84 = fVar354 + fVar399 + auVar410._28_4_ + 12.0;
    local_bc0._0_4_ =
         (float)local_220._0_4_ * fVar225 +
         fVar307 * (float)local_500._0_4_ +
         fVar273 * (float)local_580._0_4_ + fVar288 * (float)local_600._0_4_;
    local_bc0._4_4_ =
         (float)local_220._4_4_ * fVar284 +
         fVar322 * (float)local_500._4_4_ +
         fVar283 * (float)local_580._4_4_ + fVar290 * (float)local_600._4_4_;
    fStack_bb8 = fStack_218 * fVar262 +
                 fVar327 * fStack_4f8 + fVar245 * fStack_578 + fVar293 * fStack_5f8;
    fStack_bb4 = fStack_214 * fVar265 +
                 fVar332 * fStack_4f4 + fVar263 * fStack_574 + fVar296 * fStack_5f4;
    fStack_bb0 = fStack_210 * fVar267 +
                 fVar337 * fStack_4f0 + fVar266 * fStack_570 + fVar304 * fStack_5f0;
    fStack_bac = fStack_20c * fVar272 +
                 fVar342 * fStack_4ec + fVar269 * fStack_56c + fVar305 * fStack_5ec;
    fStack_ba8 = fStack_208 * fVar286 +
                 fVar347 * fStack_4e8 + fVar282 * fStack_568 + fVar306 * fStack_5e8;
    fStack_ba4 = auVar281._28_4_ + fVar352 + fVar364 + auVar303._28_4_;
    auVar42._4_4_ = auVar215._4_4_ * -auVar215._4_4_;
    auVar42._0_4_ = auVar215._0_4_ * -auVar215._0_4_;
    auVar42._8_4_ = auVar215._8_4_ * -auVar215._8_4_;
    auVar42._12_4_ = auVar215._12_4_ * -auVar215._12_4_;
    auVar42._16_4_ = auVar215._16_4_ * -auVar215._16_4_;
    auVar42._20_4_ = auVar215._20_4_ * -auVar215._20_4_;
    auVar42._24_4_ = auVar215._24_4_ * -auVar215._24_4_;
    auVar42._28_4_ = auVar215._28_4_;
    auVar43._4_4_ = fVar222 * 4.0;
    auVar43._0_4_ = fVar246 * 4.0;
    auVar43._8_4_ = fVar264 * 4.0;
    auVar43._12_4_ = fVar223 * 4.0;
    auVar43._16_4_ = fVar224 * 4.0;
    auVar43._20_4_ = fVar268 * 4.0;
    auVar43._24_4_ = fVar270 * 4.0;
    auVar43._28_4_ = auVar261._28_4_;
    auVar129 = vsubps_avx(auVar42,auVar43);
    fVar269 = fVar200 * -fVar200 * 0.5;
    fVar272 = fVar177 * -fVar177 * 0.5;
    fVar282 = fVar178 * -fVar178 * 0.5;
    fVar286 = fVar220 * -fVar220 * 0.5;
    fVar293 = fVar180 * -fVar180 * 0.5;
    fVar296 = fVar179 * -fVar179 * 0.5;
    fVar304 = fVar221 * -fVar221 * 0.5;
    fVar283 = auVar129._0_4_ * 0.5;
    fVar284 = auVar129._4_4_ * 0.5;
    fVar245 = auVar129._8_4_ * 0.5;
    fVar262 = auVar129._12_4_ * 0.5;
    fVar265 = auVar129._16_4_ * 0.5;
    fVar266 = auVar129._20_4_ * 0.5;
    fVar267 = auVar129._24_4_ * 0.5;
    fVar273 = (fVar200 * fVar200 + fVar246 * 4.0) * 0.5;
    fVar222 = (fVar177 * fVar177 + fVar222 * 4.0) * 0.5;
    fVar264 = (fVar178 * fVar178 + fVar264 * 4.0) * 0.5;
    fVar223 = (fVar220 * fVar220 + fVar223 * 4.0) * 0.5;
    fVar225 = (fVar180 * fVar180 + fVar224 * 4.0) * 0.5;
    fVar268 = (fVar179 * fVar179 + fVar268 * 4.0) * 0.5;
    fVar270 = (fVar221 * fVar221 + fVar270 * 4.0) * 0.5;
    fVar200 = auVar215._0_4_ * auVar215._0_4_ * 0.5;
    fVar177 = auVar215._4_4_ * auVar215._4_4_ * 0.5;
    fVar178 = auVar215._8_4_ * auVar215._8_4_ * 0.5;
    fVar220 = auVar215._12_4_ * auVar215._12_4_ * 0.5;
    fVar179 = auVar215._16_4_ * auVar215._16_4_ * 0.5;
    fVar221 = auVar215._20_4_ * auVar215._20_4_ * 0.5;
    fVar246 = auVar215._24_4_ * auVar215._24_4_ * 0.5;
    auVar206 = vpermilps_avx(ZEXT416((uint)(auVar122._0_4_ * 0.04761905)),0);
    fVar180 = auVar206._0_4_;
    fVar310 = fVar180 * (fVar291 * fVar269 +
                        (float)local_240._0_4_ * fVar283 +
                        fVar273 * (float)local_520._0_4_ + fVar200 * (float)local_5a0._0_4_);
    fVar224 = auVar206._4_4_;
    fVar325 = fVar224 * (fVar294 * fVar272 +
                        (float)local_240._4_4_ * fVar284 +
                        fVar222 * (float)local_520._4_4_ + fVar177 * (float)local_5a0._4_4_);
    auVar44._4_4_ = fVar325;
    auVar44._0_4_ = fVar310;
    fVar263 = auVar206._8_4_;
    fVar330 = fVar263 * (fVar297 * fVar282 +
                        fStack_238 * fVar245 + fVar264 * fStack_518 + fVar178 * fStack_598);
    auVar44._8_4_ = fVar330;
    fVar288 = auVar206._12_4_;
    fVar335 = fVar288 * (fVar444 * fVar286 +
                        fStack_234 * fVar262 + fVar223 * fStack_514 + fVar220 * fStack_594);
    auVar44._12_4_ = fVar335;
    fVar340 = fVar180 * (fVar291 * fVar293 +
                        fStack_230 * fVar265 + fVar225 * fStack_510 + fVar179 * fStack_590);
    auVar44._16_4_ = fVar340;
    fVar345 = fVar224 * (fVar294 * fVar296 +
                        fStack_22c * fVar266 + fVar268 * fStack_50c + fVar221 * fStack_58c);
    auVar44._20_4_ = fVar345;
    fVar350 = fVar263 * (fVar297 * fVar304 +
                        fStack_228 * fVar267 + fVar270 * fStack_508 + fVar246 * fStack_588);
    auVar44._24_4_ = fVar350;
    auVar44._28_4_ = fStack_a84 + fVar365;
    fVar383 = fVar180 * ((float)local_1e0._0_4_ * fVar269 +
                        (float)local_260._0_4_ * fVar283 +
                        fVar273 * (float)local_540._0_4_ + fVar200 * (float)local_5c0._0_4_);
    fVar393 = fVar224 * ((float)local_1e0._4_4_ * fVar272 +
                        (float)local_260._4_4_ * fVar284 +
                        fVar222 * (float)local_540._4_4_ + fVar177 * (float)local_5c0._4_4_);
    auVar45._4_4_ = fVar393;
    auVar45._0_4_ = fVar383;
    fVar394 = fVar263 * (fStack_1d8 * fVar282 +
                        fStack_258 * fVar245 + fVar264 * fStack_538 + fVar178 * fStack_5b8);
    auVar45._8_4_ = fVar394;
    fVar395 = fVar288 * (fStack_1d4 * fVar286 +
                        fStack_254 * fVar262 + fVar223 * fStack_534 + fVar220 * fStack_5b4);
    auVar45._12_4_ = fVar395;
    fVar396 = fVar180 * (fStack_1d0 * fVar293 +
                        fStack_250 * fVar265 + fVar225 * fStack_530 + fVar179 * fStack_5b0);
    auVar45._16_4_ = fVar396;
    fVar397 = fVar224 * (fStack_1cc * fVar296 +
                        fStack_24c * fVar266 + fVar268 * fStack_52c + fVar221 * fStack_5ac);
    auVar45._20_4_ = fVar397;
    fVar398 = fVar263 * (fStack_1c8 * fVar304 +
                        fStack_248 * fVar267 + fVar270 * fStack_528 + fVar246 * fStack_5a8);
    auVar45._24_4_ = fVar398;
    auVar45._28_4_ = fStack_204;
    fVar400 = fVar180 * ((float)local_200._0_4_ * fVar269 +
                        fVar200 * (float)local_5e0._0_4_ + fVar273 * (float)local_560._0_4_ +
                        (float)local_280._0_4_ * fVar283);
    fVar411 = fVar224 * ((float)local_200._4_4_ * fVar272 +
                        fVar177 * (float)local_5e0._4_4_ + fVar222 * (float)local_560._4_4_ +
                        (float)local_280._4_4_ * fVar284);
    auVar46._4_4_ = fVar411;
    auVar46._0_4_ = fVar400;
    fVar413 = fVar263 * (fStack_1f8 * fVar282 +
                        fVar178 * fStack_5d8 + fVar264 * fStack_558 + fStack_278 * fVar245);
    auVar46._8_4_ = fVar413;
    fVar415 = fVar288 * (fStack_1f4 * fVar286 +
                        fVar220 * fStack_5d4 + fVar223 * fStack_554 + fStack_274 * fVar262);
    auVar46._12_4_ = fVar415;
    fVar417 = fVar180 * (fStack_1f0 * fVar293 +
                        fVar179 * fStack_5d0 + fVar225 * fStack_550 + fStack_270 * fVar265);
    auVar46._16_4_ = fVar417;
    fVar419 = fVar224 * (fStack_1ec * fVar296 +
                        fVar221 * fStack_5cc + fVar268 * fStack_54c + fStack_26c * fVar266);
    auVar46._20_4_ = fVar419;
    fVar421 = fVar263 * (fStack_1e8 * fVar304 +
                        fVar246 * fStack_5c8 + fVar270 * fStack_548 + fStack_268 * fVar267);
    auVar46._24_4_ = fVar421;
    auVar46._28_4_ = fStack_1c4;
    fVar273 = fVar180 * ((float)local_220._0_4_ * fVar269 +
                        fVar283 * (float)local_500._0_4_ +
                        fVar200 * (float)local_600._0_4_ + fVar273 * (float)local_580._0_4_);
    fVar283 = fVar224 * ((float)local_220._4_4_ * fVar272 +
                        fVar284 * (float)local_500._4_4_ +
                        fVar177 * (float)local_600._4_4_ + fVar222 * (float)local_580._4_4_);
    auVar47._4_4_ = fVar283;
    auVar47._0_4_ = fVar273;
    fVar269 = fVar263 * (fStack_218 * fVar282 +
                        fVar245 * fStack_4f8 + fVar178 * fStack_5f8 + fVar264 * fStack_578);
    auVar47._8_4_ = fVar269;
    fVar290 = fVar288 * (fStack_214 * fVar286 +
                        fVar262 * fStack_4f4 + fVar220 * fStack_5f4 + fVar223 * fStack_574);
    auVar47._12_4_ = fVar290;
    fVar180 = fVar180 * (fStack_210 * fVar293 +
                        fVar265 * fStack_4f0 + fVar179 * fStack_5f0 + fVar225 * fStack_570);
    auVar47._16_4_ = fVar180;
    fVar224 = fVar224 * (fStack_20c * fVar296 +
                        fVar266 * fStack_4ec + fVar221 * fStack_5ec + fVar268 * fStack_56c);
    auVar47._20_4_ = fVar224;
    fVar263 = fVar263 * (fStack_208 * fVar304 +
                        fVar267 * fStack_4e8 + fVar246 * fStack_5e8 + fVar270 * fStack_568);
    auVar47._24_4_ = fVar263;
    auVar47._28_4_ = fVar288;
    auVar97._4_4_ = fVar324;
    auVar97._0_4_ = fVar309;
    auVar97._8_4_ = fVar329;
    auVar97._12_4_ = fVar334;
    auVar97._16_4_ = fVar339;
    auVar97._20_4_ = fVar344;
    auVar97._24_4_ = fVar349;
    auVar97._28_4_ = fVar354;
    auVar129 = vperm2f128_avx(auVar97,auVar97,1);
    auVar129 = vshufps_avx(auVar129,auVar97,0x30);
    local_b80 = vshufps_avx(auVar97,auVar129,0x29);
    auVar106._4_4_ = fStack_a9c;
    auVar106._0_4_ = local_aa0;
    auVar106._8_4_ = fStack_a98;
    auVar106._12_4_ = fStack_a94;
    auVar106._16_4_ = fStack_a90;
    auVar106._20_4_ = fStack_a8c;
    auVar106._24_4_ = fStack_a88;
    auVar106._28_4_ = fStack_a84;
    auVar129 = vperm2f128_avx(auVar106,auVar106,1);
    auVar129 = vshufps_avx(auVar129,auVar106,0x30);
    auVar27 = vshufps_avx(auVar106,auVar129,0x29);
    auVar147 = vsubps_avx(_local_bc0,auVar47);
    auVar129 = vperm2f128_avx(auVar147,auVar147,1);
    auVar129 = vshufps_avx(auVar129,auVar147,0x30);
    auVar28 = vshufps_avx(auVar147,auVar129,0x29);
    local_640 = vsubps_avx(local_b80,auVar97);
    local_300 = vsubps_avx(auVar27,auVar106);
    fVar177 = local_640._0_4_;
    fVar179 = local_640._4_4_;
    auVar48._4_4_ = fVar411 * fVar179;
    auVar48._0_4_ = fVar400 * fVar177;
    fVar222 = local_640._8_4_;
    auVar48._8_4_ = fVar413 * fVar222;
    fVar225 = local_640._12_4_;
    auVar48._12_4_ = fVar415 * fVar225;
    fVar284 = local_640._16_4_;
    auVar48._16_4_ = fVar417 * fVar284;
    fVar265 = local_640._20_4_;
    auVar48._20_4_ = fVar419 * fVar265;
    fVar272 = local_640._24_4_;
    auVar48._24_4_ = fVar421 * fVar272;
    auVar48._28_4_ = auVar147._28_4_;
    fVar178 = local_300._0_4_;
    fVar221 = local_300._4_4_;
    auVar49._4_4_ = fVar393 * fVar221;
    auVar49._0_4_ = fVar383 * fVar178;
    fVar264 = local_300._8_4_;
    auVar49._8_4_ = fVar394 * fVar264;
    fVar268 = local_300._12_4_;
    auVar49._12_4_ = fVar395 * fVar268;
    fVar245 = local_300._16_4_;
    auVar49._16_4_ = fVar396 * fVar245;
    fVar266 = local_300._20_4_;
    auVar49._20_4_ = fVar397 * fVar266;
    fVar282 = local_300._24_4_;
    auVar49._24_4_ = fVar398 * fVar282;
    auVar49._28_4_ = auVar129._28_4_;
    auVar29 = vsubps_avx(auVar49,auVar48);
    auVar99._4_4_ = fVar323;
    auVar99._0_4_ = fVar308;
    auVar99._8_4_ = fVar328;
    auVar99._12_4_ = fVar333;
    auVar99._16_4_ = fVar338;
    auVar99._20_4_ = fVar343;
    auVar99._24_4_ = fVar348;
    auVar99._28_4_ = fVar353;
    auVar129 = vperm2f128_avx(auVar99,auVar99,1);
    auVar129 = vshufps_avx(auVar129,auVar99,0x30);
    auVar30 = vshufps_avx(auVar99,auVar129,0x29);
    local_660 = vsubps_avx(auVar30,auVar99);
    auVar50._4_4_ = fVar325 * fVar221;
    auVar50._0_4_ = fVar310 * fVar178;
    auVar50._8_4_ = fVar330 * fVar264;
    auVar50._12_4_ = fVar335 * fVar268;
    auVar50._16_4_ = fVar340 * fVar245;
    auVar50._20_4_ = fVar345 * fVar266;
    auVar50._24_4_ = fVar350 * fVar282;
    auVar50._28_4_ = auVar30._28_4_;
    fVar220 = local_660._0_4_;
    fVar246 = local_660._4_4_;
    auVar51._4_4_ = fVar411 * fVar246;
    auVar51._0_4_ = fVar400 * fVar220;
    fVar223 = local_660._8_4_;
    auVar51._8_4_ = fVar413 * fVar223;
    fVar270 = local_660._12_4_;
    auVar51._12_4_ = fVar415 * fVar270;
    fVar262 = local_660._16_4_;
    auVar51._16_4_ = fVar417 * fVar262;
    fVar267 = local_660._20_4_;
    auVar51._20_4_ = fVar419 * fVar267;
    fVar286 = local_660._24_4_;
    auVar51._24_4_ = fVar421 * fVar286;
    auVar51._28_4_ = fVar365;
    auVar31 = vsubps_avx(auVar51,auVar50);
    auVar52._4_4_ = fVar393 * fVar246;
    auVar52._0_4_ = fVar383 * fVar220;
    auVar52._8_4_ = fVar394 * fVar223;
    auVar52._12_4_ = fVar395 * fVar270;
    auVar52._16_4_ = fVar396 * fVar262;
    auVar52._20_4_ = fVar397 * fVar267;
    auVar52._24_4_ = fVar398 * fVar286;
    auVar52._28_4_ = fVar365;
    auVar53._4_4_ = fVar325 * fVar179;
    auVar53._0_4_ = fVar310 * fVar177;
    auVar53._8_4_ = fVar330 * fVar222;
    auVar53._12_4_ = fVar335 * fVar225;
    auVar53._16_4_ = fVar340 * fVar284;
    auVar53._20_4_ = fVar345 * fVar265;
    auVar53._24_4_ = fVar350 * fVar272;
    auVar53._28_4_ = uStack_1e4;
    auVar373 = vsubps_avx(auVar53,auVar52);
    fVar200 = auVar373._28_4_;
    auVar192._0_4_ = fVar220 * fVar220 + fVar177 * fVar177 + fVar178 * fVar178;
    auVar192._4_4_ = fVar246 * fVar246 + fVar179 * fVar179 + fVar221 * fVar221;
    auVar192._8_4_ = fVar223 * fVar223 + fVar222 * fVar222 + fVar264 * fVar264;
    auVar192._12_4_ = fVar270 * fVar270 + fVar225 * fVar225 + fVar268 * fVar268;
    auVar192._16_4_ = fVar262 * fVar262 + fVar284 * fVar284 + fVar245 * fVar245;
    auVar192._20_4_ = fVar267 * fVar267 + fVar265 * fVar265 + fVar266 * fVar266;
    auVar192._24_4_ = fVar286 * fVar286 + fVar272 * fVar272 + fVar282 * fVar282;
    auVar192._28_4_ = fVar200 + fVar200 + auVar29._28_4_;
    auVar129 = vrcpps_avx(auVar192);
    fVar293 = auVar129._0_4_;
    fVar296 = auVar129._4_4_;
    auVar54._4_4_ = fVar296 * auVar192._4_4_;
    auVar54._0_4_ = fVar293 * auVar192._0_4_;
    fVar304 = auVar129._8_4_;
    auVar54._8_4_ = fVar304 * auVar192._8_4_;
    fVar305 = auVar129._12_4_;
    auVar54._12_4_ = fVar305 * auVar192._12_4_;
    fVar306 = auVar129._16_4_;
    auVar54._16_4_ = fVar306 * auVar192._16_4_;
    fVar307 = auVar129._20_4_;
    auVar54._20_4_ = fVar307 * auVar192._20_4_;
    fVar322 = auVar129._24_4_;
    auVar54._24_4_ = fVar322 * auVar192._24_4_;
    auVar54._28_4_ = uStack_1e4;
    auVar278._8_4_ = 0x3f800000;
    auVar278._0_8_ = 0x3f8000003f800000;
    auVar278._12_4_ = 0x3f800000;
    auVar278._16_4_ = 0x3f800000;
    auVar278._20_4_ = 0x3f800000;
    auVar278._24_4_ = 0x3f800000;
    auVar278._28_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar278,auVar54);
    fVar293 = fVar293 + fVar293 * auVar32._0_4_;
    fVar296 = fVar296 + fVar296 * auVar32._4_4_;
    fVar304 = fVar304 + fVar304 * auVar32._8_4_;
    fVar305 = fVar305 + fVar305 * auVar32._12_4_;
    fVar306 = fVar306 + fVar306 * auVar32._16_4_;
    fVar307 = fVar307 + fVar307 * auVar32._20_4_;
    fVar322 = fVar322 + fVar322 * auVar32._24_4_;
    auVar147 = vperm2f128_avx(auVar45,auVar45,1);
    auVar147 = vshufps_avx(auVar147,auVar45,0x30);
    local_b00 = vshufps_avx(auVar45,auVar147,0x29);
    auVar147 = vperm2f128_avx(auVar46,auVar46,1);
    auVar147 = vshufps_avx(auVar147,auVar46,0x30);
    local_960 = vshufps_avx(auVar46,auVar147,0x29);
    fVar401 = local_960._0_4_;
    fVar412 = local_960._4_4_;
    auVar55._4_4_ = fVar412 * fVar179;
    auVar55._0_4_ = fVar401 * fVar177;
    fVar414 = local_960._8_4_;
    auVar55._8_4_ = fVar414 * fVar222;
    fVar416 = local_960._12_4_;
    auVar55._12_4_ = fVar416 * fVar225;
    fVar418 = local_960._16_4_;
    auVar55._16_4_ = fVar418 * fVar284;
    fVar420 = local_960._20_4_;
    auVar55._20_4_ = fVar420 * fVar265;
    fVar422 = local_960._24_4_;
    auVar55._24_4_ = fVar422 * fVar272;
    auVar55._28_4_ = auVar147._28_4_;
    fVar352 = local_b00._0_4_;
    fVar364 = local_b00._4_4_;
    auVar56._4_4_ = fVar364 * fVar221;
    auVar56._0_4_ = fVar352 * fVar178;
    fVar365 = local_b00._8_4_;
    auVar56._8_4_ = fVar365 * fVar264;
    fVar399 = local_b00._12_4_;
    auVar56._12_4_ = fVar399 * fVar268;
    fVar291 = local_b00._16_4_;
    auVar56._16_4_ = fVar291 * fVar245;
    fVar294 = local_b00._20_4_;
    auVar56._20_4_ = fVar294 * fVar266;
    fVar297 = local_b00._24_4_;
    auVar56._24_4_ = fVar297 * fVar282;
    auVar56._28_4_ = fStack_204;
    auVar40 = vsubps_avx(auVar56,auVar55);
    auVar147 = vperm2f128_avx(auVar44,auVar44,1);
    auVar147 = vshufps_avx(auVar147,auVar44,0x30);
    local_940 = vshufps_avx(auVar44,auVar147,0x29);
    fVar311 = local_940._0_4_;
    fVar326 = local_940._4_4_;
    auVar57._4_4_ = fVar326 * fVar221;
    auVar57._0_4_ = fVar311 * fVar178;
    fVar331 = local_940._8_4_;
    auVar57._8_4_ = fVar331 * fVar264;
    fVar336 = local_940._12_4_;
    auVar57._12_4_ = fVar336 * fVar268;
    fVar341 = local_940._16_4_;
    auVar57._16_4_ = fVar341 * fVar245;
    fVar346 = local_940._20_4_;
    auVar57._20_4_ = fVar346 * fVar266;
    fVar351 = local_940._24_4_;
    auVar57._24_4_ = fVar351 * fVar282;
    auVar57._28_4_ = auVar147._28_4_;
    auVar58._4_4_ = fVar412 * fVar246;
    auVar58._0_4_ = fVar401 * fVar220;
    auVar58._8_4_ = fVar414 * fVar223;
    auVar58._12_4_ = fVar416 * fVar270;
    auVar58._16_4_ = fVar418 * fVar262;
    auVar58._20_4_ = fVar420 * fVar267;
    uVar117 = local_960._28_4_;
    auVar58._24_4_ = fVar422 * fVar286;
    auVar58._28_4_ = uVar117;
    auVar147 = vsubps_avx(auVar58,auVar57);
    auVar59._4_4_ = fVar246 * fVar364;
    auVar59._0_4_ = fVar220 * fVar352;
    auVar59._8_4_ = fVar223 * fVar365;
    auVar59._12_4_ = fVar270 * fVar399;
    auVar59._16_4_ = fVar262 * fVar291;
    auVar59._20_4_ = fVar267 * fVar294;
    auVar59._24_4_ = fVar286 * fVar297;
    auVar59._28_4_ = uVar117;
    auVar60._4_4_ = fVar326 * fVar179;
    auVar60._0_4_ = fVar311 * fVar177;
    auVar60._8_4_ = fVar331 * fVar222;
    auVar60._12_4_ = fVar336 * fVar225;
    auVar60._16_4_ = fVar341 * fVar284;
    auVar60._20_4_ = fVar346 * fVar265;
    auVar60._24_4_ = fVar351 * fVar272;
    auVar60._28_4_ = fVar354;
    auVar374 = vsubps_avx(auVar60,auVar59);
    auVar61._4_4_ =
         fVar296 * (auVar29._4_4_ * auVar29._4_4_ +
                   auVar373._4_4_ * auVar373._4_4_ + auVar31._4_4_ * auVar31._4_4_);
    auVar61._0_4_ =
         fVar293 * (auVar29._0_4_ * auVar29._0_4_ +
                   auVar373._0_4_ * auVar373._0_4_ + auVar31._0_4_ * auVar31._0_4_);
    auVar61._8_4_ =
         fVar304 * (auVar29._8_4_ * auVar29._8_4_ +
                   auVar373._8_4_ * auVar373._8_4_ + auVar31._8_4_ * auVar31._8_4_);
    auVar61._12_4_ =
         fVar305 * (auVar29._12_4_ * auVar29._12_4_ +
                   auVar373._12_4_ * auVar373._12_4_ + auVar31._12_4_ * auVar31._12_4_);
    auVar61._16_4_ =
         fVar306 * (auVar29._16_4_ * auVar29._16_4_ +
                   auVar373._16_4_ * auVar373._16_4_ + auVar31._16_4_ * auVar31._16_4_);
    auVar61._20_4_ =
         fVar307 * (auVar29._20_4_ * auVar29._20_4_ +
                   auVar373._20_4_ * auVar373._20_4_ + auVar31._20_4_ * auVar31._20_4_);
    auVar61._24_4_ =
         fVar322 * (auVar29._24_4_ * auVar29._24_4_ +
                   auVar373._24_4_ * auVar373._24_4_ + auVar31._24_4_ * auVar31._24_4_);
    auVar61._28_4_ = auVar29._28_4_ + fVar200 + auVar31._28_4_;
    auVar62._4_4_ =
         (auVar40._4_4_ * auVar40._4_4_ +
         auVar147._4_4_ * auVar147._4_4_ + auVar374._4_4_ * auVar374._4_4_) * fVar296;
    auVar62._0_4_ =
         (auVar40._0_4_ * auVar40._0_4_ +
         auVar147._0_4_ * auVar147._0_4_ + auVar374._0_4_ * auVar374._0_4_) * fVar293;
    auVar62._8_4_ =
         (auVar40._8_4_ * auVar40._8_4_ +
         auVar147._8_4_ * auVar147._8_4_ + auVar374._8_4_ * auVar374._8_4_) * fVar304;
    auVar62._12_4_ =
         (auVar40._12_4_ * auVar40._12_4_ +
         auVar147._12_4_ * auVar147._12_4_ + auVar374._12_4_ * auVar374._12_4_) * fVar305;
    auVar62._16_4_ =
         (auVar40._16_4_ * auVar40._16_4_ +
         auVar147._16_4_ * auVar147._16_4_ + auVar374._16_4_ * auVar374._16_4_) * fVar306;
    auVar62._20_4_ =
         (auVar40._20_4_ * auVar40._20_4_ +
         auVar147._20_4_ * auVar147._20_4_ + auVar374._20_4_ * auVar374._20_4_) * fVar307;
    auVar62._24_4_ =
         (auVar40._24_4_ * auVar40._24_4_ +
         auVar147._24_4_ * auVar147._24_4_ + auVar374._24_4_ * auVar374._24_4_) * fVar322;
    auVar62._28_4_ = auVar129._28_4_ + auVar32._28_4_;
    auVar129 = vmaxps_avx(auVar61,auVar62);
    auVar147 = vperm2f128_avx(_local_bc0,_local_bc0,1);
    auVar147 = vshufps_avx(auVar147,_local_bc0,0x30);
    auVar31 = vshufps_avx(_local_bc0,auVar147,0x29);
    auVar136._0_4_ = (float)local_bc0._0_4_ + fVar273;
    auVar136._4_4_ = (float)local_bc0._4_4_ + fVar283;
    auVar136._8_4_ = fStack_bb8 + fVar269;
    auVar136._12_4_ = fStack_bb4 + fVar290;
    auVar136._16_4_ = fStack_bb0 + fVar180;
    auVar136._20_4_ = fStack_bac + fVar224;
    auVar136._24_4_ = fStack_ba8 + fVar263;
    auVar136._28_4_ = fStack_ba4 + fVar288;
    auVar147 = vmaxps_avx(_local_bc0,auVar136);
    auVar29 = vmaxps_avx(auVar28,auVar31);
    auVar147 = vmaxps_avx(auVar147,auVar29);
    auVar29 = vrsqrtps_avx(auVar192);
    fVar200 = auVar29._0_4_;
    fVar180 = auVar29._4_4_;
    fVar273 = auVar29._8_4_;
    fVar224 = auVar29._12_4_;
    fVar283 = auVar29._16_4_;
    fVar263 = auVar29._20_4_;
    fVar269 = auVar29._24_4_;
    auVar63._4_4_ = fVar180 * fVar180 * fVar180 * auVar192._4_4_ * 0.5;
    auVar63._0_4_ = fVar200 * fVar200 * fVar200 * auVar192._0_4_ * 0.5;
    auVar63._8_4_ = fVar273 * fVar273 * fVar273 * auVar192._8_4_ * 0.5;
    auVar63._12_4_ = fVar224 * fVar224 * fVar224 * auVar192._12_4_ * 0.5;
    auVar63._16_4_ = fVar283 * fVar283 * fVar283 * auVar192._16_4_ * 0.5;
    auVar63._20_4_ = fVar263 * fVar263 * fVar263 * auVar192._20_4_ * 0.5;
    auVar63._24_4_ = fVar269 * fVar269 * fVar269 * auVar192._24_4_ * 0.5;
    auVar63._28_4_ = auVar192._28_4_;
    auVar64._4_4_ = fVar180 * 1.5;
    auVar64._0_4_ = fVar200 * 1.5;
    auVar64._8_4_ = fVar273 * 1.5;
    auVar64._12_4_ = fVar224 * 1.5;
    auVar64._16_4_ = fVar283 * 1.5;
    auVar64._20_4_ = fVar263 * 1.5;
    auVar64._24_4_ = fVar269 * 1.5;
    auVar64._28_4_ = auVar29._28_4_;
    local_400 = vsubps_avx(auVar64,auVar63);
    auVar98._4_4_ = fVar324;
    auVar98._0_4_ = fVar309;
    auVar98._8_4_ = fVar329;
    auVar98._12_4_ = fVar334;
    auVar98._16_4_ = fVar339;
    auVar98._20_4_ = fVar344;
    auVar98._24_4_ = fVar349;
    auVar98._28_4_ = fVar354;
    local_980 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
    auVar373 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
    auVar376 = ZEXT3264(auVar373);
    fVar366 = auVar373._0_4_;
    fVar377 = auVar373._4_4_;
    fVar378 = auVar373._8_4_;
    fVar379 = auVar373._12_4_;
    fVar380 = auVar373._16_4_;
    fVar381 = auVar373._20_4_;
    fVar382 = auVar373._24_4_;
    fVar429 = local_980._0_4_;
    fVar434 = local_980._4_4_;
    fVar435 = local_980._8_4_;
    fVar436 = local_980._12_4_;
    fVar437 = local_980._16_4_;
    fVar438 = local_980._20_4_;
    fVar439 = local_980._24_4_;
    auVar100._4_4_ = fVar323;
    auVar100._0_4_ = fVar308;
    auVar100._8_4_ = fVar328;
    auVar100._12_4_ = fVar333;
    auVar100._16_4_ = fVar338;
    auVar100._20_4_ = fVar343;
    auVar100._24_4_ = fVar348;
    auVar100._28_4_ = fVar353;
    auVar319 = ZEXT832(0) << 0x20;
    auVar373 = vsubps_avx(auVar319,auVar100);
    fVar180 = auVar373._0_4_;
    fVar273 = auVar373._4_4_;
    fVar224 = auVar373._8_4_;
    fVar283 = auVar373._12_4_;
    fVar263 = auVar373._16_4_;
    fVar269 = auVar373._20_4_;
    fVar288 = auVar373._24_4_;
    auVar360._0_4_ =
         (float)local_9e0._0_4_ * fVar180 +
         fVar429 * (float)local_8e0._0_4_ + fVar366 * (float)local_900._0_4_;
    auVar360._4_4_ =
         (float)local_9e0._4_4_ * fVar273 +
         fVar434 * (float)local_8e0._4_4_ + fVar377 * (float)local_900._4_4_;
    auVar360._8_4_ = fStack_9d8 * fVar224 + fVar435 * fStack_8d8 + fVar378 * fStack_8f8;
    auVar360._12_4_ = fStack_9d4 * fVar283 + fVar436 * fStack_8d4 + fVar379 * fStack_8f4;
    auVar360._16_4_ = fStack_9d0 * fVar263 + fVar437 * fStack_8d0 + fVar380 * fStack_8f0;
    auVar360._20_4_ = fStack_9cc * fVar269 + fVar438 * fStack_8cc + fVar381 * fStack_8ec;
    auVar360._24_4_ = fStack_9c8 * fVar288 + fVar439 * fStack_8c8 + fVar382 * fStack_8e8;
    auVar360._28_4_ = auVar374._28_4_ + auVar29._28_4_ + auVar192._28_4_;
    auVar408._0_4_ = fVar180 * fVar180 + fVar429 * fVar429 + fVar366 * fVar366;
    auVar408._4_4_ = fVar273 * fVar273 + fVar434 * fVar434 + fVar377 * fVar377;
    auVar408._8_4_ = fVar224 * fVar224 + fVar435 * fVar435 + fVar378 * fVar378;
    auVar408._12_4_ = fVar283 * fVar283 + fVar436 * fVar436 + fVar379 * fVar379;
    auVar408._16_4_ = fVar263 * fVar263 + fVar437 * fVar437 + fVar380 * fVar380;
    auVar408._20_4_ = fVar269 * fVar269 + fVar438 * fVar438 + fVar381 * fVar381;
    auVar408._24_4_ = fVar288 * fVar288 + fVar439 * fVar439 + fVar382 * fVar382;
    auVar408._28_4_ = fVar354 + fVar354 + auVar374._28_4_;
    fVar307 = local_400._0_4_;
    fVar322 = local_400._4_4_;
    fVar327 = local_400._8_4_;
    fVar332 = local_400._12_4_;
    fVar337 = local_400._16_4_;
    fVar342 = local_400._20_4_;
    fVar347 = local_400._24_4_;
    local_6e0 = (float)local_9e0._0_4_ * fVar220 * fVar307 +
                fVar307 * fVar177 * (float)local_8e0._0_4_ +
                fVar307 * fVar178 * (float)local_900._0_4_;
    fStack_6dc = (float)local_9e0._4_4_ * fVar246 * fVar322 +
                 fVar322 * fVar179 * (float)local_8e0._4_4_ +
                 fVar322 * fVar221 * (float)local_900._4_4_;
    fStack_6d8 = fStack_9d8 * fVar223 * fVar327 +
                 fVar327 * fVar222 * fStack_8d8 + fVar327 * fVar264 * fStack_8f8;
    fStack_6d4 = fStack_9d4 * fVar270 * fVar332 +
                 fVar332 * fVar225 * fStack_8d4 + fVar332 * fVar268 * fStack_8f4;
    fStack_6d0 = fStack_9d0 * fVar262 * fVar337 +
                 fVar337 * fVar284 * fStack_8d0 + fVar337 * fVar245 * fStack_8f0;
    fStack_6cc = fStack_9cc * fVar267 * fVar342 +
                 fVar342 * fVar265 * fStack_8cc + fVar342 * fVar266 * fStack_8ec;
    fStack_6c8 = fStack_9c8 * fVar286 * fVar347 +
                 fVar347 * fVar272 * fStack_8c8 + fVar347 * fVar282 * fStack_8e8;
    fVar200 = fStack_9c4 + fStack_8c4 + fStack_8e4;
    local_b20._0_4_ =
         fVar180 * fVar220 * fVar307 + fVar429 * fVar307 * fVar177 + fVar366 * fVar307 * fVar178;
    local_b20._4_4_ =
         fVar273 * fVar246 * fVar322 + fVar434 * fVar322 * fVar179 + fVar377 * fVar322 * fVar221;
    local_b20._8_4_ =
         fVar224 * fVar223 * fVar327 + fVar435 * fVar327 * fVar222 + fVar378 * fVar327 * fVar264;
    local_b20._12_4_ =
         fVar283 * fVar270 * fVar332 + fVar436 * fVar332 * fVar225 + fVar379 * fVar332 * fVar268;
    local_b20._16_4_ =
         fVar263 * fVar262 * fVar337 + fVar437 * fVar337 * fVar284 + fVar380 * fVar337 * fVar245;
    local_b20._20_4_ =
         fVar269 * fVar267 * fVar342 + fVar438 * fVar342 * fVar265 + fVar381 * fVar342 * fVar266;
    local_b20._24_4_ =
         fVar288 * fVar286 * fVar347 + fVar439 * fVar347 * fVar272 + fVar382 * fVar347 * fVar282;
    local_b20._28_4_ = fStack_8c4 + fVar200;
    auVar65._4_4_ = fStack_6dc * local_b20._4_4_;
    auVar65._0_4_ = local_6e0 * (float)local_b20._0_4_;
    auVar65._8_4_ = fStack_6d8 * local_b20._8_4_;
    auVar65._12_4_ = fStack_6d4 * local_b20._12_4_;
    auVar65._16_4_ = fStack_6d0 * local_b20._16_4_;
    auVar65._20_4_ = fStack_6cc * local_b20._20_4_;
    auVar65._24_4_ = fStack_6c8 * local_b20._24_4_;
    auVar65._28_4_ = fVar200;
    auVar29 = vsubps_avx(auVar360,auVar65);
    auVar66._4_4_ = local_b20._4_4_ * local_b20._4_4_;
    auVar66._0_4_ = (float)local_b20._0_4_ * (float)local_b20._0_4_;
    auVar66._8_4_ = local_b20._8_4_ * local_b20._8_4_;
    auVar66._12_4_ = local_b20._12_4_ * local_b20._12_4_;
    auVar66._16_4_ = local_b20._16_4_ * local_b20._16_4_;
    auVar66._20_4_ = local_b20._20_4_ * local_b20._20_4_;
    auVar66._24_4_ = local_b20._24_4_ * local_b20._24_4_;
    auVar66._28_4_ = fStack_8c4;
    auVar32 = vsubps_avx(auVar408,auVar66);
    local_2e0 = vsqrtps_avx(auVar129);
    fVar200 = (local_2e0._0_4_ + auVar147._0_4_) * 1.0000002;
    fVar290 = (local_2e0._4_4_ + auVar147._4_4_) * 1.0000002;
    fVar293 = (local_2e0._8_4_ + auVar147._8_4_) * 1.0000002;
    fVar296 = (local_2e0._12_4_ + auVar147._12_4_) * 1.0000002;
    fVar304 = (local_2e0._16_4_ + auVar147._16_4_) * 1.0000002;
    fVar305 = (local_2e0._20_4_ + auVar147._20_4_) * 1.0000002;
    fVar306 = (local_2e0._24_4_ + auVar147._24_4_) * 1.0000002;
    auVar67._4_4_ = fVar290 * fVar290;
    auVar67._0_4_ = fVar200 * fVar200;
    auVar67._8_4_ = fVar293 * fVar293;
    auVar67._12_4_ = fVar296 * fVar296;
    auVar67._16_4_ = fVar304 * fVar304;
    auVar67._20_4_ = fVar305 * fVar305;
    auVar67._24_4_ = fVar306 * fVar306;
    auVar67._28_4_ = local_2e0._28_4_ + auVar147._28_4_;
    local_320._0_4_ = auVar29._0_4_ + auVar29._0_4_;
    local_320._4_4_ = auVar29._4_4_ + auVar29._4_4_;
    local_320._8_4_ = auVar29._8_4_ + auVar29._8_4_;
    local_320._12_4_ = auVar29._12_4_ + auVar29._12_4_;
    local_320._16_4_ = auVar29._16_4_ + auVar29._16_4_;
    local_320._20_4_ = auVar29._20_4_ + auVar29._20_4_;
    local_320._24_4_ = auVar29._24_4_ + auVar29._24_4_;
    fVar200 = auVar29._28_4_;
    local_320._28_4_ = fVar200 + fVar200;
    auVar147 = vsubps_avx(auVar32,auVar67);
    auVar68._4_4_ = fStack_6dc * fStack_6dc;
    auVar68._0_4_ = local_6e0 * local_6e0;
    auVar68._8_4_ = fStack_6d8 * fStack_6d8;
    auVar68._12_4_ = fStack_6d4 * fStack_6d4;
    auVar68._16_4_ = fStack_6d0 * fStack_6d0;
    auVar68._20_4_ = fStack_6cc * fStack_6cc;
    auVar68._24_4_ = fStack_6c8 * fStack_6c8;
    auVar68._28_4_ = fVar200;
    auVar392 = ZEXT3264(local_2a0);
    auVar29 = vsubps_avx(local_2a0,auVar68);
    auVar69._4_4_ = local_320._4_4_ * local_320._4_4_;
    auVar69._0_4_ = local_320._0_4_ * local_320._0_4_;
    auVar69._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar69._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar69._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar69._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar69._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar69._28_4_ = auVar32._28_4_;
    fVar200 = auVar29._0_4_;
    local_2c0 = fVar200 * 4.0;
    fVar290 = auVar29._4_4_;
    fStack_2bc = fVar290 * 4.0;
    fVar293 = auVar29._8_4_;
    fStack_2b8 = fVar293 * 4.0;
    fVar296 = auVar29._12_4_;
    fStack_2b4 = fVar296 * 4.0;
    fVar304 = auVar29._16_4_;
    fStack_2b0 = fVar304 * 4.0;
    fVar305 = auVar29._20_4_;
    fStack_2ac = fVar305 * 4.0;
    fVar306 = auVar29._24_4_;
    fStack_2a8 = fVar306 * 4.0;
    uStack_2a4 = 0x40800000;
    auVar70._4_4_ = auVar147._4_4_ * fStack_2bc;
    auVar70._0_4_ = auVar147._0_4_ * local_2c0;
    auVar70._8_4_ = auVar147._8_4_ * fStack_2b8;
    auVar70._12_4_ = auVar147._12_4_ * fStack_2b4;
    auVar70._16_4_ = auVar147._16_4_ * fStack_2b0;
    auVar70._20_4_ = auVar147._20_4_ * fStack_2ac;
    auVar70._24_4_ = auVar147._24_4_ * fStack_2a8;
    auVar70._28_4_ = 0x40800000;
    auVar40 = vsubps_avx(auVar69,auVar70);
    local_d20 = vcmpps_avx(auVar40,auVar319,5);
    auVar166._8_4_ = 0x7fffffff;
    auVar166._0_8_ = 0x7fffffff7fffffff;
    auVar166._12_4_ = 0x7fffffff;
    auVar166._16_4_ = 0x7fffffff;
    auVar166._20_4_ = 0x7fffffff;
    auVar166._24_4_ = 0x7fffffff;
    auVar166._28_4_ = 0x7fffffff;
    auVar129 = vandps_avx(auVar68,auVar166);
    local_360._0_4_ = fVar200 + fVar200;
    local_360._4_4_ = fVar290 + fVar290;
    local_360._8_4_ = fVar293 + fVar293;
    local_360._12_4_ = fVar296 + fVar296;
    local_360._16_4_ = fVar304 + fVar304;
    local_360._20_4_ = fVar305 + fVar305;
    local_360._24_4_ = fVar306 + fVar306;
    local_360._28_4_ = auVar29._28_4_ + auVar29._28_4_;
    local_420 = vandps_avx(auVar29,auVar166);
    uVar110 = CONCAT44(local_320._4_4_,local_320._0_4_);
    local_340._0_8_ = uVar110 ^ 0x8000000080000000;
    local_340._8_4_ = -local_320._8_4_;
    local_340._12_4_ = -local_320._12_4_;
    local_340._16_4_ = -local_320._16_4_;
    local_340._20_4_ = -local_320._20_4_;
    local_340._24_4_ = -local_320._24_4_;
    local_340._28_4_ = -local_320._28_4_;
    if ((((((((local_d20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_d20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_d20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_d20 >> 0x7f,0) == '\0') &&
          (local_d20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_d20 >> 0xbf,0) == '\0') &&
        (local_d20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_d20[0x1f]) {
      auVar216._8_4_ = 0x7f800000;
      auVar216._0_8_ = 0x7f8000007f800000;
      auVar216._12_4_ = 0x7f800000;
      auVar216._16_4_ = 0x7f800000;
      auVar216._20_4_ = 0x7f800000;
      auVar216._24_4_ = 0x7f800000;
      auVar216._28_4_ = 0x7f800000;
      auVar137._8_4_ = 0xff800000;
      auVar137._0_8_ = 0xff800000ff800000;
      auVar137._12_4_ = 0xff800000;
      auVar137._16_4_ = 0xff800000;
      auVar137._20_4_ = 0xff800000;
      auVar137._24_4_ = 0xff800000;
      auVar137._28_4_ = 0xff800000;
    }
    else {
      auVar130 = vsqrtps_avx(auVar40);
      auVar374 = vrcpps_avx(local_360);
      auVar29 = vcmpps_avx(auVar40,auVar319,5);
      fVar200 = auVar374._0_4_;
      fVar290 = auVar374._4_4_;
      auVar71._4_4_ = local_360._4_4_ * fVar290;
      auVar71._0_4_ = local_360._0_4_ * fVar200;
      fVar293 = auVar374._8_4_;
      auVar71._8_4_ = local_360._8_4_ * fVar293;
      fVar296 = auVar374._12_4_;
      auVar71._12_4_ = local_360._12_4_ * fVar296;
      fVar304 = auVar374._16_4_;
      auVar71._16_4_ = local_360._16_4_ * fVar304;
      fVar305 = auVar374._20_4_;
      auVar71._20_4_ = local_360._20_4_ * fVar305;
      fVar306 = auVar374._24_4_;
      auVar71._24_4_ = local_360._24_4_ * fVar306;
      auVar71._28_4_ = auVar40._28_4_;
      auVar167._8_4_ = 0x3f800000;
      auVar167._0_8_ = 0x3f8000003f800000;
      auVar167._12_4_ = 0x3f800000;
      auVar167._16_4_ = 0x3f800000;
      auVar167._20_4_ = 0x3f800000;
      auVar167._24_4_ = 0x3f800000;
      auVar167._28_4_ = 0x3f800000;
      auVar40 = vsubps_avx(auVar167,auVar71);
      fVar200 = fVar200 + fVar200 * auVar40._0_4_;
      fVar290 = fVar290 + fVar290 * auVar40._4_4_;
      fVar293 = fVar293 + fVar293 * auVar40._8_4_;
      fVar296 = fVar296 + fVar296 * auVar40._12_4_;
      fVar304 = fVar304 + fVar304 * auVar40._16_4_;
      fVar305 = fVar305 + fVar305 * auVar40._20_4_;
      fVar306 = fVar306 + fVar306 * auVar40._24_4_;
      auVar319 = vsubps_avx(local_340,auVar130);
      fVar271 = auVar319._0_4_ * fVar200;
      fVar285 = auVar319._4_4_ * fVar290;
      auVar72._4_4_ = fVar285;
      auVar72._0_4_ = fVar271;
      fVar287 = auVar319._8_4_ * fVar293;
      auVar72._8_4_ = fVar287;
      fVar289 = auVar319._12_4_ * fVar296;
      auVar72._12_4_ = fVar289;
      fVar292 = auVar319._16_4_ * fVar304;
      auVar72._16_4_ = fVar292;
      fVar295 = auVar319._20_4_ * fVar305;
      auVar72._20_4_ = fVar295;
      fVar298 = auVar319._24_4_ * fVar306;
      auVar72._24_4_ = fVar298;
      auVar72._28_4_ = auVar319._28_4_;
      auVar319 = vsubps_avx(auVar130,local_320);
      fVar200 = auVar319._0_4_ * fVar200;
      fVar290 = auVar319._4_4_ * fVar290;
      auVar73._4_4_ = fVar290;
      auVar73._0_4_ = fVar200;
      fVar293 = auVar319._8_4_ * fVar293;
      auVar73._8_4_ = fVar293;
      fVar296 = auVar319._12_4_ * fVar296;
      auVar73._12_4_ = fVar296;
      fVar304 = auVar319._16_4_ * fVar304;
      auVar73._16_4_ = fVar304;
      fVar305 = auVar319._20_4_ * fVar305;
      auVar73._20_4_ = fVar305;
      fVar306 = auVar319._24_4_ * fVar306;
      auVar73._24_4_ = fVar306;
      auVar73._28_4_ = auVar374._28_4_ + auVar40._28_4_;
      local_3c0 = fVar307 * ((float)local_b20._0_4_ + local_6e0 * fVar271);
      fStack_3bc = fVar322 * (local_b20._4_4_ + fStack_6dc * fVar285);
      fStack_3b8 = fVar327 * (local_b20._8_4_ + fStack_6d8 * fVar287);
      fStack_3b4 = fVar332 * (local_b20._12_4_ + fStack_6d4 * fVar289);
      fStack_3b0 = fVar337 * (local_b20._16_4_ + fStack_6d0 * fVar292);
      fStack_3ac = fVar342 * (local_b20._20_4_ + fStack_6cc * fVar295);
      fStack_3a8 = fVar347 * (local_b20._24_4_ + fStack_6c8 * fVar298);
      uStack_3a4 = 0x3f800000;
      local_3e0 = fVar307 * ((float)local_b20._0_4_ + local_6e0 * fVar200);
      fStack_3dc = fVar322 * (local_b20._4_4_ + fStack_6dc * fVar290);
      fStack_3d8 = fVar327 * (local_b20._8_4_ + fStack_6d8 * fVar293);
      fStack_3d4 = fVar332 * (local_b20._12_4_ + fStack_6d4 * fVar296);
      fStack_3d0 = fVar337 * (local_b20._16_4_ + fStack_6d0 * fVar304);
      fStack_3cc = fVar342 * (local_b20._20_4_ + fStack_6cc * fVar305);
      fStack_3c8 = fVar347 * (local_b20._24_4_ + fStack_6c8 * fVar306);
      uStack_3c4 = 0x3f800000;
      auVar253._8_4_ = 0x7f800000;
      auVar253._0_8_ = 0x7f8000007f800000;
      auVar253._12_4_ = 0x7f800000;
      auVar253._16_4_ = 0x7f800000;
      auVar253._20_4_ = 0x7f800000;
      auVar253._24_4_ = 0x7f800000;
      auVar253._28_4_ = 0x7f800000;
      auVar216 = vblendvps_avx(auVar253,auVar72,auVar29);
      auVar254._8_4_ = 0xff800000;
      auVar254._0_8_ = 0xff800000ff800000;
      auVar254._12_4_ = 0xff800000;
      auVar254._16_4_ = 0xff800000;
      auVar254._20_4_ = 0xff800000;
      auVar254._24_4_ = 0xff800000;
      auVar254._28_4_ = 0xff800000;
      auVar137 = vblendvps_avx(auVar254,auVar73,auVar29);
      auVar40 = vmaxps_avx(local_680,auVar129);
      auVar74._4_4_ = auVar40._4_4_ * 1.9073486e-06;
      auVar74._0_4_ = auVar40._0_4_ * 1.9073486e-06;
      auVar74._8_4_ = auVar40._8_4_ * 1.9073486e-06;
      auVar74._12_4_ = auVar40._12_4_ * 1.9073486e-06;
      auVar74._16_4_ = auVar40._16_4_ * 1.9073486e-06;
      auVar74._20_4_ = auVar40._20_4_ * 1.9073486e-06;
      auVar74._24_4_ = auVar40._24_4_ * 1.9073486e-06;
      auVar74._28_4_ = auVar40._28_4_;
      auVar40 = vcmpps_avx(local_420,auVar74,1);
      auVar374 = auVar29 & auVar40;
      if ((((((((auVar374 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar374 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar374 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar374 >> 0x7f,0) != '\0') ||
            (auVar374 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar374 >> 0xbf,0) != '\0') ||
          (auVar374 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar374[0x1f] < '\0') {
        auVar40 = vandps_avx(auVar40,auVar29);
        auVar206 = vpackssdw_avx(auVar40._0_16_,auVar40._16_16_);
        auVar374 = vcmpps_avx(auVar147,_DAT_01f7b000,2);
        auVar409._8_4_ = 0xff800000;
        auVar409._0_8_ = 0xff800000ff800000;
        auVar409._12_4_ = 0xff800000;
        auVar409._16_4_ = 0xff800000;
        auVar409._20_4_ = 0xff800000;
        auVar409._24_4_ = 0xff800000;
        auVar409._28_4_ = 0xff800000;
        auVar391._8_4_ = 0x7f800000;
        auVar391._0_8_ = 0x7f8000007f800000;
        auVar391._12_4_ = 0x7f800000;
        auVar391._16_4_ = 0x7f800000;
        auVar391._20_4_ = 0x7f800000;
        auVar391._24_4_ = 0x7f800000;
        auVar391._28_4_ = 0x7f800000;
        auVar392 = ZEXT3264(auVar391);
        auVar147 = vblendvps_avx(auVar391,auVar409,auVar374);
        auVar36 = vpmovsxwd_avx(auVar206);
        auVar206 = vpunpckhwd_avx(auVar206,auVar206);
        auVar260._16_16_ = auVar206;
        auVar260._0_16_ = auVar36;
        auVar216 = vblendvps_avx(auVar216,auVar147,auVar260);
        auVar147 = vblendvps_avx(auVar409,auVar391,auVar374);
        auVar137 = vblendvps_avx(auVar137,auVar147,auVar260);
        auVar218._0_8_ = auVar40._0_8_ ^ 0xffffffffffffffff;
        auVar218._8_4_ = auVar40._8_4_ ^ 0xffffffff;
        auVar218._12_4_ = auVar40._12_4_ ^ 0xffffffff;
        auVar218._16_4_ = auVar40._16_4_ ^ 0xffffffff;
        auVar218._20_4_ = auVar40._20_4_ ^ 0xffffffff;
        auVar218._24_4_ = auVar40._24_4_ ^ 0xffffffff;
        auVar218._28_4_ = auVar40._28_4_ ^ 0xffffffff;
        auVar147 = vorps_avx(auVar374,auVar218);
        local_d20 = vandps_avx(auVar29,auVar147);
      }
    }
    auVar410 = ZEXT3264(auVar129);
    auVar363 = ZEXT3264(_local_ac0);
    auVar303 = ZEXT3264(_local_9e0);
    auVar261 = ZEXT3264(local_620);
    auVar147 = local_620 & local_d20;
    auVar281 = ZEXT3264(_local_900);
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0x7f,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0xbf,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
    {
      auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
    }
    else {
      fStack_6c4 = fStack_9c4 + fStack_8c4 + fStack_8e4;
      auVar244 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar206 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_a00._0_4_));
      auVar206 = vshufps_avx(auVar206,auVar206,0);
      auVar255._16_16_ = auVar206;
      auVar255._0_16_ = auVar206;
      auVar40 = vminps_avx(auVar255,auVar137);
      auVar410 = ZEXT3264(_local_900);
      fVar271 = fStack_8e4 + auVar206._12_4_;
      auVar168._0_4_ =
           (float)local_9e0._0_4_ * fVar310 +
           (float)local_8e0._0_4_ * fVar383 + (float)local_900._0_4_ * fVar400;
      auVar168._4_4_ =
           (float)local_9e0._4_4_ * fVar325 +
           (float)local_8e0._4_4_ * fVar393 + (float)local_900._4_4_ * fVar411;
      auVar168._8_4_ = fStack_9d8 * fVar330 + fStack_8d8 * fVar394 + fStack_8f8 * fVar413;
      auVar168._12_4_ = fStack_9d4 * fVar335 + fStack_8d4 * fVar395 + fStack_8f4 * fVar415;
      auVar168._16_4_ = fStack_9d0 * fVar340 + fStack_8d0 * fVar396 + fStack_8f0 * fVar417;
      auVar168._20_4_ = fStack_9cc * fVar345 + fStack_8cc * fVar397 + fStack_8ec * fVar419;
      auVar168._24_4_ = fStack_9c8 * fVar350 + fStack_8c8 * fVar398 + fStack_8e8 * fVar421;
      auVar168._28_4_ = fStack_1c4 + fStack_204 + fStack_1c4;
      auVar147 = vrcpps_avx(auVar168);
      fVar200 = auVar147._0_4_;
      fVar290 = auVar147._4_4_;
      auVar75._4_4_ = auVar168._4_4_ * fVar290;
      auVar75._0_4_ = auVar168._0_4_ * fVar200;
      fVar293 = auVar147._8_4_;
      auVar75._8_4_ = auVar168._8_4_ * fVar293;
      fVar296 = auVar147._12_4_;
      auVar75._12_4_ = auVar168._12_4_ * fVar296;
      fVar304 = auVar147._16_4_;
      auVar75._16_4_ = auVar168._16_4_ * fVar304;
      fVar305 = auVar147._20_4_;
      auVar75._20_4_ = auVar168._20_4_ * fVar305;
      fVar306 = auVar147._24_4_;
      auVar75._24_4_ = auVar168._24_4_ * fVar306;
      auVar75._28_4_ = fVar271;
      auVar388._8_4_ = 0x3f800000;
      auVar388._0_8_ = 0x3f8000003f800000;
      auVar388._12_4_ = 0x3f800000;
      auVar388._16_4_ = 0x3f800000;
      auVar388._20_4_ = 0x3f800000;
      auVar388._24_4_ = 0x3f800000;
      auVar388._28_4_ = 0x3f800000;
      auVar392 = ZEXT3264(auVar388);
      auVar374 = vsubps_avx(auVar388,auVar75);
      auVar301._8_4_ = 0x7fffffff;
      auVar301._0_8_ = 0x7fffffff7fffffff;
      auVar301._12_4_ = 0x7fffffff;
      auVar301._16_4_ = 0x7fffffff;
      auVar301._20_4_ = 0x7fffffff;
      auVar301._24_4_ = 0x7fffffff;
      auVar301._28_4_ = 0x7fffffff;
      auVar147 = vandps_avx(auVar168,auVar301);
      auVar372._8_4_ = 0x219392ef;
      auVar372._0_8_ = 0x219392ef219392ef;
      auVar372._12_4_ = 0x219392ef;
      auVar372._16_4_ = 0x219392ef;
      auVar372._20_4_ = 0x219392ef;
      auVar372._24_4_ = 0x219392ef;
      auVar372._28_4_ = 0x219392ef;
      auVar29 = vcmpps_avx(auVar147,auVar372,1);
      auVar76._4_4_ =
           (fVar290 + fVar290 * auVar374._4_4_) *
           -(fVar325 * fVar273 + fVar393 * fVar434 + fVar377 * fVar411);
      auVar76._0_4_ =
           (fVar200 + fVar200 * auVar374._0_4_) *
           -(fVar310 * fVar180 + fVar383 * fVar429 + fVar366 * fVar400);
      auVar76._8_4_ =
           (fVar293 + fVar293 * auVar374._8_4_) *
           -(fVar330 * fVar224 + fVar394 * fVar435 + fVar378 * fVar413);
      auVar76._12_4_ =
           (fVar296 + fVar296 * auVar374._12_4_) *
           -(fVar335 * fVar283 + fVar395 * fVar436 + fVar379 * fVar415);
      auVar76._16_4_ =
           (fVar304 + fVar304 * auVar374._16_4_) *
           -(fVar340 * fVar263 + fVar396 * fVar437 + fVar380 * fVar417);
      auVar76._20_4_ =
           (fVar305 + fVar305 * auVar374._20_4_) *
           -(fVar345 * fVar269 + fVar397 * fVar438 + fVar381 * fVar419);
      auVar76._24_4_ =
           (fVar306 + fVar306 * auVar374._24_4_) *
           -(fVar350 * fVar288 + fVar398 * fVar439 + fVar382 * fVar421);
      auVar76._28_4_ = -(auVar373._28_4_ + fVar271);
      auVar373 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar147 = vcmpps_avx(auVar168,auVar373,1);
      auVar147 = vorps_avx(auVar29,auVar147);
      auVar428._8_4_ = 0xff800000;
      auVar428._0_8_ = 0xff800000ff800000;
      auVar428._12_4_ = 0xff800000;
      auVar428._16_4_ = 0xff800000;
      auVar428._20_4_ = 0xff800000;
      auVar428._24_4_ = 0xff800000;
      auVar428._28_4_ = 0xff800000;
      auVar147 = vblendvps_avx(auVar76,auVar428,auVar147);
      auVar373 = vcmpps_avx(auVar168,auVar373,6);
      auVar29 = vorps_avx(auVar29,auVar373);
      auVar432._8_4_ = 0x7f800000;
      auVar432._0_8_ = 0x7f8000007f800000;
      auVar432._12_4_ = 0x7f800000;
      auVar432._16_4_ = 0x7f800000;
      auVar432._20_4_ = 0x7f800000;
      auVar432._24_4_ = 0x7f800000;
      auVar432._28_4_ = 0x7f800000;
      auVar29 = vblendvps_avx(auVar76,auVar432,auVar29);
      auVar373 = vmaxps_avx(local_380,auVar216);
      auVar373 = vmaxps_avx(auVar373,auVar147);
      auVar40 = vminps_avx(auVar40,auVar29);
      auVar374 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar147 = vsubps_avx(auVar374,local_b80);
      auVar29 = vsubps_avx(auVar374,auVar27);
      auVar77._4_4_ = auVar29._4_4_ * -fVar412;
      auVar77._0_4_ = auVar29._0_4_ * -fVar401;
      auVar77._8_4_ = auVar29._8_4_ * -fVar414;
      auVar77._12_4_ = auVar29._12_4_ * -fVar416;
      auVar77._16_4_ = auVar29._16_4_ * -fVar418;
      auVar77._20_4_ = auVar29._20_4_ * -fVar420;
      auVar77._24_4_ = auVar29._24_4_ * -fVar422;
      auVar77._28_4_ = auVar29._28_4_;
      auVar78._4_4_ = fVar364 * auVar147._4_4_;
      auVar78._0_4_ = fVar352 * auVar147._0_4_;
      auVar78._8_4_ = fVar365 * auVar147._8_4_;
      auVar78._12_4_ = fVar399 * auVar147._12_4_;
      auVar78._16_4_ = fVar291 * auVar147._16_4_;
      auVar78._20_4_ = fVar294 * auVar147._20_4_;
      auVar78._24_4_ = fVar297 * auVar147._24_4_;
      auVar78._28_4_ = auVar147._28_4_;
      auVar147 = vsubps_avx(auVar77,auVar78);
      auVar29 = vsubps_avx(auVar374,auVar30);
      auVar79._4_4_ = fVar326 * auVar29._4_4_;
      auVar79._0_4_ = fVar311 * auVar29._0_4_;
      auVar79._8_4_ = fVar331 * auVar29._8_4_;
      auVar79._12_4_ = fVar336 * auVar29._12_4_;
      auVar79._16_4_ = fVar341 * auVar29._16_4_;
      auVar79._20_4_ = fVar346 * auVar29._20_4_;
      uVar9 = auVar29._28_4_;
      auVar79._24_4_ = fVar351 * auVar29._24_4_;
      auVar79._28_4_ = uVar9;
      auVar27 = vsubps_avx(auVar147,auVar79);
      auVar80._4_4_ = (float)local_900._4_4_ * -fVar412;
      auVar80._0_4_ = (float)local_900._0_4_ * -fVar401;
      auVar80._8_4_ = fStack_8f8 * -fVar414;
      auVar80._12_4_ = fStack_8f4 * -fVar416;
      auVar80._16_4_ = fStack_8f0 * -fVar418;
      auVar80._20_4_ = fStack_8ec * -fVar420;
      auVar80._24_4_ = fStack_8e8 * -fVar422;
      auVar80._28_4_ = uVar117 ^ 0x80000000;
      auVar81._4_4_ = (float)local_8e0._4_4_ * fVar364;
      auVar81._0_4_ = (float)local_8e0._0_4_ * fVar352;
      auVar81._8_4_ = fStack_8d8 * fVar365;
      auVar81._12_4_ = fStack_8d4 * fVar399;
      auVar81._16_4_ = fStack_8d0 * fVar291;
      auVar81._20_4_ = fStack_8cc * fVar294;
      auVar81._24_4_ = fStack_8c8 * fVar297;
      auVar81._28_4_ = uVar9;
      auVar303 = ZEXT864(0) << 0x20;
      auVar147 = vsubps_avx(auVar80,auVar81);
      auVar82._4_4_ = fVar326 * (float)local_9e0._4_4_;
      auVar82._0_4_ = fVar311 * (float)local_9e0._0_4_;
      auVar82._8_4_ = fVar331 * fStack_9d8;
      auVar82._12_4_ = fVar336 * fStack_9d4;
      auVar82._16_4_ = fVar341 * fStack_9d0;
      auVar82._20_4_ = fVar346 * fStack_9cc;
      auVar82._24_4_ = fVar351 * fStack_9c8;
      auVar82._28_4_ = uVar9;
      auVar30 = vsubps_avx(auVar147,auVar82);
      auVar147 = vrcpps_avx(auVar30);
      fVar200 = auVar147._0_4_;
      fVar180 = auVar147._4_4_;
      auVar83._4_4_ = auVar30._4_4_ * fVar180;
      auVar83._0_4_ = auVar30._0_4_ * fVar200;
      fVar273 = auVar147._8_4_;
      auVar83._8_4_ = auVar30._8_4_ * fVar273;
      fVar224 = auVar147._12_4_;
      auVar83._12_4_ = auVar30._12_4_ * fVar224;
      fVar283 = auVar147._16_4_;
      auVar83._16_4_ = auVar30._16_4_ * fVar283;
      fVar263 = auVar147._20_4_;
      auVar83._20_4_ = auVar30._20_4_ * fVar263;
      fVar269 = auVar147._24_4_;
      auVar83._24_4_ = auVar30._24_4_ * fVar269;
      auVar83._28_4_ = fStack_9c4;
      auVar374 = vsubps_avx(auVar388,auVar83);
      auVar279._8_4_ = 0x7fffffff;
      auVar279._0_8_ = 0x7fffffff7fffffff;
      auVar279._12_4_ = 0x7fffffff;
      auVar279._16_4_ = 0x7fffffff;
      auVar279._20_4_ = 0x7fffffff;
      auVar279._24_4_ = 0x7fffffff;
      auVar279._28_4_ = 0x7fffffff;
      auVar147 = vandps_avx(auVar30,auVar279);
      auVar375._8_4_ = 0x219392ef;
      auVar375._0_8_ = 0x219392ef219392ef;
      auVar375._12_4_ = 0x219392ef;
      auVar375._16_4_ = 0x219392ef;
      auVar375._20_4_ = 0x219392ef;
      auVar375._24_4_ = 0x219392ef;
      auVar375._28_4_ = 0x219392ef;
      auVar376 = ZEXT3264(auVar375);
      auVar29 = vcmpps_avx(auVar147,auVar375,1);
      auVar281 = ZEXT3264(auVar29);
      auVar84._4_4_ = (fVar180 + fVar180 * auVar374._4_4_) * -auVar27._4_4_;
      auVar84._0_4_ = (fVar200 + fVar200 * auVar374._0_4_) * -auVar27._0_4_;
      auVar84._8_4_ = (fVar273 + fVar273 * auVar374._8_4_) * -auVar27._8_4_;
      auVar84._12_4_ = (fVar224 + fVar224 * auVar374._12_4_) * -auVar27._12_4_;
      auVar84._16_4_ = (fVar283 + fVar283 * auVar374._16_4_) * -auVar27._16_4_;
      auVar84._20_4_ = (fVar263 + fVar263 * auVar374._20_4_) * -auVar27._20_4_;
      auVar84._24_4_ = (fVar269 + fVar269 * auVar374._24_4_) * -auVar27._24_4_;
      auVar84._28_4_ = auVar27._28_4_ ^ 0x80000000;
      auVar147 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,1);
      auVar147 = vorps_avx(auVar29,auVar147);
      auVar147 = vblendvps_avx(auVar84,auVar428,auVar147);
      local_920 = vmaxps_avx(auVar373,auVar147);
      auVar261 = ZEXT3264(local_620);
      auVar147 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,6);
      auVar147 = vorps_avx(auVar29,auVar147);
      auVar29 = vblendvps_avx(auVar84,auVar432,auVar147);
      auVar147 = vandps_avx(local_d20,local_620);
      local_440 = vminps_avx(auVar40,auVar29);
      auVar29 = vcmpps_avx(local_920,local_440,2);
      auVar27 = auVar147 & auVar29;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar244 = ZEXT3264(auVar388);
        auVar363 = ZEXT3264(_local_ac0);
      }
      else {
        auVar27 = vminps_avx(_local_bc0,auVar136);
        auVar28 = vminps_avx(auVar28,auVar31);
        auVar27 = vminps_avx(auVar27,auVar28);
        auVar27 = vsubps_avx(auVar27,local_2e0);
        auVar147 = vandps_avx(auVar29,auVar147);
        auVar108._4_4_ = fStack_3bc;
        auVar108._0_4_ = local_3c0;
        auVar108._8_4_ = fStack_3b8;
        auVar108._12_4_ = fStack_3b4;
        auVar108._16_4_ = fStack_3b0;
        auVar108._20_4_ = fStack_3ac;
        auVar108._24_4_ = fStack_3a8;
        auVar108._28_4_ = uStack_3a4;
        auVar29 = vminps_avx(auVar108,auVar388);
        auVar236 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar29 = vmaxps_avx(auVar29,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar446 + fVar440 * (auVar29._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar447 + fVar442 * (auVar29._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar448 + fVar443 * (auVar29._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar199 + fVar445 * (auVar29._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar446 + fVar440 * (auVar29._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar447 + fVar442 * (auVar29._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar448 + fVar443 * (auVar29._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar199 + auVar29._28_4_ + 7.0;
        auVar107._4_4_ = fStack_3dc;
        auVar107._0_4_ = local_3e0;
        auVar107._8_4_ = fStack_3d8;
        auVar107._12_4_ = fStack_3d4;
        auVar107._16_4_ = fStack_3d0;
        auVar107._20_4_ = fStack_3cc;
        auVar107._24_4_ = fStack_3c8;
        auVar107._28_4_ = uStack_3c4;
        auVar29 = vminps_avx(auVar107,auVar388);
        auVar29 = vmaxps_avx(auVar29,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar446 + fVar440 * (auVar29._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar447 + fVar442 * (auVar29._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar448 + fVar443 * (auVar29._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar199 + fVar445 * (auVar29._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar446 + fVar440 * (auVar29._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar447 + fVar442 * (auVar29._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar448 + fVar443 * (auVar29._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar199 + auVar29._28_4_ + 7.0;
        auVar85._4_4_ = auVar27._4_4_ * 0.99999976;
        auVar85._0_4_ = auVar27._0_4_ * 0.99999976;
        auVar85._8_4_ = auVar27._8_4_ * 0.99999976;
        auVar85._12_4_ = auVar27._12_4_ * 0.99999976;
        auVar85._16_4_ = auVar27._16_4_ * 0.99999976;
        auVar85._20_4_ = auVar27._20_4_ * 0.99999976;
        auVar85._24_4_ = auVar27._24_4_ * 0.99999976;
        auVar85._28_4_ = 0x3f7ffffc;
        auVar29 = vmaxps_avx(ZEXT832(0) << 0x20,auVar85);
        auVar86._4_4_ = auVar29._4_4_ * auVar29._4_4_;
        auVar86._0_4_ = auVar29._0_4_ * auVar29._0_4_;
        auVar86._8_4_ = auVar29._8_4_ * auVar29._8_4_;
        auVar86._12_4_ = auVar29._12_4_ * auVar29._12_4_;
        auVar86._16_4_ = auVar29._16_4_ * auVar29._16_4_;
        auVar86._20_4_ = auVar29._20_4_ * auVar29._20_4_;
        auVar86._24_4_ = auVar29._24_4_ * auVar29._24_4_;
        auVar86._28_4_ = auVar29._28_4_;
        auVar27 = vsubps_avx(auVar32,auVar86);
        auVar87._4_4_ = auVar27._4_4_ * fStack_2bc;
        auVar87._0_4_ = auVar27._0_4_ * local_2c0;
        auVar87._8_4_ = auVar27._8_4_ * fStack_2b8;
        auVar87._12_4_ = auVar27._12_4_ * fStack_2b4;
        auVar87._16_4_ = auVar27._16_4_ * fStack_2b0;
        auVar87._20_4_ = auVar27._20_4_ * fStack_2ac;
        auVar87._24_4_ = auVar27._24_4_ * fStack_2a8;
        auVar87._28_4_ = auVar29._28_4_;
        auVar28 = vsubps_avx(auVar69,auVar87);
        local_a20 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,5);
        auVar29 = local_a20;
        if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a20 >> 0x7f,0) == '\0') &&
              (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a20 >> 0xbf,0) == '\0') &&
            (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a20[0x1f]) {
          auVar281 = ZEXT864(0) << 0x20;
          auVar261 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar424 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar430 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_bc0 = ZEXT832(0) << 0x20;
          auVar320._8_4_ = 0x7f800000;
          auVar320._0_8_ = 0x7f8000007f800000;
          auVar320._12_4_ = 0x7f800000;
          auVar320._16_4_ = 0x7f800000;
          auVar320._20_4_ = 0x7f800000;
          auVar320._24_4_ = 0x7f800000;
          auVar320._28_4_ = 0x7f800000;
          auVar389._8_4_ = 0xff800000;
          auVar389._0_8_ = 0xff800000ff800000;
          auVar389._12_4_ = 0xff800000;
          auVar389._16_4_ = 0xff800000;
          auVar389._20_4_ = 0xff800000;
          auVar389._24_4_ = 0xff800000;
          auVar389._28_4_ = 0xff800000;
          auVar34 = auVar27;
          local_a20 = auVar44;
        }
        else {
          auVar30 = vrcpps_avx(local_360);
          fVar200 = auVar30._0_4_;
          auVar239._0_4_ = local_360._0_4_ * fVar200;
          fVar180 = auVar30._4_4_;
          auVar239._4_4_ = local_360._4_4_ * fVar180;
          fVar273 = auVar30._8_4_;
          auVar239._8_4_ = local_360._8_4_ * fVar273;
          fVar224 = auVar30._12_4_;
          auVar239._12_4_ = local_360._12_4_ * fVar224;
          fVar283 = auVar30._16_4_;
          auVar239._16_4_ = local_360._16_4_ * fVar283;
          fVar263 = auVar30._20_4_;
          auVar239._20_4_ = local_360._20_4_ * fVar263;
          fVar269 = auVar30._24_4_;
          auVar239._24_4_ = local_360._24_4_ * fVar269;
          auVar239._28_4_ = 0;
          auVar373 = vsubps_avx(auVar388,auVar239);
          auVar31 = vsqrtps_avx(auVar28);
          fVar200 = fVar200 + fVar200 * auVar373._0_4_;
          fVar180 = fVar180 + fVar180 * auVar373._4_4_;
          fVar273 = fVar273 + fVar273 * auVar373._8_4_;
          fVar224 = fVar224 + fVar224 * auVar373._12_4_;
          fVar283 = fVar283 + fVar283 * auVar373._16_4_;
          fVar263 = fVar263 + fVar263 * auVar373._20_4_;
          fVar269 = fVar269 + fVar269 * auVar373._24_4_;
          auVar32 = vsubps_avx(local_340,auVar31);
          fVar440 = auVar32._0_4_ * fVar200;
          fVar442 = auVar32._4_4_ * fVar180;
          auVar88._4_4_ = fVar442;
          auVar88._0_4_ = fVar440;
          fVar443 = auVar32._8_4_ * fVar273;
          auVar88._8_4_ = fVar443;
          fVar445 = auVar32._12_4_ * fVar224;
          auVar88._12_4_ = fVar445;
          fVar446 = auVar32._16_4_ * fVar283;
          auVar88._16_4_ = fVar446;
          fVar447 = auVar32._20_4_ * fVar263;
          auVar88._20_4_ = fVar447;
          fVar448 = auVar32._24_4_ * fVar269;
          auVar88._24_4_ = fVar448;
          auVar88._28_4_ = fVar444;
          auVar32 = vsubps_avx(auVar31,local_320);
          fVar200 = auVar32._0_4_ * fVar200;
          fVar180 = auVar32._4_4_ * fVar180;
          auVar89._4_4_ = fVar180;
          auVar89._0_4_ = fVar200;
          fVar273 = auVar32._8_4_ * fVar273;
          auVar89._8_4_ = fVar273;
          fVar224 = auVar32._12_4_ * fVar224;
          auVar89._12_4_ = fVar224;
          fVar283 = auVar32._16_4_ * fVar283;
          auVar89._16_4_ = fVar283;
          fVar263 = auVar32._20_4_ * fVar263;
          auVar89._20_4_ = fVar263;
          fVar269 = auVar32._24_4_ * fVar269;
          auVar89._24_4_ = fVar269;
          auVar89._28_4_ = 0x7f800000;
          fVar288 = fVar307 * (fVar440 * local_6e0 + (float)local_b20._0_4_);
          fVar290 = fVar322 * (fVar442 * fStack_6dc + local_b20._4_4_);
          fVar293 = fVar327 * (fVar443 * fStack_6d8 + local_b20._8_4_);
          fVar296 = fVar332 * (fVar445 * fStack_6d4 + local_b20._12_4_);
          fVar304 = fVar337 * (fVar446 * fStack_6d0 + local_b20._16_4_);
          fVar305 = fVar342 * (fVar447 * fStack_6cc + local_b20._20_4_);
          fVar306 = fVar347 * (fVar448 * fStack_6c8 + local_b20._24_4_);
          auVar138._0_4_ = fVar308 + fVar288 * fVar220;
          auVar138._4_4_ = fVar323 + fVar290 * fVar246;
          auVar138._8_4_ = fVar328 + fVar293 * fVar223;
          auVar138._12_4_ = fVar333 + fVar296 * fVar270;
          auVar138._16_4_ = fVar338 + fVar304 * fVar262;
          auVar138._20_4_ = fVar343 + fVar305 * fVar267;
          auVar138._24_4_ = fVar348 + fVar306 * fVar286;
          auVar138._28_4_ = fVar353 + auVar30._28_4_ + auVar373._28_4_ + local_b20._28_4_;
          auVar90._4_4_ = (float)local_9e0._4_4_ * fVar442;
          auVar90._0_4_ = (float)local_9e0._0_4_ * fVar440;
          auVar90._8_4_ = fStack_9d8 * fVar443;
          auVar90._12_4_ = fStack_9d4 * fVar445;
          auVar90._16_4_ = fStack_9d0 * fVar446;
          auVar90._20_4_ = fStack_9cc * fVar447;
          auVar90._24_4_ = fStack_9c8 * fVar448;
          auVar90._28_4_ = auVar31._28_4_;
          auVar30 = vsubps_avx(auVar90,auVar138);
          auVar34._4_4_ = fVar324;
          auVar34._0_4_ = fVar309;
          auVar34._8_4_ = fVar329;
          auVar34._12_4_ = fVar334;
          auVar34._16_4_ = fVar339;
          auVar34._20_4_ = fVar344;
          auVar34._24_4_ = fVar349;
          auVar34._28_4_ = fVar354;
          auVar256._0_4_ = fVar309 + fVar288 * fVar177;
          auVar256._4_4_ = fVar324 + fVar290 * fVar179;
          auVar256._8_4_ = fVar329 + fVar293 * fVar222;
          auVar256._12_4_ = fVar334 + fVar296 * fVar225;
          auVar256._16_4_ = fVar339 + fVar304 * fVar284;
          auVar256._20_4_ = fVar344 + fVar305 * fVar265;
          auVar256._24_4_ = fVar349 + fVar306 * fVar272;
          auVar256._28_4_ = fVar354 + auVar31._28_4_;
          auVar91._4_4_ = (float)local_8e0._4_4_ * fVar442;
          auVar91._0_4_ = (float)local_8e0._0_4_ * fVar440;
          auVar91._8_4_ = fStack_8d8 * fVar443;
          auVar91._12_4_ = fStack_8d4 * fVar445;
          auVar91._16_4_ = fStack_8d0 * fVar446;
          auVar91._20_4_ = fStack_8cc * fVar447;
          auVar91._24_4_ = fStack_8c8 * fVar448;
          auVar91._28_4_ = 0x3e000000;
          local_b80 = vsubps_avx(auVar91,auVar256);
          auVar240._0_4_ = local_aa0 + fVar178 * fVar288;
          auVar240._4_4_ = fStack_a9c + fVar221 * fVar290;
          auVar240._8_4_ = fStack_a98 + fVar264 * fVar293;
          auVar240._12_4_ = fStack_a94 + fVar268 * fVar296;
          auVar240._16_4_ = fStack_a90 + fVar245 * fVar304;
          auVar240._20_4_ = fStack_a8c + fVar266 * fVar305;
          auVar240._24_4_ = fStack_a88 + fVar282 * fVar306;
          auVar240._28_4_ = fStack_a84 + auVar32._28_4_;
          auVar92._4_4_ = (float)local_900._4_4_ * fVar442;
          auVar92._0_4_ = (float)local_900._0_4_ * fVar440;
          auVar92._8_4_ = fStack_8f8 * fVar443;
          auVar92._12_4_ = fStack_8f4 * fVar445;
          auVar92._16_4_ = fStack_8f0 * fVar446;
          auVar92._20_4_ = fStack_8ec * fVar447;
          auVar92._24_4_ = fStack_8e8 * fVar448;
          auVar92._28_4_ = auVar256._28_4_;
          _local_bc0 = vsubps_avx(auVar92,auVar240);
          fVar307 = fVar307 * (fVar200 * local_6e0 + (float)local_b20._0_4_);
          fVar322 = fVar322 * (fVar180 * fStack_6dc + local_b20._4_4_);
          fVar327 = fVar327 * (fVar273 * fStack_6d8 + local_b20._8_4_);
          fVar332 = fVar332 * (fVar224 * fStack_6d4 + local_b20._12_4_);
          fVar337 = fVar337 * (fVar283 * fStack_6d0 + local_b20._16_4_);
          fVar342 = fVar342 * (fVar263 * fStack_6cc + local_b20._20_4_);
          fVar347 = fVar347 * (fVar269 * fStack_6c8 + local_b20._24_4_);
          auVar241._0_4_ = fVar308 + fVar307 * fVar220;
          auVar241._4_4_ = fVar323 + fVar322 * fVar246;
          auVar241._8_4_ = fVar328 + fVar327 * fVar223;
          auVar241._12_4_ = fVar333 + fVar332 * fVar270;
          auVar241._16_4_ = fVar338 + fVar337 * fVar262;
          auVar241._20_4_ = fVar343 + fVar342 * fVar267;
          auVar241._24_4_ = fVar348 + fVar347 * fVar286;
          auVar241._28_4_ = fVar353 + local_bc0._28_4_ + local_b20._28_4_;
          auVar93._4_4_ = (float)local_9e0._4_4_ * fVar180;
          auVar93._0_4_ = (float)local_9e0._0_4_ * fVar200;
          auVar93._8_4_ = fStack_9d8 * fVar273;
          auVar93._12_4_ = fStack_9d4 * fVar224;
          auVar93._16_4_ = fStack_9d0 * fVar283;
          auVar93._20_4_ = fStack_9cc * fVar263;
          auVar93._24_4_ = fStack_9c8 * fVar269;
          auVar93._28_4_ = 0x3e000000;
          auVar31 = vsubps_avx(auVar93,auVar241);
          auVar236 = auVar31._0_28_;
          auVar280._0_4_ = fVar309 + fVar307 * fVar177;
          auVar280._4_4_ = fVar324 + fVar322 * fVar179;
          auVar280._8_4_ = fVar329 + fVar327 * fVar222;
          auVar280._12_4_ = fVar334 + fVar332 * fVar225;
          auVar280._16_4_ = fVar339 + fVar337 * fVar284;
          auVar280._20_4_ = fVar344 + fVar342 * fVar265;
          auVar280._24_4_ = fVar349 + fVar347 * fVar272;
          auVar280._28_4_ = fVar354 + 0.125;
          auVar94._4_4_ = (float)local_8e0._4_4_ * fVar180;
          auVar94._0_4_ = (float)local_8e0._0_4_ * fVar200;
          auVar94._8_4_ = fStack_8d8 * fVar273;
          auVar94._12_4_ = fStack_8d4 * fVar224;
          auVar94._16_4_ = fStack_8d0 * fVar283;
          auVar94._20_4_ = fStack_8cc * fVar263;
          auVar94._24_4_ = fStack_8c8 * fVar269;
          auVar94._28_4_ = fStack_9c4;
          auVar31 = vsubps_avx(auVar94,auVar280);
          auVar281 = ZEXT3264(auVar31);
          auVar257._0_4_ = local_aa0 + fVar178 * fVar307;
          auVar257._4_4_ = fStack_a9c + fVar221 * fVar322;
          auVar257._8_4_ = fStack_a98 + fVar264 * fVar327;
          auVar257._12_4_ = fStack_a94 + fVar268 * fVar332;
          auVar257._16_4_ = fStack_a90 + fVar245 * fVar337;
          auVar257._20_4_ = fStack_a8c + fVar266 * fVar342;
          auVar257._24_4_ = fStack_a88 + fVar282 * fVar347;
          auVar257._28_4_ = fStack_a84 + auVar256._28_4_;
          auVar95._4_4_ = (float)local_900._4_4_ * fVar180;
          auVar95._0_4_ = (float)local_900._0_4_ * fVar200;
          auVar95._8_4_ = fStack_8f8 * fVar273;
          auVar95._12_4_ = fStack_8f4 * fVar224;
          auVar95._16_4_ = fStack_8f0 * fVar283;
          auVar95._20_4_ = fStack_8ec * fVar263;
          auVar95._24_4_ = fStack_8e8 * fVar269;
          auVar95._28_4_ = fStack_9c4;
          auVar31 = vsubps_avx(auVar95,auVar257);
          auVar261 = ZEXT3264(auVar31);
          auVar28 = vcmpps_avx(auVar28,_DAT_01f7b000,5);
          auVar321._8_4_ = 0x7f800000;
          auVar321._0_8_ = 0x7f8000007f800000;
          auVar321._12_4_ = 0x7f800000;
          auVar321._16_4_ = 0x7f800000;
          auVar321._20_4_ = 0x7f800000;
          auVar321._24_4_ = 0x7f800000;
          auVar321._28_4_ = 0x7f800000;
          auVar320 = vblendvps_avx(auVar321,auVar88,auVar28);
          auVar129 = vmaxps_avx(local_680,auVar129);
          auVar96._4_4_ = auVar129._4_4_ * 1.9073486e-06;
          auVar96._0_4_ = auVar129._0_4_ * 1.9073486e-06;
          auVar96._8_4_ = auVar129._8_4_ * 1.9073486e-06;
          auVar96._12_4_ = auVar129._12_4_ * 1.9073486e-06;
          auVar96._16_4_ = auVar129._16_4_ * 1.9073486e-06;
          auVar96._20_4_ = auVar129._20_4_ * 1.9073486e-06;
          auVar96._24_4_ = auVar129._24_4_ * 1.9073486e-06;
          auVar96._28_4_ = auVar129._28_4_;
          auVar129 = vcmpps_avx(local_420,auVar96,1);
          auVar390._8_4_ = 0xff800000;
          auVar390._0_8_ = 0xff800000ff800000;
          auVar390._12_4_ = 0xff800000;
          auVar390._16_4_ = 0xff800000;
          auVar390._20_4_ = 0xff800000;
          auVar390._24_4_ = 0xff800000;
          auVar390._28_4_ = 0xff800000;
          auVar389 = vblendvps_avx(auVar390,auVar89,auVar28);
          auVar31 = auVar28 & auVar129;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            auVar129 = vandps_avx(auVar129,auVar28);
            auVar206 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
            auVar27 = vcmpps_avx(auVar27,_DAT_01f7b000,2);
            auVar148._8_4_ = 0xff800000;
            auVar148._0_8_ = 0xff800000ff800000;
            auVar148._12_4_ = 0xff800000;
            auVar148._16_4_ = 0xff800000;
            auVar148._20_4_ = 0xff800000;
            auVar148._24_4_ = 0xff800000;
            auVar148._28_4_ = 0xff800000;
            auVar302._8_4_ = 0x7f800000;
            auVar302._0_8_ = 0x7f8000007f800000;
            auVar302._12_4_ = 0x7f800000;
            auVar302._16_4_ = 0x7f800000;
            auVar302._20_4_ = 0x7f800000;
            auVar302._24_4_ = 0x7f800000;
            auVar302._28_4_ = 0x7f800000;
            auVar29 = vblendvps_avx(auVar302,auVar148,auVar27);
            auVar36 = vpmovsxwd_avx(auVar206);
            auVar206 = vpunpckhwd_avx(auVar206,auVar206);
            auVar433._16_16_ = auVar206;
            auVar433._0_16_ = auVar36;
            auVar320 = vblendvps_avx(auVar320,auVar29,auVar433);
            auVar29 = vblendvps_avx(auVar148,auVar302,auVar27);
            auVar389 = vblendvps_avx(auVar389,auVar29,auVar433);
            auVar219._0_8_ = auVar129._0_8_ ^ 0xffffffffffffffff;
            auVar219._8_4_ = auVar129._8_4_ ^ 0xffffffff;
            auVar219._12_4_ = auVar129._12_4_ ^ 0xffffffff;
            auVar219._16_4_ = auVar129._16_4_ ^ 0xffffffff;
            auVar219._20_4_ = auVar129._20_4_ ^ 0xffffffff;
            auVar219._24_4_ = auVar129._24_4_ ^ 0xffffffff;
            auVar219._28_4_ = auVar129._28_4_ ^ 0xffffffff;
            auVar34 = vorps_avx(auVar27,auVar219);
            auVar29 = vandps_avx(auVar28,auVar34);
          }
          auVar424 = auVar30._0_28_;
          auVar430 = local_b80._0_28_;
        }
        auVar376 = ZEXT3264(auVar147);
        auVar410 = ZEXT3264(local_920);
        _local_4a0 = local_920;
        local_480 = vminps_avx(local_440,auVar320);
        _local_9a0 = vmaxps_avx(local_920,auVar389);
        _local_460 = _local_9a0;
        auVar129 = vcmpps_avx(local_920,local_480,2);
        local_840 = vandps_avx(auVar129,auVar147);
        auVar392 = ZEXT3264(local_840);
        auVar129 = vcmpps_avx(_local_9a0,local_440,2);
        local_9c0 = vandps_avx(auVar147,auVar129);
        auVar129 = vorps_avx(local_840,local_9c0);
        auVar303 = ZEXT3264(_local_9e0);
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0x7f,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar129 >> 0xbf,0) == '\0') &&
            (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar129[0x1f]) {
          auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar363 = ZEXT3264(_local_ac0);
        }
        else {
          auVar376 = ZEXT3264(_local_900);
          auVar193._0_8_ = auVar29._0_8_ ^ 0xffffffffffffffff;
          auVar193._8_4_ = auVar29._8_4_ ^ 0xffffffff;
          auVar193._12_4_ = auVar29._12_4_ ^ 0xffffffff;
          auVar193._16_4_ = auVar29._16_4_ ^ 0xffffffff;
          auVar193._20_4_ = auVar29._20_4_ ^ 0xffffffff;
          auVar193._24_4_ = auVar29._24_4_ ^ 0xffffffff;
          auVar193._28_4_ = (uint)auVar29._28_4_ ^ 0xffffffff;
          auVar169._0_4_ =
               (float)local_9e0._0_4_ * auVar236._0_4_ +
               (float)local_8e0._0_4_ * auVar281._0_4_ + (float)local_900._0_4_ * auVar261._0_4_;
          auVar169._4_4_ =
               (float)local_9e0._4_4_ * auVar236._4_4_ +
               (float)local_8e0._4_4_ * auVar281._4_4_ + (float)local_900._4_4_ * auVar261._4_4_;
          auVar169._8_4_ =
               fStack_9d8 * auVar236._8_4_ +
               fStack_8d8 * auVar281._8_4_ + fStack_8f8 * auVar261._8_4_;
          auVar169._12_4_ =
               fStack_9d4 * auVar236._12_4_ +
               fStack_8d4 * auVar281._12_4_ + fStack_8f4 * auVar261._12_4_;
          auVar169._16_4_ =
               fStack_9d0 * auVar236._16_4_ +
               fStack_8d0 * auVar281._16_4_ + fStack_8f0 * auVar261._16_4_;
          auVar169._20_4_ =
               fStack_9cc * auVar236._20_4_ +
               fStack_8cc * auVar281._20_4_ + fStack_8ec * auVar261._20_4_;
          auVar169._24_4_ =
               fStack_9c8 * auVar236._24_4_ +
               fStack_8c8 * auVar281._24_4_ + fStack_8e8 * auVar261._24_4_;
          auVar169._28_4_ = auVar34._28_4_ + local_9c0._28_4_ + auVar129._28_4_;
          auVar242._8_4_ = 0x7fffffff;
          auVar242._0_8_ = 0x7fffffff7fffffff;
          auVar242._12_4_ = 0x7fffffff;
          auVar242._16_4_ = 0x7fffffff;
          auVar242._20_4_ = 0x7fffffff;
          auVar242._24_4_ = 0x7fffffff;
          auVar242._28_4_ = 0x7fffffff;
          auVar129 = vandps_avx(auVar169,auVar242);
          auVar258._8_4_ = 0x3e99999a;
          auVar258._0_8_ = 0x3e99999a3e99999a;
          auVar258._12_4_ = 0x3e99999a;
          auVar258._16_4_ = 0x3e99999a;
          auVar258._20_4_ = 0x3e99999a;
          auVar258._24_4_ = 0x3e99999a;
          auVar258._28_4_ = 0x3e99999a;
          auVar129 = vcmpps_avx(auVar129,auVar258,1);
          local_880 = vorps_avx(auVar129,auVar193);
          auVar139._0_4_ =
               auVar424._0_4_ * (float)local_9e0._0_4_ +
               (float)local_8e0._0_4_ * auVar430._0_4_ +
               (float)local_900._0_4_ * (float)local_bc0._0_4_;
          auVar139._4_4_ =
               auVar424._4_4_ * (float)local_9e0._4_4_ +
               (float)local_8e0._4_4_ * auVar430._4_4_ +
               (float)local_900._4_4_ * (float)local_bc0._4_4_;
          auVar139._8_4_ =
               auVar424._8_4_ * fStack_9d8 + fStack_8d8 * auVar430._8_4_ + fStack_8f8 * fStack_bb8;
          auVar139._12_4_ =
               auVar424._12_4_ * fStack_9d4 + fStack_8d4 * auVar430._12_4_ + fStack_8f4 * fStack_bb4
          ;
          auVar139._16_4_ =
               auVar424._16_4_ * fStack_9d0 + fStack_8d0 * auVar430._16_4_ + fStack_8f0 * fStack_bb0
          ;
          auVar139._20_4_ =
               auVar424._20_4_ * fStack_9cc + fStack_8cc * auVar430._20_4_ + fStack_8ec * fStack_bac
          ;
          auVar139._24_4_ =
               auVar424._24_4_ * fStack_9c8 + fStack_8c8 * auVar430._24_4_ + fStack_8e8 * fStack_ba8
          ;
          auVar139._28_4_ = auVar29._28_4_ + local_880._28_4_ + auVar34._28_4_;
          auVar129 = vandps_avx(auVar139,auVar242);
          auVar129 = vcmpps_avx(auVar129,auVar258,1);
          auVar129 = vorps_avx(auVar129,auVar193);
          auVar170._8_4_ = 3;
          auVar170._0_8_ = 0x300000003;
          auVar170._12_4_ = 3;
          auVar170._16_4_ = 3;
          auVar170._20_4_ = 3;
          auVar170._24_4_ = 3;
          auVar170._28_4_ = 3;
          auVar194._8_4_ = 2;
          auVar194._0_8_ = 0x200000002;
          auVar194._12_4_ = 2;
          auVar194._16_4_ = 2;
          auVar194._20_4_ = 2;
          auVar194._24_4_ = 2;
          auVar194._28_4_ = 2;
          auVar129 = vblendvps_avx(auVar194,auVar170,auVar129);
          local_8a0 = ZEXT432(uVar113);
          local_8c0 = vpshufd_avx(ZEXT416(uVar113),0);
          auVar206 = vpcmpgtd_avx(auVar129._16_16_,local_8c0);
          auStack_8b0 = auVar69._16_16_;
          auVar36 = vpcmpgtd_avx(auVar129._0_16_,local_8c0);
          auVar171._16_16_ = auVar206;
          auVar171._0_16_ = auVar36;
          local_860 = vblendps_avx(ZEXT1632(auVar36),auVar171,0xf0);
          auVar129 = vandnps_avx(local_860,local_840);
          local_a40._4_4_ = local_920._4_4_ + (float)local_ac0._4_4_;
          local_a40._0_4_ = local_920._0_4_ + (float)local_ac0._0_4_;
          fStack_a38 = local_920._8_4_ + fStack_ab8;
          fStack_a34 = local_920._12_4_ + fStack_ab4;
          fStack_a30 = local_920._16_4_ + fStack_ab0;
          fStack_a2c = local_920._20_4_ + fStack_aac;
          fStack_a28 = local_920._24_4_ + fStack_aa8;
          fStack_a24 = local_920._28_4_ + fStack_aa4;
          while( true ) {
            local_4c0 = auVar129;
            if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar129 >> 0x7f,0) == '\0') &&
                  (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar129 >> 0xbf,0) == '\0') &&
                (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar129[0x1f]) break;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar147 = vblendvps_avx(auVar172,local_920,auVar129);
            auVar29 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar29 = vminps_avx(auVar147,auVar29);
            auVar27 = vshufpd_avx(auVar29,auVar29,5);
            auVar29 = vminps_avx(auVar29,auVar27);
            auVar27 = vperm2f128_avx(auVar29,auVar29,1);
            auVar29 = vminps_avx(auVar29,auVar27);
            auVar147 = vcmpps_avx(auVar147,auVar29,0);
            auVar29 = auVar129 & auVar147;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0x7f,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0xbf,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar29[0x1f] < '\0') {
              auVar129 = vandps_avx(auVar147,auVar129);
            }
            uVar109 = vmovmskps_avx(auVar129);
            uVar117 = 0;
            if (uVar109 != 0) {
              for (; (uVar109 >> uVar117 & 1) == 0; uVar117 = uVar117 + 1) {
              }
            }
            uVar110 = (ulong)uVar117;
            *(undefined4 *)(local_4c0 + uVar110 * 4) = 0;
            fVar200 = local_1a0[uVar110];
            uVar117 = *(uint *)(local_4a0 + uVar110 * 4);
            fVar177 = auVar152._0_4_;
            if ((float)local_ae0._0_4_ < 0.0) {
              auVar376 = ZEXT1664(auVar376._0_16_);
              auVar392 = ZEXT1664(auVar392._0_16_);
              auVar410 = ZEXT1664(auVar410._0_16_);
              fVar177 = sqrtf((float)local_ae0._0_4_);
            }
            auVar303 = ZEXT464(uVar117);
            auVar281 = ZEXT464((uint)fVar200);
            auVar102._4_4_ = fStack_b3c;
            auVar102._0_4_ = local_b40;
            auVar102._8_4_ = fStack_b38;
            auVar102._12_4_ = fStack_b34;
            auVar36 = vminps_avx(auVar102,_local_a60);
            auVar206 = vmaxps_avx(auVar102,_local_a60);
            auVar122 = vminps_avx(_local_b60,_local_a80);
            auVar183 = vminps_avx(auVar36,auVar122);
            auVar36 = vmaxps_avx(_local_b60,_local_a80);
            auVar122 = vmaxps_avx(auVar206,auVar36);
            auVar203._8_4_ = 0x7fffffff;
            auVar203._0_8_ = 0x7fffffff7fffffff;
            auVar203._12_4_ = 0x7fffffff;
            auVar206 = vandps_avx(auVar183,auVar203);
            auVar36 = vandps_avx(auVar122,auVar203);
            auVar206 = vmaxps_avx(auVar206,auVar36);
            auVar36 = vmovshdup_avx(auVar206);
            auVar36 = vmaxss_avx(auVar36,auVar206);
            auVar206 = vshufpd_avx(auVar206,auVar206,1);
            auVar206 = vmaxss_avx(auVar206,auVar36);
            local_bc0._0_4_ = auVar206._0_4_ * 1.9073486e-06;
            local_a20._0_4_ = fVar177 * 1.9073486e-06;
            local_b20._0_16_ = vshufps_avx(auVar122,auVar122,0xff);
            auVar206 = vinsertps_avx(ZEXT416(uVar117),ZEXT416((uint)fVar200),0x10);
            auVar244 = ZEXT1664(auVar206);
            lVar112 = 5;
            do {
              do {
                auVar206 = auVar244._0_16_;
                bVar118 = lVar112 == 0;
                lVar112 = lVar112 + -1;
                if (bVar118) goto LAB_00ad6864;
                auVar36 = vmovshdup_avx(auVar206);
                fVar200 = auVar36._0_4_;
                fVar180 = 1.0 - fVar200;
                fVar177 = fVar180 * fVar180 * fVar180;
                fVar178 = fVar200 * fVar200 * fVar200;
                fVar220 = fVar200 * fVar180;
                auVar36 = vshufps_avx(ZEXT416((uint)(fVar178 * 0.16666667)),
                                      ZEXT416((uint)(fVar178 * 0.16666667)),0);
                auVar122 = ZEXT416((uint)((fVar178 * 4.0 + fVar177 +
                                          fVar200 * fVar220 * 12.0 + fVar180 * fVar220 * 6.0) *
                                         0.16666667));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar183 = ZEXT416((uint)((fVar177 * 4.0 + fVar178 +
                                          fVar180 * fVar220 * 12.0 + fVar200 * fVar220 * 6.0) *
                                         0.16666667));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar124 = vshufps_avx(auVar206,auVar206,0);
                auVar184._0_4_ = auVar124._0_4_ * (float)local_ad0._0_4_ + 0.0;
                auVar184._4_4_ = auVar124._4_4_ * (float)local_ad0._4_4_ + 0.0;
                auVar184._8_4_ = auVar124._8_4_ * fStack_ac8 + 0.0;
                auVar184._12_4_ = auVar124._12_4_ * fStack_ac4 + 0.0;
                auVar124 = vshufps_avx(ZEXT416((uint)(fVar177 * 0.16666667)),
                                       ZEXT416((uint)(fVar177 * 0.16666667)),0);
                auVar121._0_4_ =
                     auVar124._0_4_ * local_b40 +
                     auVar183._0_4_ * (float)local_a60._0_4_ +
                     auVar36._0_4_ * (float)local_a80._0_4_ +
                     auVar122._0_4_ * (float)local_b60._0_4_;
                auVar121._4_4_ =
                     auVar124._4_4_ * fStack_b3c +
                     auVar183._4_4_ * (float)local_a60._4_4_ +
                     auVar36._4_4_ * (float)local_a80._4_4_ +
                     auVar122._4_4_ * (float)local_b60._4_4_;
                auVar121._8_4_ =
                     auVar124._8_4_ * fStack_b38 +
                     auVar183._8_4_ * fStack_a58 +
                     auVar36._8_4_ * fStack_a78 + auVar122._8_4_ * fStack_b58;
                auVar121._12_4_ =
                     auVar124._12_4_ * fStack_b34 +
                     auVar183._12_4_ * fStack_a54 +
                     auVar36._12_4_ * fStack_a74 + auVar122._12_4_ * fStack_b54;
                local_b80._0_16_ = auVar121;
                auVar36 = vsubps_avx(auVar184,auVar121);
                local_aa0 = auVar36._0_4_;
                fStack_a9c = auVar36._4_4_;
                fStack_a98 = auVar36._8_4_;
                fStack_a94 = auVar36._12_4_;
                auVar36 = vdpps_avx(auVar36,auVar36,0x7f);
                fVar177 = auVar36._0_4_;
                if (fVar177 < 0.0) {
                  auVar281._0_4_ = sqrtf(fVar177);
                  auVar281._4_60_ = extraout_var;
                  auVar122 = auVar281._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar36,auVar36);
                }
                auVar392 = ZEXT1664(auVar122);
                auVar183 = ZEXT416((uint)(fVar200 * fVar200 * 0.5));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar124 = ZEXT416((uint)((fVar180 * fVar180 + fVar220 * 4.0) * 0.5));
                auVar124 = vshufps_avx(auVar124,auVar124,0);
                auVar153 = ZEXT416((uint)((fVar200 * -fVar200 - fVar220 * 4.0) * 0.5));
                auVar153 = vshufps_avx(auVar153,auVar153,0);
                auVar123 = ZEXT416((uint)(fVar180 * -fVar180 * 0.5));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar312._0_4_ =
                     local_b40 * auVar123._0_4_ +
                     (float)local_a60._0_4_ * auVar153._0_4_ +
                     (float)local_a80._0_4_ * auVar183._0_4_ +
                     (float)local_b60._0_4_ * auVar124._0_4_;
                auVar312._4_4_ =
                     fStack_b3c * auVar123._4_4_ +
                     (float)local_a60._4_4_ * auVar153._4_4_ +
                     (float)local_a80._4_4_ * auVar183._4_4_ +
                     (float)local_b60._4_4_ * auVar124._4_4_;
                auVar312._8_4_ =
                     fStack_b38 * auVar123._8_4_ +
                     fStack_a58 * auVar153._8_4_ +
                     fStack_a78 * auVar183._8_4_ + fStack_b58 * auVar124._8_4_;
                auVar312._12_4_ =
                     fStack_b34 * auVar123._12_4_ +
                     fStack_a54 * auVar153._12_4_ +
                     fStack_a74 * auVar183._12_4_ + fStack_b54 * auVar124._12_4_;
                auVar183 = vshufps_avx(auVar206,auVar206,0x55);
                auVar124 = ZEXT416((uint)(fVar180 - (fVar200 + fVar200)));
                auVar153 = vshufps_avx(auVar124,auVar124,0);
                auVar124 = ZEXT416((uint)(fVar200 - (fVar180 + fVar180)));
                auVar123 = vshufps_avx(auVar124,auVar124,0);
                auVar37 = vshufps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar180),0);
                auVar124 = vdpps_avx(auVar312,auVar312,0x7f);
                auVar154._0_4_ =
                     local_b40 * auVar37._0_4_ +
                     (float)local_a60._0_4_ * auVar123._0_4_ +
                     (float)local_a80._0_4_ * auVar183._0_4_ +
                     (float)local_b60._0_4_ * auVar153._0_4_;
                auVar154._4_4_ =
                     fStack_b3c * auVar37._4_4_ +
                     (float)local_a60._4_4_ * auVar123._4_4_ +
                     (float)local_a80._4_4_ * auVar183._4_4_ +
                     (float)local_b60._4_4_ * auVar153._4_4_;
                auVar154._8_4_ =
                     fStack_b38 * auVar37._8_4_ +
                     fStack_a58 * auVar123._8_4_ +
                     fStack_a78 * auVar183._8_4_ + fStack_b58 * auVar153._8_4_;
                auVar154._12_4_ =
                     fStack_b34 * auVar37._12_4_ +
                     fStack_a54 * auVar123._12_4_ +
                     fStack_a74 * auVar183._12_4_ + fStack_b54 * auVar153._12_4_;
                auVar183 = vblendps_avx(auVar124,_DAT_01f45a50,0xe);
                auVar153 = vrsqrtss_avx(auVar183,auVar183);
                fVar178 = auVar153._0_4_;
                fVar200 = auVar124._0_4_;
                auVar153 = vdpps_avx(auVar312,auVar154,0x7f);
                auVar123 = vshufps_avx(auVar124,auVar124,0);
                auVar155._0_4_ = auVar154._0_4_ * auVar123._0_4_;
                auVar155._4_4_ = auVar154._4_4_ * auVar123._4_4_;
                auVar155._8_4_ = auVar154._8_4_ * auVar123._8_4_;
                auVar155._12_4_ = auVar154._12_4_ * auVar123._12_4_;
                auVar153 = vshufps_avx(auVar153,auVar153,0);
                auVar228._0_4_ = auVar312._0_4_ * auVar153._0_4_;
                auVar228._4_4_ = auVar312._4_4_ * auVar153._4_4_;
                auVar228._8_4_ = auVar312._8_4_ * auVar153._8_4_;
                auVar228._12_4_ = auVar312._12_4_ * auVar153._12_4_;
                auVar37 = vsubps_avx(auVar155,auVar228);
                auVar153 = vrcpss_avx(auVar183,auVar183);
                auVar183 = vmaxss_avx(ZEXT416((uint)local_bc0._0_4_),
                                      ZEXT416((uint)(auVar244._0_4_ * (float)local_a20._0_4_)));
                auVar376 = ZEXT1664(auVar183);
                auVar153 = ZEXT416((uint)(auVar153._0_4_ * (2.0 - fVar200 * auVar153._0_4_)));
                auVar153 = vshufps_avx(auVar153,auVar153,0);
                uVar110 = CONCAT44(auVar312._4_4_,auVar312._0_4_);
                auVar249._0_8_ = uVar110 ^ 0x8000000080000000;
                auVar249._8_4_ = -auVar312._8_4_;
                auVar249._12_4_ = -auVar312._12_4_;
                auVar123 = ZEXT416((uint)(fVar178 * 1.5 +
                                         fVar200 * -0.5 * fVar178 * fVar178 * fVar178));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar204._0_4_ = auVar123._0_4_ * auVar37._0_4_ * auVar153._0_4_;
                auVar204._4_4_ = auVar123._4_4_ * auVar37._4_4_ * auVar153._4_4_;
                auVar204._8_4_ = auVar123._8_4_ * auVar37._8_4_ * auVar153._8_4_;
                auVar204._12_4_ = auVar123._12_4_ * auVar37._12_4_ * auVar153._12_4_;
                auVar274._0_4_ = auVar312._0_4_ * auVar123._0_4_;
                auVar274._4_4_ = auVar312._4_4_ * auVar123._4_4_;
                auVar274._8_4_ = auVar312._8_4_ * auVar123._8_4_;
                auVar274._12_4_ = auVar312._12_4_ * auVar123._12_4_;
                if (fVar200 < 0.0) {
                  local_b00._0_16_ = auVar204;
                  fVar200 = sqrtf(fVar200);
                  auVar392 = ZEXT464(auVar122._0_4_);
                  auVar376 = ZEXT464(auVar183._0_4_);
                  auVar204 = local_b00._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar124,auVar124);
                  fVar200 = auVar122._0_4_;
                }
                auVar104._4_4_ = fStack_a9c;
                auVar104._0_4_ = local_aa0;
                auVar104._8_4_ = fStack_a98;
                auVar104._12_4_ = fStack_a94;
                auVar122 = vdpps_avx(auVar104,auVar274,0x7f);
                fVar200 = ((float)local_bc0._0_4_ / fVar200) * (auVar392._0_4_ + 1.0) +
                          auVar376._0_4_ + auVar392._0_4_ * (float)local_bc0._0_4_;
                auVar124 = vdpps_avx(auVar249,auVar274,0x7f);
                auVar153 = vdpps_avx(auVar104,auVar204,0x7f);
                auVar123 = vdpps_avx(_local_ad0,auVar274,0x7f);
                auVar37 = vdpps_avx(auVar104,auVar249,0x7f);
                fVar178 = auVar124._0_4_ + auVar153._0_4_;
                fVar220 = auVar122._0_4_;
                auVar125._0_4_ = fVar220 * fVar220;
                auVar125._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                auVar125._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                auVar125._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                auVar153 = vsubps_avx(auVar36,auVar125);
                auVar124 = vdpps_avx(auVar104,_local_ad0,0x7f);
                fVar180 = auVar37._0_4_ - fVar220 * fVar178;
                fVar179 = auVar124._0_4_ - fVar220 * auVar123._0_4_;
                auVar124 = vrsqrtss_avx(auVar153,auVar153);
                fVar221 = auVar153._0_4_;
                fVar220 = auVar124._0_4_;
                fVar220 = fVar220 * 1.5 + fVar221 * -0.5 * fVar220 * fVar220 * fVar220;
                if (fVar221 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar178);
                  local_940._0_4_ = fVar180;
                  local_960._0_4_ = fVar179;
                  local_980._0_4_ = fVar220;
                  auVar392 = ZEXT1664(auVar392._0_16_);
                  fVar221 = sqrtf(fVar221);
                  auVar376 = ZEXT464(auVar183._0_4_);
                  fVar220 = (float)local_980._0_4_;
                  fVar180 = (float)local_940._0_4_;
                  fVar179 = (float)local_960._0_4_;
                  auVar183 = local_b00._0_16_;
                }
                else {
                  auVar183 = vsqrtss_avx(auVar153,auVar153);
                  fVar221 = auVar183._0_4_;
                  auVar183 = ZEXT416((uint)fVar178);
                }
                auVar410 = ZEXT1664(auVar122);
                auVar303 = ZEXT1664(auVar36);
                auVar126 = vpermilps_avx(local_b80._0_16_,0xff);
                auVar37 = vshufps_avx(auVar312,auVar312,0xff);
                fVar180 = fVar180 * fVar220 - auVar37._0_4_;
                auVar229._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
                auVar229._8_4_ = auVar123._8_4_ ^ 0x80000000;
                auVar229._12_4_ = auVar123._12_4_ ^ 0x80000000;
                auVar250._0_4_ = -fVar180;
                auVar250._4_4_ = 0x80000000;
                auVar250._8_4_ = 0x80000000;
                auVar250._12_4_ = 0x80000000;
                fVar178 = auVar183._0_4_ * fVar179 * fVar220;
                auVar281 = ZEXT464((uint)fVar178);
                auVar124 = vinsertps_avx(auVar250,ZEXT416((uint)(fVar179 * fVar220)),0x1c);
                auVar153 = vmovsldup_avx(ZEXT416((uint)(fVar178 - auVar123._0_4_ * fVar180)));
                auVar124 = vdivps_avx(auVar124,auVar153);
                auVar183 = vinsertps_avx(auVar183,auVar229,0x10);
                auVar183 = vdivps_avx(auVar183,auVar153);
                auVar153 = vmovsldup_avx(auVar122);
                auVar126 = ZEXT416((uint)(fVar221 - auVar126._0_4_));
                auVar123 = vmovsldup_avx(auVar126);
                auVar185._0_4_ = auVar153._0_4_ * auVar124._0_4_ + auVar123._0_4_ * auVar183._0_4_;
                auVar185._4_4_ = auVar153._4_4_ * auVar124._4_4_ + auVar123._4_4_ * auVar183._4_4_;
                auVar185._8_4_ = auVar153._8_4_ * auVar124._8_4_ + auVar123._8_4_ * auVar183._8_4_;
                auVar185._12_4_ =
                     auVar153._12_4_ * auVar124._12_4_ + auVar123._12_4_ * auVar183._12_4_;
                auVar183 = vsubps_avx(auVar206,auVar185);
                auVar244 = ZEXT1664(auVar183);
                auVar186._8_4_ = 0x7fffffff;
                auVar186._0_8_ = 0x7fffffff7fffffff;
                auVar186._12_4_ = 0x7fffffff;
                auVar206 = vandps_avx(auVar122,auVar186);
              } while (fVar200 <= auVar206._0_4_);
              auVar205._8_4_ = 0x7fffffff;
              auVar205._0_8_ = 0x7fffffff7fffffff;
              auVar205._12_4_ = 0x7fffffff;
              auVar206 = vandps_avx(auVar126,auVar205);
            } while ((float)local_b20._0_4_ * 1.9073486e-06 + auVar376._0_4_ + fVar200 <=
                     auVar206._0_4_);
            fVar200 = auVar183._0_4_ + (float)local_a00._0_4_;
            if (fVar8 <= fVar200) {
              fVar178 = *(float *)(ray + k * 4 + 0x100);
              auVar281 = ZEXT464((uint)fVar178);
              if (fVar200 <= fVar178) {
                auVar206 = vmovshdup_avx(auVar183);
                fVar220 = auVar206._0_4_;
                if ((0.0 <= fVar220) && (fVar220 <= 1.0)) {
                  auVar206 = vrsqrtss_avx(auVar36,auVar36);
                  fVar180 = auVar206._0_4_;
                  pGVar20 = (context->scene->geometries).items[uVar114].ptr;
                  if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar206 = ZEXT416((uint)(fVar180 * 1.5 +
                                             fVar177 * -0.5 * fVar180 * fVar180 * fVar180));
                    auVar206 = vshufps_avx(auVar206,auVar206,0);
                    auVar207._0_4_ = auVar206._0_4_ * local_aa0;
                    auVar207._4_4_ = auVar206._4_4_ * fStack_a9c;
                    auVar207._8_4_ = auVar206._8_4_ * fStack_a98;
                    auVar207._12_4_ = auVar206._12_4_ * fStack_a94;
                    auVar156._0_4_ = auVar312._0_4_ + auVar37._0_4_ * auVar207._0_4_;
                    auVar156._4_4_ = auVar312._4_4_ + auVar37._4_4_ * auVar207._4_4_;
                    auVar156._8_4_ = auVar312._8_4_ + auVar37._8_4_ * auVar207._8_4_;
                    auVar156._12_4_ = auVar312._12_4_ + auVar37._12_4_ * auVar207._12_4_;
                    auVar206 = vshufps_avx(auVar207,auVar207,0xc9);
                    auVar124 = vshufps_avx(auVar312,auVar312,0xc9);
                    auVar208._0_4_ = auVar124._0_4_ * auVar207._0_4_;
                    auVar208._4_4_ = auVar124._4_4_ * auVar207._4_4_;
                    auVar208._8_4_ = auVar124._8_4_ * auVar207._8_4_;
                    auVar208._12_4_ = auVar124._12_4_ * auVar207._12_4_;
                    auVar230._0_4_ = auVar312._0_4_ * auVar206._0_4_;
                    auVar230._4_4_ = auVar312._4_4_ * auVar206._4_4_;
                    auVar230._8_4_ = auVar312._8_4_ * auVar206._8_4_;
                    auVar230._12_4_ = auVar312._12_4_ * auVar206._12_4_;
                    auVar153 = vsubps_avx(auVar230,auVar208);
                    auVar206 = vshufps_avx(auVar153,auVar153,0xc9);
                    auVar124 = vshufps_avx(auVar156,auVar156,0xc9);
                    auVar231._0_4_ = auVar124._0_4_ * auVar206._0_4_;
                    auVar231._4_4_ = auVar124._4_4_ * auVar206._4_4_;
                    auVar231._8_4_ = auVar124._8_4_ * auVar206._8_4_;
                    auVar231._12_4_ = auVar124._12_4_ * auVar206._12_4_;
                    auVar206 = vshufps_avx(auVar153,auVar153,0xd2);
                    auVar157._0_4_ = auVar156._0_4_ * auVar206._0_4_;
                    auVar157._4_4_ = auVar156._4_4_ * auVar206._4_4_;
                    auVar157._8_4_ = auVar156._8_4_ * auVar206._8_4_;
                    auVar157._12_4_ = auVar156._12_4_ * auVar206._12_4_;
                    auVar206 = vsubps_avx(auVar231,auVar157);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar200;
                      uVar9 = vextractps_avx(auVar206,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar206,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar206._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar220;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_b88;
                      *(uint *)(ray + k * 4 + 0x240) = uVar114;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar25 = context->user;
                      auStack_790 = vshufps_avx(auVar183,auVar183,0x55);
                      auStack_7f0 = vshufps_avx(auVar206,auVar206,0x55);
                      auStack_7d0 = vshufps_avx(auVar206,auVar206,0xaa);
                      auStack_7b0 = vshufps_avx(auVar206,auVar206,0);
                      local_800 = (RTCHitN  [16])auStack_7f0;
                      local_7e0 = auStack_7d0;
                      local_7c0 = auStack_7b0;
                      local_7a0 = auStack_790;
                      local_780 = ZEXT832(0) << 0x20;
                      local_760 = local_6c0._0_8_;
                      uStack_758 = local_6c0._8_8_;
                      uStack_750 = local_6c0._16_8_;
                      uStack_748 = local_6c0._24_8_;
                      local_740 = local_6a0;
                      auVar129 = vcmpps_avx(local_6a0,local_6a0,0xf);
                      local_b90[1] = auVar129;
                      *local_b90 = auVar129;
                      local_720 = pRVar25->instID[0];
                      uStack_71c = local_720;
                      uStack_718 = local_720;
                      uStack_714 = local_720;
                      uStack_710 = local_720;
                      uStack_70c = local_720;
                      uStack_708 = local_720;
                      uStack_704 = local_720;
                      local_700 = pRVar25->instPrimID[0];
                      uStack_6fc = local_700;
                      uStack_6f8 = local_700;
                      uStack_6f4 = local_700;
                      uStack_6f0 = local_700;
                      uStack_6ec = local_700;
                      uStack_6e8 = local_700;
                      uStack_6e4 = local_700;
                      *(float *)(ray + k * 4 + 0x100) = fVar200;
                      local_c20 = *local_b98;
                      local_c10 = *local_ba0;
                      local_bf0.valid = (int *)local_c20;
                      local_bf0.geometryUserPtr = pGVar20->userPtr;
                      local_bf0.context = context->user;
                      local_bf0.hit = local_800;
                      local_bf0.N = 8;
                      local_bf0.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar303 = ZEXT1664(auVar36);
                        auVar376 = ZEXT1664(auVar376._0_16_);
                        auVar392 = ZEXT1664(auVar392._0_16_);
                        auVar410 = ZEXT1664(auVar122);
                        (*pGVar20->intersectionFilterN)(&local_bf0);
                      }
                      auVar206 = vpcmpeqd_avx(local_c20,ZEXT816(0) << 0x40);
                      auVar36 = vpcmpeqd_avx(local_c10,ZEXT816(0) << 0x40);
                      auVar195._16_16_ = auVar36;
                      auVar195._0_16_ = auVar206;
                      auVar129 = _DAT_01f7b020 & ~auVar195;
                      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar129 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar129 >> 0x7f,0) != '\0') ||
                            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar129 >> 0xbf,0) != '\0') ||
                          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar129[0x1f] < '\0') {
                        p_Var26 = context->args->filter;
                        if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar303 = ZEXT1664(auVar303._0_16_);
                          auVar376 = ZEXT1664(auVar376._0_16_);
                          auVar392 = ZEXT1664(auVar392._0_16_);
                          auVar410 = ZEXT1664(auVar410._0_16_);
                          (*p_Var26)(&local_bf0);
                        }
                        auVar281 = ZEXT464((uint)fVar178);
                        auVar206 = vpcmpeqd_avx(local_c20,ZEXT816(0) << 0x40);
                        auVar36 = vpcmpeqd_avx(local_c10,ZEXT816(0) << 0x40);
                        auVar140._16_16_ = auVar36;
                        auVar140._0_16_ = auVar206;
                        auVar129 = _DAT_01f7b020 & ~auVar140;
                        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar129 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar129 >> 0x7f,0) != '\0')
                              || (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar129 >> 0xbf,0) != '\0') ||
                            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar129[0x1f] < '\0') {
                          auVar141._0_8_ = auVar206._0_8_ ^ 0xffffffffffffffff;
                          auVar141._8_4_ = auVar206._8_4_ ^ 0xffffffff;
                          auVar141._12_4_ = auVar206._12_4_ ^ 0xffffffff;
                          auVar141._16_4_ = auVar36._0_4_ ^ 0xffffffff;
                          auVar141._20_4_ = auVar36._4_4_ ^ 0xffffffff;
                          auVar141._24_4_ = auVar36._8_4_ ^ 0xffffffff;
                          auVar141._28_4_ = auVar36._12_4_ ^ 0xffffffff;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])local_bf0.hit);
                          *(undefined1 (*) [32])(local_bf0.ray + 0x180) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x20));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x1a0) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x40));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x1c0) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x60));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x1e0) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x80));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x200) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x220) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x240) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x260) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x100));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x280) = auVar129;
                          goto LAB_00ad6864;
                        }
                      }
                      auVar281 = ZEXT464((uint)fVar178);
                      *(float *)(ray + k * 4 + 0x100) = fVar178;
                    }
                  }
                }
              }
            }
LAB_00ad6864:
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar361._4_4_ = uVar9;
            auVar361._0_4_ = uVar9;
            auVar361._8_4_ = uVar9;
            auVar361._12_4_ = uVar9;
            auVar361._16_4_ = uVar9;
            auVar361._20_4_ = uVar9;
            auVar361._24_4_ = uVar9;
            auVar361._28_4_ = uVar9;
            auVar244 = ZEXT3264(auVar361);
            auVar129 = vcmpps_avx(_local_a40,auVar361,2);
            auVar129 = vandps_avx(auVar129,local_4c0);
          }
          auVar142._0_4_ = (float)local_ac0._0_4_ + (float)local_9a0._0_4_;
          auVar142._4_4_ = (float)local_ac0._4_4_ + (float)local_9a0._4_4_;
          auVar142._8_4_ = fStack_ab8 + fStack_998;
          auVar142._12_4_ = fStack_ab4 + fStack_994;
          auVar142._16_4_ = fStack_ab0 + fStack_990;
          auVar142._20_4_ = fStack_aac + fStack_98c;
          auVar142._24_4_ = fStack_aa8 + fStack_988;
          auVar142._28_4_ = fStack_aa4 + fStack_984;
          auVar206 = vshufps_avx(auVar244._0_16_,auVar244._0_16_,0);
          auVar173._16_16_ = auVar206;
          auVar173._0_16_ = auVar206;
          auVar129 = vcmpps_avx(auVar142,auVar173,2);
          _local_9a0 = vandps_avx(auVar129,local_9c0);
          auVar143._8_4_ = 3;
          auVar143._0_8_ = 0x300000003;
          auVar143._12_4_ = 3;
          auVar143._16_4_ = 3;
          auVar143._20_4_ = 3;
          auVar143._24_4_ = 3;
          auVar143._28_4_ = 3;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar129 = vblendvps_avx(auVar174,auVar143,local_880);
          auVar206 = vpcmpgtd_avx(auVar129._16_16_,local_8c0);
          auVar36 = vpshufd_avx(local_8a0._0_16_,0);
          auVar36 = vpcmpgtd_avx(auVar129._0_16_,auVar36);
          auVar175._16_16_ = auVar206;
          auVar175._0_16_ = auVar36;
          local_9c0 = vblendps_avx(ZEXT1632(auVar36),auVar175,0xf0);
          auVar129 = vandnps_avx(local_9c0,_local_9a0);
          local_920 = _local_460;
          local_a40._4_4_ = (float)local_ac0._4_4_ + (float)local_460._4_4_;
          local_a40._0_4_ = (float)local_ac0._0_4_ + (float)local_460._0_4_;
          fStack_a38 = fStack_ab8 + fStack_458;
          fStack_a34 = fStack_ab4 + fStack_454;
          fStack_a30 = fStack_ab0 + fStack_450;
          fStack_a2c = fStack_aac + fStack_44c;
          fStack_a28 = fStack_aa8 + fStack_448;
          fStack_a24 = fStack_aa4 + fStack_444;
          while( true ) {
            local_4e0 = auVar129;
            if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar129 >> 0x7f,0) == '\0') &&
                  (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar129 >> 0xbf,0) == '\0') &&
                (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar129[0x1f]) break;
            auVar176._8_4_ = 0x7f800000;
            auVar176._0_8_ = 0x7f8000007f800000;
            auVar176._12_4_ = 0x7f800000;
            auVar176._16_4_ = 0x7f800000;
            auVar176._20_4_ = 0x7f800000;
            auVar176._24_4_ = 0x7f800000;
            auVar176._28_4_ = 0x7f800000;
            auVar147 = vblendvps_avx(auVar176,local_920,auVar129);
            auVar29 = vshufps_avx(auVar147,auVar147,0xb1);
            auVar29 = vminps_avx(auVar147,auVar29);
            auVar27 = vshufpd_avx(auVar29,auVar29,5);
            auVar29 = vminps_avx(auVar29,auVar27);
            auVar27 = vperm2f128_avx(auVar29,auVar29,1);
            auVar29 = vminps_avx(auVar29,auVar27);
            auVar147 = vcmpps_avx(auVar147,auVar29,0);
            auVar29 = auVar129 & auVar147;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0x7f,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0xbf,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar29[0x1f] < '\0') {
              auVar129 = vandps_avx(auVar147,auVar129);
            }
            uVar109 = vmovmskps_avx(auVar129);
            uVar117 = 0;
            if (uVar109 != 0) {
              for (; (uVar109 >> uVar117 & 1) == 0; uVar117 = uVar117 + 1) {
              }
            }
            uVar110 = (ulong)uVar117;
            *(undefined4 *)(local_4e0 + uVar110 * 4) = 0;
            fVar200 = local_1c0[uVar110];
            uVar117 = *(uint *)(local_440 + uVar110 * 4);
            fVar177 = auVar35._0_4_;
            if ((float)local_ae0._0_4_ < 0.0) {
              auVar376 = ZEXT1664(auVar376._0_16_);
              auVar392 = ZEXT1664(auVar392._0_16_);
              auVar410 = ZEXT1664(auVar410._0_16_);
              fVar177 = sqrtf((float)local_ae0._0_4_);
            }
            auVar303 = ZEXT464(uVar117);
            auVar281 = ZEXT464((uint)fVar200);
            auVar103._4_4_ = fStack_b3c;
            auVar103._0_4_ = local_b40;
            auVar103._8_4_ = fStack_b38;
            auVar103._12_4_ = fStack_b34;
            auVar36 = vminps_avx(auVar103,_local_a60);
            auVar206 = vmaxps_avx(auVar103,_local_a60);
            auVar122 = vminps_avx(_local_b60,_local_a80);
            auVar183 = vminps_avx(auVar36,auVar122);
            auVar36 = vmaxps_avx(_local_b60,_local_a80);
            auVar122 = vmaxps_avx(auVar206,auVar36);
            auVar209._8_4_ = 0x7fffffff;
            auVar209._0_8_ = 0x7fffffff7fffffff;
            auVar209._12_4_ = 0x7fffffff;
            auVar206 = vandps_avx(auVar183,auVar209);
            auVar36 = vandps_avx(auVar122,auVar209);
            auVar206 = vmaxps_avx(auVar206,auVar36);
            auVar36 = vmovshdup_avx(auVar206);
            auVar36 = vmaxss_avx(auVar36,auVar206);
            auVar206 = vshufpd_avx(auVar206,auVar206,1);
            auVar206 = vmaxss_avx(auVar206,auVar36);
            local_bc0._0_4_ = auVar206._0_4_ * 1.9073486e-06;
            local_a20._0_4_ = fVar177 * 1.9073486e-06;
            local_b20._0_16_ = vshufps_avx(auVar122,auVar122,0xff);
            auVar206 = vinsertps_avx(ZEXT416(uVar117),ZEXT416((uint)fVar200),0x10);
            auVar244 = ZEXT1664(auVar206);
            lVar112 = 5;
            do {
              do {
                auVar206 = auVar244._0_16_;
                bVar118 = lVar112 == 0;
                lVar112 = lVar112 + -1;
                if (bVar118) goto LAB_00ad7484;
                auVar36 = vmovshdup_avx(auVar206);
                fVar200 = auVar36._0_4_;
                fVar180 = 1.0 - fVar200;
                fVar177 = fVar180 * fVar180 * fVar180;
                fVar178 = fVar200 * fVar200 * fVar200;
                fVar220 = fVar200 * fVar180;
                auVar36 = vshufps_avx(ZEXT416((uint)(fVar178 * 0.16666667)),
                                      ZEXT416((uint)(fVar178 * 0.16666667)),0);
                auVar122 = ZEXT416((uint)((fVar178 * 4.0 + fVar177 +
                                          fVar200 * fVar220 * 12.0 + fVar180 * fVar220 * 6.0) *
                                         0.16666667));
                auVar122 = vshufps_avx(auVar122,auVar122,0);
                auVar183 = ZEXT416((uint)((fVar177 * 4.0 + fVar178 +
                                          fVar180 * fVar220 * 12.0 + fVar200 * fVar220 * 6.0) *
                                         0.16666667));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar124 = vshufps_avx(auVar206,auVar206,0);
                auVar187._0_4_ = auVar124._0_4_ * (float)local_ad0._0_4_ + 0.0;
                auVar187._4_4_ = auVar124._4_4_ * (float)local_ad0._4_4_ + 0.0;
                auVar187._8_4_ = auVar124._8_4_ * fStack_ac8 + 0.0;
                auVar187._12_4_ = auVar124._12_4_ * fStack_ac4 + 0.0;
                auVar124 = vshufps_avx(ZEXT416((uint)(fVar177 * 0.16666667)),
                                       ZEXT416((uint)(fVar177 * 0.16666667)),0);
                auVar127._0_4_ =
                     auVar124._0_4_ * local_b40 +
                     auVar183._0_4_ * (float)local_a60._0_4_ +
                     auVar36._0_4_ * (float)local_a80._0_4_ +
                     auVar122._0_4_ * (float)local_b60._0_4_;
                auVar127._4_4_ =
                     auVar124._4_4_ * fStack_b3c +
                     auVar183._4_4_ * (float)local_a60._4_4_ +
                     auVar36._4_4_ * (float)local_a80._4_4_ +
                     auVar122._4_4_ * (float)local_b60._4_4_;
                auVar127._8_4_ =
                     auVar124._8_4_ * fStack_b38 +
                     auVar183._8_4_ * fStack_a58 +
                     auVar36._8_4_ * fStack_a78 + auVar122._8_4_ * fStack_b58;
                auVar127._12_4_ =
                     auVar124._12_4_ * fStack_b34 +
                     auVar183._12_4_ * fStack_a54 +
                     auVar36._12_4_ * fStack_a74 + auVar122._12_4_ * fStack_b54;
                local_b80._0_16_ = auVar127;
                auVar36 = vsubps_avx(auVar187,auVar127);
                local_aa0 = auVar36._0_4_;
                fStack_a9c = auVar36._4_4_;
                fStack_a98 = auVar36._8_4_;
                fStack_a94 = auVar36._12_4_;
                auVar36 = vdpps_avx(auVar36,auVar36,0x7f);
                fVar177 = auVar36._0_4_;
                if (fVar177 < 0.0) {
                  auVar261._0_4_ = sqrtf(fVar177);
                  auVar261._4_60_ = extraout_var_00;
                  auVar122 = auVar261._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar36,auVar36);
                }
                auVar392 = ZEXT1664(auVar122);
                auVar183 = ZEXT416((uint)(fVar200 * fVar200 * 0.5));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar124 = ZEXT416((uint)((fVar180 * fVar180 + fVar220 * 4.0) * 0.5));
                auVar124 = vshufps_avx(auVar124,auVar124,0);
                auVar153 = ZEXT416((uint)((fVar200 * -fVar200 - fVar220 * 4.0) * 0.5));
                auVar153 = vshufps_avx(auVar153,auVar153,0);
                auVar123 = ZEXT416((uint)(fVar180 * -fVar180 * 0.5));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar313._0_4_ =
                     local_b40 * auVar123._0_4_ +
                     (float)local_a60._0_4_ * auVar153._0_4_ +
                     (float)local_a80._0_4_ * auVar183._0_4_ +
                     (float)local_b60._0_4_ * auVar124._0_4_;
                auVar313._4_4_ =
                     fStack_b3c * auVar123._4_4_ +
                     (float)local_a60._4_4_ * auVar153._4_4_ +
                     (float)local_a80._4_4_ * auVar183._4_4_ +
                     (float)local_b60._4_4_ * auVar124._4_4_;
                auVar313._8_4_ =
                     fStack_b38 * auVar123._8_4_ +
                     fStack_a58 * auVar153._8_4_ +
                     fStack_a78 * auVar183._8_4_ + fStack_b58 * auVar124._8_4_;
                auVar313._12_4_ =
                     fStack_b34 * auVar123._12_4_ +
                     fStack_a54 * auVar153._12_4_ +
                     fStack_a74 * auVar183._12_4_ + fStack_b54 * auVar124._12_4_;
                auVar183 = vshufps_avx(auVar206,auVar206,0x55);
                auVar124 = ZEXT416((uint)(fVar180 - (fVar200 + fVar200)));
                auVar153 = vshufps_avx(auVar124,auVar124,0);
                auVar124 = ZEXT416((uint)(fVar200 - (fVar180 + fVar180)));
                auVar123 = vshufps_avx(auVar124,auVar124,0);
                auVar37 = vshufps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar180),0);
                auVar124 = vdpps_avx(auVar313,auVar313,0x7f);
                auVar158._0_4_ =
                     local_b40 * auVar37._0_4_ +
                     (float)local_a60._0_4_ * auVar123._0_4_ +
                     (float)local_a80._0_4_ * auVar183._0_4_ +
                     (float)local_b60._0_4_ * auVar153._0_4_;
                auVar158._4_4_ =
                     fStack_b3c * auVar37._4_4_ +
                     (float)local_a60._4_4_ * auVar123._4_4_ +
                     (float)local_a80._4_4_ * auVar183._4_4_ +
                     (float)local_b60._4_4_ * auVar153._4_4_;
                auVar158._8_4_ =
                     fStack_b38 * auVar37._8_4_ +
                     fStack_a58 * auVar123._8_4_ +
                     fStack_a78 * auVar183._8_4_ + fStack_b58 * auVar153._8_4_;
                auVar158._12_4_ =
                     fStack_b34 * auVar37._12_4_ +
                     fStack_a54 * auVar123._12_4_ +
                     fStack_a74 * auVar183._12_4_ + fStack_b54 * auVar153._12_4_;
                auVar183 = vblendps_avx(auVar124,_DAT_01f45a50,0xe);
                auVar153 = vrsqrtss_avx(auVar183,auVar183);
                fVar178 = auVar153._0_4_;
                fVar200 = auVar124._0_4_;
                auVar153 = vdpps_avx(auVar313,auVar158,0x7f);
                auVar123 = vshufps_avx(auVar124,auVar124,0);
                auVar159._0_4_ = auVar158._0_4_ * auVar123._0_4_;
                auVar159._4_4_ = auVar158._4_4_ * auVar123._4_4_;
                auVar159._8_4_ = auVar158._8_4_ * auVar123._8_4_;
                auVar159._12_4_ = auVar158._12_4_ * auVar123._12_4_;
                auVar153 = vshufps_avx(auVar153,auVar153,0);
                auVar232._0_4_ = auVar313._0_4_ * auVar153._0_4_;
                auVar232._4_4_ = auVar313._4_4_ * auVar153._4_4_;
                auVar232._8_4_ = auVar313._8_4_ * auVar153._8_4_;
                auVar232._12_4_ = auVar313._12_4_ * auVar153._12_4_;
                auVar37 = vsubps_avx(auVar159,auVar232);
                auVar153 = vrcpss_avx(auVar183,auVar183);
                auVar183 = vmaxss_avx(ZEXT416((uint)local_bc0._0_4_),
                                      ZEXT416((uint)(auVar244._0_4_ * (float)local_a20._0_4_)));
                auVar376 = ZEXT1664(auVar183);
                auVar153 = ZEXT416((uint)(auVar153._0_4_ * (2.0 - fVar200 * auVar153._0_4_)));
                auVar153 = vshufps_avx(auVar153,auVar153,0);
                uVar110 = CONCAT44(auVar313._4_4_,auVar313._0_4_);
                auVar251._0_8_ = uVar110 ^ 0x8000000080000000;
                auVar251._8_4_ = -auVar313._8_4_;
                auVar251._12_4_ = -auVar313._12_4_;
                auVar123 = ZEXT416((uint)(fVar178 * 1.5 +
                                         fVar200 * -0.5 * fVar178 * fVar178 * fVar178));
                auVar123 = vshufps_avx(auVar123,auVar123,0);
                auVar210._0_4_ = auVar123._0_4_ * auVar37._0_4_ * auVar153._0_4_;
                auVar210._4_4_ = auVar123._4_4_ * auVar37._4_4_ * auVar153._4_4_;
                auVar210._8_4_ = auVar123._8_4_ * auVar37._8_4_ * auVar153._8_4_;
                auVar210._12_4_ = auVar123._12_4_ * auVar37._12_4_ * auVar153._12_4_;
                auVar275._0_4_ = auVar313._0_4_ * auVar123._0_4_;
                auVar275._4_4_ = auVar313._4_4_ * auVar123._4_4_;
                auVar275._8_4_ = auVar313._8_4_ * auVar123._8_4_;
                auVar275._12_4_ = auVar313._12_4_ * auVar123._12_4_;
                if (fVar200 < 0.0) {
                  local_b00._0_16_ = auVar210;
                  fVar200 = sqrtf(fVar200);
                  auVar392 = ZEXT464(auVar122._0_4_);
                  auVar376 = ZEXT464(auVar183._0_4_);
                  auVar210 = local_b00._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar124,auVar124);
                  fVar200 = auVar122._0_4_;
                }
                auVar105._4_4_ = fStack_a9c;
                auVar105._0_4_ = local_aa0;
                auVar105._8_4_ = fStack_a98;
                auVar105._12_4_ = fStack_a94;
                auVar122 = vdpps_avx(auVar105,auVar275,0x7f);
                fVar200 = ((float)local_bc0._0_4_ / fVar200) * (auVar392._0_4_ + 1.0) +
                          auVar376._0_4_ + auVar392._0_4_ * (float)local_bc0._0_4_;
                auVar124 = vdpps_avx(auVar251,auVar275,0x7f);
                auVar153 = vdpps_avx(auVar105,auVar210,0x7f);
                auVar123 = vdpps_avx(_local_ad0,auVar275,0x7f);
                auVar37 = vdpps_avx(auVar105,auVar251,0x7f);
                fVar178 = auVar124._0_4_ + auVar153._0_4_;
                fVar220 = auVar122._0_4_;
                auVar128._0_4_ = fVar220 * fVar220;
                auVar128._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                auVar128._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                auVar128._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                auVar153 = vsubps_avx(auVar36,auVar128);
                auVar124 = vdpps_avx(auVar105,_local_ad0,0x7f);
                fVar180 = auVar37._0_4_ - fVar220 * fVar178;
                fVar179 = auVar124._0_4_ - fVar220 * auVar123._0_4_;
                auVar124 = vrsqrtss_avx(auVar153,auVar153);
                fVar221 = auVar153._0_4_;
                fVar220 = auVar124._0_4_;
                fVar220 = fVar220 * 1.5 + fVar221 * -0.5 * fVar220 * fVar220 * fVar220;
                if (fVar221 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar178);
                  local_940._0_4_ = fVar180;
                  local_960._0_4_ = fVar179;
                  local_980._0_4_ = fVar220;
                  auVar392 = ZEXT1664(auVar392._0_16_);
                  fVar221 = sqrtf(fVar221);
                  auVar376 = ZEXT464(auVar183._0_4_);
                  fVar220 = (float)local_980._0_4_;
                  fVar180 = (float)local_940._0_4_;
                  fVar179 = (float)local_960._0_4_;
                  auVar183 = local_b00._0_16_;
                }
                else {
                  auVar183 = vsqrtss_avx(auVar153,auVar153);
                  fVar221 = auVar183._0_4_;
                  auVar183 = ZEXT416((uint)fVar178);
                }
                auVar410 = ZEXT1664(auVar122);
                auVar303 = ZEXT1664(auVar36);
                auVar126 = vpermilps_avx(local_b80._0_16_,0xff);
                auVar37 = vshufps_avx(auVar313,auVar313,0xff);
                fVar180 = fVar180 * fVar220 - auVar37._0_4_;
                auVar233._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
                auVar233._8_4_ = auVar123._8_4_ ^ 0x80000000;
                auVar233._12_4_ = auVar123._12_4_ ^ 0x80000000;
                auVar252._0_4_ = -fVar180;
                auVar252._4_4_ = 0x80000000;
                auVar252._8_4_ = 0x80000000;
                auVar252._12_4_ = 0x80000000;
                fVar178 = auVar183._0_4_ * fVar179 * fVar220;
                auVar281 = ZEXT464((uint)fVar178);
                auVar124 = vinsertps_avx(auVar252,ZEXT416((uint)(fVar179 * fVar220)),0x1c);
                auVar153 = vmovsldup_avx(ZEXT416((uint)(fVar178 - auVar123._0_4_ * fVar180)));
                auVar124 = vdivps_avx(auVar124,auVar153);
                auVar183 = vinsertps_avx(auVar183,auVar233,0x10);
                auVar183 = vdivps_avx(auVar183,auVar153);
                auVar153 = vmovsldup_avx(auVar122);
                auVar126 = ZEXT416((uint)(fVar221 - auVar126._0_4_));
                auVar123 = vmovsldup_avx(auVar126);
                auVar188._0_4_ = auVar153._0_4_ * auVar124._0_4_ + auVar123._0_4_ * auVar183._0_4_;
                auVar188._4_4_ = auVar153._4_4_ * auVar124._4_4_ + auVar123._4_4_ * auVar183._4_4_;
                auVar188._8_4_ = auVar153._8_4_ * auVar124._8_4_ + auVar123._8_4_ * auVar183._8_4_;
                auVar188._12_4_ =
                     auVar153._12_4_ * auVar124._12_4_ + auVar123._12_4_ * auVar183._12_4_;
                auVar183 = vsubps_avx(auVar206,auVar188);
                auVar244 = ZEXT1664(auVar183);
                auVar189._8_4_ = 0x7fffffff;
                auVar189._0_8_ = 0x7fffffff7fffffff;
                auVar189._12_4_ = 0x7fffffff;
                auVar206 = vandps_avx(auVar122,auVar189);
              } while (fVar200 <= auVar206._0_4_);
              auVar211._8_4_ = 0x7fffffff;
              auVar211._0_8_ = 0x7fffffff7fffffff;
              auVar211._12_4_ = 0x7fffffff;
              auVar206 = vandps_avx(auVar126,auVar211);
            } while ((float)local_b20._0_4_ * 1.9073486e-06 + auVar376._0_4_ + fVar200 <=
                     auVar206._0_4_);
            fVar200 = auVar183._0_4_ + (float)local_a00._0_4_;
            if (fVar8 <= fVar200) {
              fVar178 = *(float *)(ray + k * 4 + 0x100);
              auVar281 = ZEXT464((uint)fVar178);
              if (fVar200 <= fVar178) {
                auVar206 = vmovshdup_avx(auVar183);
                fVar220 = auVar206._0_4_;
                if ((0.0 <= fVar220) && (fVar220 <= 1.0)) {
                  auVar206 = vrsqrtss_avx(auVar36,auVar36);
                  fVar180 = auVar206._0_4_;
                  pGVar20 = (context->scene->geometries).items[uVar114].ptr;
                  if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar206 = ZEXT416((uint)(fVar180 * 1.5 +
                                             fVar177 * -0.5 * fVar180 * fVar180 * fVar180));
                    auVar206 = vshufps_avx(auVar206,auVar206,0);
                    auVar212._0_4_ = auVar206._0_4_ * local_aa0;
                    auVar212._4_4_ = auVar206._4_4_ * fStack_a9c;
                    auVar212._8_4_ = auVar206._8_4_ * fStack_a98;
                    auVar212._12_4_ = auVar206._12_4_ * fStack_a94;
                    auVar160._0_4_ = auVar313._0_4_ + auVar37._0_4_ * auVar212._0_4_;
                    auVar160._4_4_ = auVar313._4_4_ + auVar37._4_4_ * auVar212._4_4_;
                    auVar160._8_4_ = auVar313._8_4_ + auVar37._8_4_ * auVar212._8_4_;
                    auVar160._12_4_ = auVar313._12_4_ + auVar37._12_4_ * auVar212._12_4_;
                    auVar206 = vshufps_avx(auVar212,auVar212,0xc9);
                    auVar124 = vshufps_avx(auVar313,auVar313,0xc9);
                    auVar213._0_4_ = auVar124._0_4_ * auVar212._0_4_;
                    auVar213._4_4_ = auVar124._4_4_ * auVar212._4_4_;
                    auVar213._8_4_ = auVar124._8_4_ * auVar212._8_4_;
                    auVar213._12_4_ = auVar124._12_4_ * auVar212._12_4_;
                    auVar234._0_4_ = auVar313._0_4_ * auVar206._0_4_;
                    auVar234._4_4_ = auVar313._4_4_ * auVar206._4_4_;
                    auVar234._8_4_ = auVar313._8_4_ * auVar206._8_4_;
                    auVar234._12_4_ = auVar313._12_4_ * auVar206._12_4_;
                    auVar153 = vsubps_avx(auVar234,auVar213);
                    auVar206 = vshufps_avx(auVar153,auVar153,0xc9);
                    auVar124 = vshufps_avx(auVar160,auVar160,0xc9);
                    auVar235._0_4_ = auVar124._0_4_ * auVar206._0_4_;
                    auVar235._4_4_ = auVar124._4_4_ * auVar206._4_4_;
                    auVar235._8_4_ = auVar124._8_4_ * auVar206._8_4_;
                    auVar235._12_4_ = auVar124._12_4_ * auVar206._12_4_;
                    auVar206 = vshufps_avx(auVar153,auVar153,0xd2);
                    auVar161._0_4_ = auVar160._0_4_ * auVar206._0_4_;
                    auVar161._4_4_ = auVar160._4_4_ * auVar206._4_4_;
                    auVar161._8_4_ = auVar160._8_4_ * auVar206._8_4_;
                    auVar161._12_4_ = auVar160._12_4_ * auVar206._12_4_;
                    auVar206 = vsubps_avx(auVar235,auVar161);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar200;
                      uVar9 = vextractps_avx(auVar206,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                      uVar9 = vextractps_avx(auVar206,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar206._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar220;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_b88;
                      *(uint *)(ray + k * 4 + 0x240) = uVar114;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar25 = context->user;
                      auStack_790 = vshufps_avx(auVar183,auVar183,0x55);
                      auStack_7f0 = vshufps_avx(auVar206,auVar206,0x55);
                      auStack_7d0 = vshufps_avx(auVar206,auVar206,0xaa);
                      auStack_7b0 = vshufps_avx(auVar206,auVar206,0);
                      local_800 = (RTCHitN  [16])auStack_7f0;
                      local_7e0 = auStack_7d0;
                      local_7c0 = auStack_7b0;
                      local_7a0 = auStack_790;
                      local_780 = ZEXT832(0) << 0x20;
                      local_760 = local_6c0._0_8_;
                      uStack_758 = local_6c0._8_8_;
                      uStack_750 = local_6c0._16_8_;
                      uStack_748 = local_6c0._24_8_;
                      local_740 = local_6a0;
                      auVar129 = vcmpps_avx(local_6a0,local_6a0,0xf);
                      local_b90[1] = auVar129;
                      *local_b90 = auVar129;
                      local_720 = pRVar25->instID[0];
                      uStack_71c = local_720;
                      uStack_718 = local_720;
                      uStack_714 = local_720;
                      uStack_710 = local_720;
                      uStack_70c = local_720;
                      uStack_708 = local_720;
                      uStack_704 = local_720;
                      local_700 = pRVar25->instPrimID[0];
                      uStack_6fc = local_700;
                      uStack_6f8 = local_700;
                      uStack_6f4 = local_700;
                      uStack_6f0 = local_700;
                      uStack_6ec = local_700;
                      uStack_6e8 = local_700;
                      uStack_6e4 = local_700;
                      *(float *)(ray + k * 4 + 0x100) = fVar200;
                      local_c20 = *local_b98;
                      local_c10 = *local_ba0;
                      local_bf0.valid = (int *)local_c20;
                      local_bf0.geometryUserPtr = pGVar20->userPtr;
                      local_bf0.context = context->user;
                      local_bf0.hit = local_800;
                      local_bf0.N = 8;
                      local_bf0.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar303 = ZEXT1664(auVar36);
                        auVar376 = ZEXT1664(auVar376._0_16_);
                        auVar392 = ZEXT1664(auVar392._0_16_);
                        auVar410 = ZEXT1664(auVar122);
                        (*pGVar20->intersectionFilterN)(&local_bf0);
                      }
                      auVar206 = vpcmpeqd_avx(local_c20,ZEXT816(0) << 0x40);
                      auVar36 = vpcmpeqd_avx(local_c10,ZEXT816(0) << 0x40);
                      auVar196._16_16_ = auVar36;
                      auVar196._0_16_ = auVar206;
                      auVar129 = _DAT_01f7b020 & ~auVar196;
                      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar129 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar129 >> 0x7f,0) != '\0') ||
                            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar129 >> 0xbf,0) != '\0') ||
                          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar129[0x1f] < '\0') {
                        p_Var26 = context->args->filter;
                        if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar303 = ZEXT1664(auVar303._0_16_);
                          auVar376 = ZEXT1664(auVar376._0_16_);
                          auVar392 = ZEXT1664(auVar392._0_16_);
                          auVar410 = ZEXT1664(auVar410._0_16_);
                          (*p_Var26)(&local_bf0);
                        }
                        auVar281 = ZEXT464((uint)fVar178);
                        auVar206 = vpcmpeqd_avx(local_c20,ZEXT816(0) << 0x40);
                        auVar36 = vpcmpeqd_avx(local_c10,ZEXT816(0) << 0x40);
                        auVar144._16_16_ = auVar36;
                        auVar144._0_16_ = auVar206;
                        auVar129 = _DAT_01f7b020 & ~auVar144;
                        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar129 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar129 >> 0x7f,0) != '\0')
                              || (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar129 >> 0xbf,0) != '\0') ||
                            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar129[0x1f] < '\0') {
                          auVar145._0_8_ = auVar206._0_8_ ^ 0xffffffffffffffff;
                          auVar145._8_4_ = auVar206._8_4_ ^ 0xffffffff;
                          auVar145._12_4_ = auVar206._12_4_ ^ 0xffffffff;
                          auVar145._16_4_ = auVar36._0_4_ ^ 0xffffffff;
                          auVar145._20_4_ = auVar36._4_4_ ^ 0xffffffff;
                          auVar145._24_4_ = auVar36._8_4_ ^ 0xffffffff;
                          auVar145._28_4_ = auVar36._12_4_ ^ 0xffffffff;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])local_bf0.hit);
                          *(undefined1 (*) [32])(local_bf0.ray + 0x180) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x20));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x1a0) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x40));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x1c0) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x60));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x1e0) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x80));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x200) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x220) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x240) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x260) = auVar129;
                          auVar129 = vmaskmovps_avx(auVar145,*(undefined1 (*) [32])
                                                              (local_bf0.hit + 0x100));
                          *(undefined1 (*) [32])(local_bf0.ray + 0x280) = auVar129;
                          goto LAB_00ad7484;
                        }
                      }
                      auVar281 = ZEXT464((uint)fVar178);
                      *(float *)(ray + k * 4 + 0x100) = fVar178;
                    }
                  }
                }
              }
            }
LAB_00ad7484:
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar362._4_4_ = uVar9;
            auVar362._0_4_ = uVar9;
            auVar362._8_4_ = uVar9;
            auVar362._12_4_ = uVar9;
            auVar362._16_4_ = uVar9;
            auVar362._20_4_ = uVar9;
            auVar362._24_4_ = uVar9;
            auVar362._28_4_ = uVar9;
            auVar244 = ZEXT3264(auVar362);
            auVar129 = vcmpps_avx(_local_a40,auVar362,2);
            auVar129 = vandps_avx(auVar129,local_4e0);
          }
          auVar129 = vandps_avx(local_860,local_840);
          auVar147 = vandps_avx(local_9c0,_local_9a0);
          auVar197._0_4_ = local_ac0._0_4_ + local_4a0._0_4_;
          auVar197._4_4_ = local_ac0._4_4_ + local_4a0._4_4_;
          auVar197._8_4_ = local_ac0._8_4_ + local_4a0._8_4_;
          auVar197._12_4_ = local_ac0._12_4_ + local_4a0._12_4_;
          auVar197._16_4_ = local_ac0._16_4_ + local_4a0._16_4_;
          auVar197._20_4_ = local_ac0._20_4_ + local_4a0._20_4_;
          auVar197._24_4_ = local_ac0._24_4_ + local_4a0._24_4_;
          auVar197._28_4_ = local_ac0._28_4_ + local_4a0._28_4_;
          auVar206 = vshufps_avx(auVar244._0_16_,auVar244._0_16_,0);
          auVar363 = ZEXT3264(_local_ac0);
          auVar243._16_16_ = auVar206;
          auVar243._0_16_ = auVar206;
          auVar29 = vcmpps_avx(auVar197,auVar243,2);
          auVar129 = vandps_avx(auVar29,auVar129);
          auVar259._0_4_ = local_ac0._0_4_ + local_460._0_4_;
          auVar259._4_4_ = local_ac0._4_4_ + local_460._4_4_;
          auVar259._8_4_ = local_ac0._8_4_ + local_460._8_4_;
          auVar259._12_4_ = local_ac0._12_4_ + local_460._12_4_;
          auVar259._16_4_ = local_ac0._16_4_ + local_460._16_4_;
          auVar259._20_4_ = local_ac0._20_4_ + local_460._20_4_;
          auVar259._24_4_ = local_ac0._24_4_ + local_460._24_4_;
          auVar259._28_4_ = local_ac0._28_4_ + local_460._28_4_;
          auVar261 = ZEXT3264(auVar259);
          auVar29 = vcmpps_avx(auVar259,auVar243,2);
          auVar147 = vandps_avx(auVar29,auVar147);
          auVar147 = vorps_avx(auVar129,auVar147);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            uVar111 = (ulong)uVar116;
            *(undefined1 (*) [32])(auStack_180 + uVar111 * 0x60) = auVar147;
            auVar129 = vblendvps_avx(_local_460,_local_4a0,auVar129);
            *(undefined1 (*) [32])(auStack_160 + uVar111 * 0x60) = auVar129;
            uVar110 = vmovlps_avx(local_810);
            (&uStack_140)[uVar111 * 0xc] = uVar110;
            auStack_138[uVar111 * 0x18] = uVar113 + 1;
            uVar116 = uVar116 + 1;
          }
          auVar244 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
      }
    }
    do {
      uVar117 = uVar116;
      if (uVar117 == 0) {
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar149._4_4_ = uVar9;
        auVar149._0_4_ = uVar9;
        auVar149._8_4_ = uVar9;
        auVar149._12_4_ = uVar9;
        auVar149._16_4_ = uVar9;
        auVar149._20_4_ = uVar9;
        auVar149._24_4_ = uVar9;
        auVar149._28_4_ = uVar9;
        auVar129 = vcmpps_avx(local_3a0,auVar149,2);
        uVar114 = vmovmskps_avx(auVar129);
        uVar114 = (uint)local_9e8 - 1 & (uint)local_9e8 & uVar114;
        goto LAB_00ad4c90;
      }
      uVar110 = (ulong)(uVar117 - 1);
      lVar112 = uVar110 * 0x60;
      auVar129 = *(undefined1 (*) [32])(auStack_160 + lVar112);
      auVar146._0_4_ = auVar363._0_4_ + auVar129._0_4_;
      auVar146._4_4_ = auVar363._4_4_ + auVar129._4_4_;
      auVar146._8_4_ = auVar363._8_4_ + auVar129._8_4_;
      auVar146._12_4_ = auVar363._12_4_ + auVar129._12_4_;
      auVar146._16_4_ = auVar363._16_4_ + auVar129._16_4_;
      auVar146._20_4_ = auVar363._20_4_ + auVar129._20_4_;
      auVar146._24_4_ = auVar363._24_4_ + auVar129._24_4_;
      auVar146._28_4_ = auVar363._28_4_ + auVar129._28_4_;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar217._4_4_ = uVar9;
      auVar217._0_4_ = uVar9;
      auVar217._8_4_ = uVar9;
      auVar217._12_4_ = uVar9;
      auVar217._16_4_ = uVar9;
      auVar217._20_4_ = uVar9;
      auVar217._24_4_ = uVar9;
      auVar217._28_4_ = uVar9;
      auVar29 = vcmpps_avx(auVar146,auVar217,2);
      auVar147 = vandps_avx(auVar29,*(undefined1 (*) [32])(auStack_180 + lVar112));
      _local_800 = auVar147;
      auVar29 = *(undefined1 (*) [32])(auStack_180 + lVar112) & auVar29;
      uVar116 = uVar117 - 1;
    } while ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar29 >> 0x7f,0) == '\0') &&
               (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar29 >> 0xbf,0) == '\0') &&
             (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar29[0x1f]);
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar129 = vblendvps_avx(auVar198,auVar129,auVar147);
    auVar29 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar29 = vminps_avx(auVar129,auVar29);
    auVar27 = vshufpd_avx(auVar29,auVar29,5);
    auVar29 = vminps_avx(auVar29,auVar27);
    auVar27 = vperm2f128_avx(auVar29,auVar29,1);
    auVar29 = vminps_avx(auVar29,auVar27);
    auVar129 = vcmpps_avx(auVar129,auVar29,0);
    auVar29 = auVar147 & auVar129;
    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0x7f,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar29 >> 0xbf,0) != '\0') ||
        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0')
    {
      auVar147 = vandps_avx(auVar129,auVar147);
    }
    auVar162._8_8_ = 0;
    auVar162._0_8_ = (&uStack_140)[uVar110 * 0xc];
    uVar113 = auStack_138[uVar110 * 0x18];
    uVar116 = vmovmskps_avx(auVar147);
    uVar109 = 0;
    if (uVar116 != 0) {
      for (; (uVar116 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
      }
    }
    *(undefined4 *)(local_800 + (ulong)uVar109 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar112) = _local_800;
    uVar116 = uVar117 - 1;
    if ((((((((_local_800 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_800 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_800 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_800 >> 0x7f,0) != '\0') ||
          (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_800 >> 0xbf,0) != '\0') ||
        (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_800[0x1f] < '\0') {
      uVar116 = uVar117;
    }
    auVar206 = vshufps_avx(auVar162,auVar162,0);
    auVar36 = vshufps_avx(auVar162,auVar162,0x55);
    auVar36 = vsubps_avx(auVar36,auVar206);
    local_4a0._4_4_ = auVar206._4_4_ + auVar36._4_4_ * 0.14285715;
    local_4a0._0_4_ = auVar206._0_4_ + auVar36._0_4_ * 0.0;
    fStack_498 = auVar206._8_4_ + auVar36._8_4_ * 0.2857143;
    fStack_494 = auVar206._12_4_ + auVar36._12_4_ * 0.42857146;
    fStack_490 = auVar206._0_4_ + auVar36._0_4_ * 0.5714286;
    fStack_48c = auVar206._4_4_ + auVar36._4_4_ * 0.71428573;
    fStack_488 = auVar206._8_4_ + auVar36._8_4_ * 0.8571429;
    fStack_484 = auVar206._12_4_ + auVar36._12_4_;
    local_810._8_8_ = 0;
    local_810._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar109 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }